

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong *puVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  undefined2 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined4 uVar17;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined4 uVar28;
  undefined2 uVar39;
  int iVar40;
  size_t sVar41;
  Layer *pLVar42;
  undefined1 auVar43 [12];
  ulong uVar44;
  uint uVar45;
  undefined1 auVar46 [12];
  undefined2 uVar47;
  undefined2 uVar48;
  undefined2 uVar49;
  undefined2 uVar50;
  undefined2 uVar51;
  undefined2 uVar52;
  undefined2 uVar53;
  undefined2 uVar54;
  undefined2 uVar55;
  undefined2 uVar56;
  undefined2 uVar57;
  undefined2 uVar58;
  undefined2 uVar59;
  undefined2 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined1 uVar73;
  undefined1 uVar75;
  undefined1 uVar77;
  undefined1 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [16];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [14];
  undefined1 auVar94 [12];
  unkbyte10 Var95;
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar99 [12];
  undefined1 auVar100 [12];
  undefined1 auVar101 [12];
  undefined1 auVar102 [14];
  undefined1 auVar103 [12];
  undefined1 auVar104 [12];
  undefined1 auVar105 [12];
  undefined1 auVar106 [12];
  undefined1 auVar107 [14];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar112 [16];
  unkbyte10 Var113;
  unkbyte10 Var114;
  unkbyte10 Var115;
  Mat *dst;
  uint uVar116;
  int iVar117;
  undefined2 *puVar118;
  undefined8 *puVar119;
  undefined1 *puVar120;
  long lVar121;
  void *pvVar122;
  long lVar123;
  int *piVar124;
  long lVar125;
  long lVar126;
  ulong uVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  byte bVar131;
  undefined1 (*pauVar132) [16];
  bool *pbVar133;
  int *piVar134;
  int iVar135;
  uint uVar136;
  int iVar137;
  ulong uVar138;
  long lVar139;
  ulong uVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  int k_8;
  uint uVar144;
  uint uVar145;
  int iVar146;
  Option *pOVar147;
  short sVar148;
  int m_3;
  int iVar149;
  uint uVar150;
  undefined4 uVar151;
  uint uVar152;
  ulong *puVar153;
  ulong *puVar154;
  FILE *pFVar155;
  byte bVar156;
  undefined1 (*pauVar157) [16];
  long lVar158;
  uint uVar159;
  int iVar160;
  void *pvVar161;
  long lVar162;
  ulong uVar163;
  int k;
  int iVar164;
  uint uVar165;
  long lVar166;
  int k_12;
  int iVar167;
  long lVar168;
  long lVar169;
  long lVar170;
  ulong *puVar171;
  ulong uVar172;
  int k_6;
  undefined4 *puVar173;
  void *pvVar174;
  int *piVar175;
  int m_7;
  short sVar176;
  int m_4;
  int iVar177;
  ulong uVar178;
  uint uVar179;
  long lVar180;
  bool bVar181;
  bool bVar182;
  undefined4 uVar183;
  undefined1 auVar185 [14];
  undefined8 uVar184;
  undefined1 uVar258;
  undefined4 uVar260;
  int iVar261;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined4 uVar259;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar186 [14];
  undefined1 auVar209 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar187 [14];
  undefined1 auVar222 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar188 [14];
  undefined1 auVar232 [16];
  undefined1 auVar189 [14];
  undefined1 auVar240 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar190 [14];
  undefined1 auVar250 [16];
  int iVar262;
  int iVar263;
  int iVar264;
  undefined1 auVar265 [14];
  char cVar401;
  char cVar402;
  char cVar404;
  undefined4 uVar405;
  int iVar406;
  char cVar407;
  char cVar408;
  undefined4 uVar409;
  int iVar410;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar266 [14];
  undefined1 auVar323 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  char cVar403;
  undefined1 auVar333 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar350 [16];
  undefined1 auVar267 [14];
  undefined1 auVar358 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar268 [14];
  undefined1 auVar368 [16];
  undefined1 auVar269 [14];
  undefined1 auVar376 [16];
  undefined1 auVar384 [16];
  undefined1 auVar270 [14];
  undefined1 auVar385 [16];
  undefined1 auVar393 [16];
  int iVar411;
  short sVar498;
  undefined1 auVar412 [12];
  short sVar497;
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar429 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar457 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar478 [16];
  ushort uVar499;
  undefined1 auVar479 [16];
  undefined1 auVar481 [16];
  undefined1 auVar489 [16];
  int iVar500;
  int iVar510;
  int iVar511;
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  int iVar512;
  undefined8 uVar513;
  undefined1 auVar514 [16];
  undefined1 auVar522 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  int iVar544;
  int iVar545;
  int iVar591;
  int iVar592;
  int iVar593;
  int iVar594;
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar559 [16];
  undefined1 auVar567 [16];
  undefined1 auVar575 [16];
  undefined1 auVar583 [16];
  int iVar595;
  int iVar596;
  int iVar597;
  int iVar621;
  int iVar623;
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  short sVar622;
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar612 [16];
  undefined1 auVar620 [16];
  int iVar624;
  undefined1 auVar625 [14];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar626 [14];
  undefined1 auVar645 [16];
  undefined1 auVar653 [16];
  undefined8 uVar654;
  int sum1 [4];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined8 uVar678;
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [14];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar732 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [14];
  undefined4 uVar769;
  undefined4 uVar770;
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar759 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar771 [14];
  undefined4 uVar789;
  undefined4 uVar790;
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [14];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  Allocator *pAVar817;
  long local_630;
  long local_620;
  int local_618;
  long local_610;
  undefined1 local_608 [16];
  int TILE_N;
  undefined1 (*local_5e0) [16];
  undefined8 local_5d8;
  int iStack_5d0;
  int iStack_5cc;
  int TILE_M;
  Option *local_5c0;
  undefined1 local_5b8 [16];
  uint local_5a4;
  ulong local_5a0;
  undefined8 local_598;
  int iStack_590;
  int iStack_58c;
  undefined1 (*local_580) [16];
  undefined1 local_578 [16];
  int TILE_K;
  undefined1 local_558 [16];
  ulong local_540;
  ulong local_538;
  int *local_530;
  undefined1 local_528 [16];
  undefined8 local_518;
  int iStack_510;
  int iStack_50c;
  void *local_500;
  void *local_4f8;
  ulong local_4f0;
  undefined1 local_4e8 [16];
  Mat local_4d8;
  undefined1 local_488 [16];
  ulong local_470;
  ulong local_468;
  size_t local_460;
  undefined8 local_458;
  uint uStack_450;
  uint uStack_44c;
  undefined1 local_448 [16];
  Mat m;
  Mat local_3c8;
  long local_380;
  int *local_378;
  int local_36c;
  Mat local_368;
  void *local_318;
  ulong local_310;
  Mat m_1;
  Mat local_298;
  ulong local_250;
  long local_248;
  Mat *local_240;
  ulong local_238;
  ulong local_230;
  long local_228;
  long local_220;
  long local_218;
  int local_20c;
  Option opt_q;
  undefined8 local_1c8;
  int aiStack_1c0 [80];
  Mat local_80;
  ulong local_38;
  undefined1 auVar818 [12];
  undefined8 uVar18;
  undefined7 uVar20;
  undefined6 uVar22;
  undefined5 uVar24;
  undefined4 uVar27;
  undefined3 uVar31;
  undefined3 uVar32;
  undefined2 uVar35;
  undefined2 uVar36;
  undefined4 uVar74;
  undefined3 uVar76;
  undefined2 uVar78;
  undefined1 auVar200 [16];
  undefined1 auVar210 [16];
  undefined1 auVar223 [16];
  undefined1 auVar233 [16];
  undefined1 auVar241 [16];
  undefined1 auVar251 [16];
  undefined1 auVar201 [16];
  undefined1 auVar211 [16];
  undefined1 auVar224 [16];
  undefined1 auVar234 [16];
  undefined1 auVar242 [16];
  undefined1 auVar252 [16];
  undefined1 auVar202 [16];
  undefined1 auVar212 [16];
  undefined1 auVar225 [16];
  undefined1 auVar235 [16];
  undefined1 auVar243 [16];
  undefined1 auVar253 [16];
  undefined1 auVar203 [16];
  undefined1 auVar213 [16];
  undefined1 auVar226 [16];
  undefined1 auVar236 [16];
  undefined1 auVar244 [16];
  undefined1 auVar254 [16];
  undefined1 auVar204 [16];
  undefined1 auVar214 [16];
  undefined1 auVar227 [16];
  undefined1 auVar237 [16];
  undefined1 auVar245 [16];
  undefined1 auVar255 [16];
  undefined1 auVar205 [16];
  undefined1 auVar215 [16];
  undefined1 auVar228 [16];
  undefined1 auVar238 [16];
  undefined1 auVar246 [16];
  undefined1 auVar256 [16];
  undefined1 auVar206 [16];
  undefined1 auVar216 [16];
  undefined1 auVar229 [16];
  undefined1 auVar239 [16];
  undefined1 auVar247 [16];
  undefined1 auVar257 [16];
  undefined1 auVar311 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar314 [16];
  undefined1 auVar324 [16];
  undefined1 auVar340 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar359 [16];
  undefined1 auVar369 [16];
  undefined1 auVar377 [16];
  undefined1 auVar386 [16];
  undefined1 auVar400 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar315 [16];
  undefined1 auVar325 [16];
  undefined1 auVar360 [16];
  undefined1 auVar370 [16];
  undefined1 auVar378 [16];
  undefined1 auVar387 [16];
  undefined1 auVar316 [16];
  undefined1 auVar326 [16];
  undefined1 auVar361 [16];
  undefined1 auVar371 [16];
  undefined1 auVar379 [16];
  undefined1 auVar388 [16];
  undefined1 auVar317 [16];
  undefined1 auVar327 [16];
  undefined1 auVar362 [16];
  undefined1 auVar372 [16];
  undefined1 auVar380 [16];
  undefined1 auVar389 [16];
  undefined1 auVar318 [16];
  undefined1 auVar328 [16];
  undefined1 auVar363 [16];
  undefined1 auVar373 [16];
  undefined1 auVar381 [16];
  undefined1 auVar390 [16];
  undefined1 auVar319 [16];
  undefined1 auVar329 [16];
  undefined1 auVar364 [16];
  undefined1 auVar374 [16];
  undefined1 auVar382 [16];
  undefined1 auVar391 [16];
  undefined1 auVar320 [16];
  undefined1 auVar330 [16];
  undefined1 auVar365 [16];
  undefined1 auVar375 [16];
  undefined1 auVar383 [16];
  undefined1 auVar392 [16];
  undefined1 auVar415 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar428 [16];
  undefined1 auVar430 [16];
  undefined1 auVar439 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar477 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar440 [16];
  undefined1 auVar416 [16];
  undefined1 auVar431 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar417 [16];
  undefined1 auVar432 [16];
  undefined1 auVar443 [16];
  undefined1 auVar468 [16];
  undefined1 auVar480 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar568 [16];
  undefined1 auVar576 [16];
  undefined1 auVar584 [16];
  undefined1 auVar569 [16];
  undefined1 auVar577 [16];
  undefined1 auVar585 [16];
  undefined1 auVar570 [16];
  undefined1 auVar578 [16];
  undefined1 auVar586 [16];
  undefined1 auVar571 [16];
  undefined1 auVar579 [16];
  undefined1 auVar587 [16];
  undefined1 auVar572 [16];
  undefined1 auVar580 [16];
  undefined1 auVar588 [16];
  undefined1 auVar573 [16];
  undefined1 auVar581 [16];
  undefined1 auVar589 [16];
  undefined1 auVar574 [16];
  undefined1 auVar582 [16];
  undefined1 auVar590 [16];
  undefined1 auVar605 [16];
  undefined1 auVar613 [16];
  undefined1 auVar606 [16];
  undefined1 auVar614 [16];
  undefined1 auVar607 [16];
  undefined1 auVar615 [16];
  undefined1 auVar608 [16];
  undefined1 auVar616 [16];
  undefined1 auVar609 [16];
  undefined1 auVar617 [16];
  undefined1 auVar610 [16];
  undefined1 auVar618 [16];
  undefined1 auVar611 [16];
  undefined1 auVar619 [16];
  undefined1 auVar629 [16];
  undefined1 auVar638 [16];
  undefined1 auVar646 [16];
  undefined1 auVar630 [16];
  undefined1 auVar639 [16];
  undefined1 auVar647 [16];
  undefined1 auVar631 [16];
  undefined1 auVar640 [16];
  undefined1 auVar648 [16];
  undefined1 auVar632 [16];
  undefined1 auVar641 [16];
  undefined1 auVar649 [16];
  undefined1 auVar633 [16];
  undefined1 auVar642 [16];
  undefined1 auVar650 [16];
  undefined1 auVar634 [16];
  undefined1 auVar643 [16];
  undefined1 auVar651 [16];
  undefined1 auVar635 [16];
  undefined1 auVar644 [16];
  undefined1 auVar652 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar693 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar711 [16];
  undefined1 auVar720 [16];
  undefined1 auVar712 [16];
  undefined1 auVar721 [16];
  undefined1 auVar694 [16];
  undefined1 auVar713 [16];
  undefined1 auVar722 [16];
  undefined1 auVar714 [16];
  undefined1 auVar723 [16];
  undefined1 auVar695 [16];
  undefined1 auVar715 [16];
  undefined1 auVar724 [16];
  undefined1 auVar716 [16];
  undefined1 auVar725 [16];
  undefined1 auVar717 [16];
  undefined1 auVar726 [16];
  undefined1 auVar729 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar752 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar753 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar754 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  
  local_80.elempack = bottom_blob->elempack;
  local_80.elemsize = bottom_blob->elemsize;
  local_80.data = bottom_blob->data;
  local_80.refcount = bottom_blob->refcount;
  local_80.allocator = bottom_blob->allocator;
  local_80.dims = bottom_blob->dims;
  local_80.w = bottom_blob->w;
  local_80.h = bottom_blob->h;
  local_80.d = bottom_blob->d;
  local_80.c = bottom_blob->c;
  local_80.cstep = bottom_blob->cstep;
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + 1;
    UNLOCK();
  }
  if (local_80.elempack == 0 || ((int)local_80.elemsize * 8) / local_80.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_ops = opt->use_subgroup_ops;
    opt_q.use_reserved_0 = opt->use_reserved_0;
    opt_q.num_threads = opt->num_threads;
    uVar72 = opt->openmp_blocktime;
    uVar73 = opt->use_winograd_convolution;
    uVar75 = opt->use_sgemm_convolution;
    uVar77 = opt->use_int8_inference;
    uVar79 = opt->use_vulkan_compute;
    uVar78 = CONCAT11(uVar79,uVar77);
    uVar76 = CONCAT21(uVar78,uVar75);
    uVar74 = CONCAT31(uVar76,uVar73);
    auVar528[0] = opt->use_bf16_storage;
    auVar528[1] = opt->use_fp16_packed;
    auVar528[2] = opt->use_fp16_storage;
    auVar528[3] = opt->use_fp16_arithmetic;
    auVar528[4] = opt->use_int8_packed;
    auVar528[5] = opt->use_int8_storage;
    auVar528[6] = opt->use_int8_arithmetic;
    auVar528[7] = opt->use_packing_layout;
    auVar528._8_4_ = opt->vulkan_device_index;
    uVar25 = opt->use_reserved_1;
    uVar29 = opt->use_image_storage;
    uVar33 = opt->use_tensor_storage;
    uVar37 = opt->use_reserved_2;
    uVar35 = CONCAT11(uVar37,uVar33);
    uVar31 = CONCAT21(uVar35,uVar29);
    auVar528._12_4_ = CONCAT31(uVar31,uVar25);
    uVar11 = opt->flush_denormals;
    uVar12 = opt->use_local_pool_allocator;
    uVar13 = opt->use_shader_local_memory;
    uVar14 = opt->use_cooperative_matrix;
    uVar15 = opt->use_winograd23_convolution;
    uVar16 = opt->use_winograd43_convolution;
    uVar19 = opt->use_winograd63_convolution;
    uVar21 = opt->use_a53_a55_optimized_kernel;
    uVar23 = opt->use_fp16_uniform;
    uVar26 = opt->use_int8_uniform;
    uVar30 = opt->use_reserved_9;
    uVar34 = opt->use_reserved_10;
    uVar38 = opt->use_reserved_11;
    uVar36 = CONCAT11(uVar38,uVar34);
    uVar32 = CONCAT21(uVar36,uVar30);
    uVar27 = CONCAT31(uVar32,uVar26);
    uVar24 = CONCAT41(uVar27,uVar23);
    uVar22 = CONCAT51(uVar24,uVar21);
    uVar20 = CONCAT61(uVar22,uVar19);
    uVar18 = CONCAT71(uVar20,uVar16);
    auVar818._4_8_ = uVar18;
    auVar818[3] = uVar15;
    auVar818[2] = uVar14;
    auVar818[1] = uVar13;
    auVar818[0] = uVar12;
    opt_q._52_4_ = auVar818._0_4_;
    opt_q._56_4_ = SUB84(uVar18,0);
    opt_q._32_8_ = auVar528._0_8_;
    opt_q.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.workspace_allocator._4_4_ = (int)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar72;
    opt_q._28_4_ = uVar74;
    opt_q.vulkan_device_index = auVar528._8_4_;
    opt_q._44_4_ = auVar528._12_4_;
    opt_q.flush_denormals = uVar11;
    opt_q._60_4_ = uVar27;
    quantize_to_int8(bottom_blob,&local_80,&(this->super_Convolution).bottom_blob_int8_scales,&opt_q
                    );
    iVar164 = -100;
    local_458 = CONCAT44(local_458._4_4_,(uint)local_458);
    if ((local_80.data == (void *)0x0) ||
       (local_458 = CONCAT44(local_458._4_4_,(uint)local_458),
       (long)local_80.c * local_80.cstep == 0)) goto LAB_001648f9;
  }
  local_4d8.cstep = 0;
  local_4d8.data = (void *)0x0;
  local_4d8.refcount._0_4_ = 0;
  local_4d8.refcount._4_4_ = 0;
  local_4d8.elemsize._0_4_ = 0;
  local_4d8.elemsize._4_4_ = 0;
  local_4d8.elempack = 0;
  local_4d8.allocator = (Allocator *)0x0;
  local_4d8.dims = 0;
  local_4d8.w = 0;
  local_4d8.h = 0;
  local_4d8.d = 0;
  local_4d8.c = 0;
  Convolution::make_padding(&this->super_Convolution,&local_80,&local_4d8,opt);
  iVar135 = local_4d8.elempack;
  iVar164 = -100;
  local_458 = CONCAT44(local_458._4_4_,(uint)local_458);
  if ((local_4d8.data != (void *)0x0) &&
     (iVar117 = local_4d8.c, local_458 = CONCAT44(local_458._4_4_,(uint)local_458),
     local_4d8.cstep * (long)local_4d8.c != 0)) {
    uVar150 = (this->super_Convolution).num_output;
    uVar144 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
              local_4d8.w) / (this->super_Convolution).stride_w + 1;
    iVar149 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
              local_4d8.h) / (this->super_Convolution).stride_h + 1;
    iVar40 = (this->super_Convolution).int8_scale_term;
    if (opt->use_packing_layout == true) {
      if (iVar40 < 0x65) {
        uVar179 = (uint)((uVar150 & 3) == 0) * 3 + 1;
      }
      else {
        uVar179 = 1;
        if ((uVar150 & 7) == 0) {
          uVar179 = 8;
        }
      }
    }
    else {
      uVar179 = 1;
    }
    uVar159 = uVar179 * 4;
    if (100 < iVar40) {
      uVar159 = uVar179;
    }
    local_5c0 = opt;
    Mat::create(top_blob,uVar144,iVar149,(int)uVar150 / (int)uVar179,(ulong)uVar159,uVar179,
                opt->blob_allocator);
    iVar164 = -100;
    local_458 = CONCAT44(local_458._4_4_,(uint)local_458);
    if ((top_blob->data != (void *)0x0) &&
       (local_458 = CONCAT44(local_458._4_4_,(uint)local_458),
       (long)top_blob->c * top_blob->cstep != 0)) {
      bVar131 = ((this->super_Convolution).num_output & 3U) == 0 & local_5c0->use_packing_layout;
      if ((local_5c0->use_winograd23_convolution == false) &&
         (local_5c0->use_winograd43_convolution != true)) {
        bVar181 = false;
      }
      else {
        bVar181 = true;
        if (iVar135 * iVar117 < 9) {
          bVar181 = 8 < (this->super_Convolution).num_output;
        }
      }
      iVar164 = (uint)bVar131 + (uint)bVar131 * 2 + 1;
      if ((local_5c0->use_packing_layout != false) &&
         ((auVar300._0_4_ = -(uint)((this->super_Convolution).kernel_w == 3),
          auVar300._4_4_ = -(uint)((this->super_Convolution).kernel_h == 3),
          auVar300._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1),
          auVar300._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1),
          iVar135 = movmskps((int)local_5c0,auVar300),
          ((this->super_Convolution).stride_w == 1 & local_5c0->use_winograd_convolution &
           (this->super_Convolution).stride_h == 1 & iVar135 == 0xf & bVar181) != 0 ||
          (local_5c0->use_sgemm_convolution == false)))) {
        iVar164 = (uint)(((this->super_Convolution).num_output & 3) == 0) * 3 + 1;
      }
      local_3c8.cstep = 0;
      local_3c8.data = (void *)0x0;
      local_3c8.refcount._0_4_ = 0;
      local_3c8.refcount._4_4_ = 0;
      local_3c8.elemsize = 0;
      local_3c8.elempack = 0;
      local_3c8.allocator = (Allocator *)0x0;
      local_3c8.dims = 0;
      local_3c8.w = 0;
      local_3c8.h = 0;
      local_3c8.d = 0;
      local_3c8.c = 0;
      uVar127 = (ulong)uVar144;
      local_240 = top_blob;
      Mat::create(&local_3c8,uVar144,iVar149,(this->super_Convolution).num_output / iVar164,
                  (ulong)(uint)(iVar164 * 4),iVar164,local_5c0->workspace_allocator);
      pOVar147 = local_5c0;
      iVar164 = -100;
      local_458 = CONCAT44(local_458._4_4_,(uint)local_458);
      if ((local_3c8.data != (void *)0x0) &&
         (local_458 = CONCAT44(local_458._4_4_,(uint)local_458),
         (long)local_3c8.c * local_3c8.cstep != 0)) {
        iVar164 = this->nT;
        bVar182 = iVar164 == 0;
        iVar135 = local_5c0->num_threads;
        iVar117 = iVar164;
        if (bVar182) {
          iVar117 = iVar135;
        }
        local_5a0 = CONCAT44(local_5a0._4_4_,iVar117);
        uVar151 = (undefined4)CONCAT71((int7)(uVar127 >> 8),iVar135 == iVar164 || bVar182);
        if (iVar135 != iVar164 && !bVar182) {
          fprintf(_stderr,"opt.num_threads %d changed, convolution gemm will use load-time value %d"
                 );
          pFVar155 = _stderr;
          fputc(10,_stderr);
          uVar151 = SUB84(pFVar155,0);
        }
        iVar135 = (this->super_Convolution).kernel_w;
        iVar117 = (this->super_Convolution).kernel_h;
        auVar550._0_4_ = (this->super_Convolution).dilation_w;
        auVar550._4_4_ = (this->super_Convolution).dilation_h;
        uVar17 = (this->super_Convolution).stride_w;
        uVar28 = (this->super_Convolution).stride_h;
        auVar550._8_8_ = CONCAT44(uVar28,uVar17);
        auVar600._0_4_ = -(uint)(auVar550._0_4_ == 1);
        auVar600._4_4_ = -(uint)(auVar550._4_4_ == 1);
        auVar600._8_4_ = -(uint)(uVar17 == 1);
        auVar600._12_4_ = -(uint)(uVar28 == 1);
        iVar149 = movmskps(uVar151,auVar600);
        if ((iVar135 == 3 & pOVar147->use_winograd_convolution & iVar117 == 3 & bVar181 &
            iVar149 == 0xf) == 1) {
          if (((pOVar147->use_winograd43_convolution == true) &&
              ((this->weight_winograd43_data).data != (void *)0x0)) &&
             ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep != 0)) {
            iVar164 = cpu_support_x86_xop();
            if (iVar164 == 0) {
              uVar150 = local_3c8.elempack * local_3c8.c;
              piVar134 = (int *)(ulong)uVar150;
              uVar144 = ((int)(((uint)(local_3c8.h + 3 >> 0x1f) >> 0x1e) + local_3c8.h + 3) >> 2) *
                        ((int)(((uint)(local_3c8.w + 3 >> 0x1f) >> 0x1e) + local_3c8.w + 3) >> 2);
              uVar127 = (ulong)uVar144;
              uVar179 = local_4d8.elempack * local_4d8.c;
              uVar178 = (ulong)uVar179;
              get_optimal_tile_mnk_int8
                        (uVar150,uVar144,uVar179,&TILE_M,&TILE_N,&TILE_K,(int)local_5a0);
              iVar117 = TILE_K;
              iVar135 = TILE_N;
              uVar150 = (int)(TILE_M + uVar150 + -1) / TILE_M;
              iVar149 = (int)(uVar144 + TILE_N + -1) / TILE_N;
              iVar167 = (int)(uVar179 + TILE_K + -1) / TILE_K;
              pAVar817 = local_5c0->workspace_allocator;
              local_368.cstep = 0;
              iVar146 = TILE_K * TILE_N;
              local_368.data = (void *)0x0;
              local_368.refcount._0_4_ = 0;
              local_368.refcount._4_4_ = 0;
              local_368.elemsize = 0;
              local_368.elempack = 0;
              local_368.allocator = (Allocator *)0x0;
              local_368.dims = 0;
              local_368.w = 0;
              local_368.h = 0;
              local_368.d = 0;
              local_368.c = 0;
              Mat::create(&local_368,iVar146,0x24,iVar167,iVar149,4,pAVar817);
              iVar164 = -100;
              local_470 = uVar178;
              local_468 = uVar127;
              local_378 = piVar134;
              if ((local_368.data != (void *)0x0) && ((long)local_368.c * local_368.cstep != 0)) {
                iVar149 = iVar149 * iVar167;
                iVar146 = iVar146 * 0x24;
                if (((int)local_5a0 < 2) || ((int)local_5a0 <= iVar149)) {
                  local_1c8 = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator._0_4_ = 0;
                  opt_q.workspace_allocator._4_4_ = 0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  Mat::create((Mat *)&opt_q,iVar146,1,(int)local_5a0,4,
                              local_5c0->workspace_allocator);
                  if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_1c8 != 0)) {
                    iVar164 = 0;
                    if (iVar149 < 1) {
                      iVar149 = iVar164;
                    }
                    local_5b8._0_4_ = iVar149;
                    while (iVar149 != iVar164) {
                      iVar137 = (iVar164 / iVar167) * iVar135;
                      iVar146 = (int)((long)iVar164 % (long)iVar167) * iVar117;
                      iVar149 = (int)local_468 - iVar137;
                      if (iVar135 < iVar149) {
                        iVar149 = iVar135;
                      }
                      iVar160 = (int)local_470 - iVar146;
                      if (iVar117 < iVar160) {
                        iVar160 = iVar117;
                      }
                      iVar177 = get_omp_thread_num();
                      m.elemsize = CONCAT44(opt_q.workspace_allocator._4_4_,
                                            opt_q.workspace_allocator._0_4_);
                      m.data = (void *)((long)iVar177 * local_1c8 * m.elemsize + opt_q._0_8_);
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elempack = opt_q.openmp_blocktime;
                      m.allocator = (Allocator *)opt_q._32_8_;
                      m.w._0_1_ = opt_q.use_reserved_1;
                      m.w._1_1_ = opt_q.use_image_storage;
                      m.w._2_1_ = opt_q.use_tensor_storage;
                      m.w._3_1_ = opt_q.use_reserved_2;
                      m.h = opt_q.flush_denormals;
                      m.d = 1;
                      m.c._0_1_ = opt_q.use_local_pool_allocator;
                      m.c._1_1_ = opt_q.use_shader_local_memory;
                      m.c._2_1_ = opt_q.use_cooperative_matrix;
                      m.c._3_1_ = opt_q.use_winograd23_convolution;
                      m.dims = opt_q.vulkan_device_index + -1;
                      m.cstep = (m.elemsize * (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_
                                 + 0xf & 0xfffffffffffffff0) / m.elemsize;
                      if (opt_q.vulkan_device_index == 4) {
                        m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                      }
                      conv3x3s1_winograd43_transform_input_tile_int8
                                (&local_4d8,&m,iVar137,iVar149,iVar146,iVar160,(int)pAVar817);
                      m_1.cstep = (long)local_368.h * (long)local_368.w;
                      m_1.data = (void *)((long)local_368.data +
                                         ((long)iVar164 % (long)iVar167 & 0xffffffffU) *
                                         local_368.elemsize * m_1.cstep +
                                         (long)(iVar164 / iVar167) * local_368.cstep *
                                         local_368.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.elemsize = local_368.elemsize;
                      m_1.elempack = local_368.elempack;
                      m_1.allocator = local_368.allocator;
                      m_1.dims = 2;
                      m_1.w = local_368.w;
                      m_1.h = local_368.h;
                      m_1.d = 1;
                      m_1.c = 1;
                      transpose_pack_B_tile_int8(&m,&m_1,0x24,iVar149,iVar160,(int)m_1.cstep);
                      iVar164 = iVar164 + 1;
                      iVar149 = local_5b8._0_4_;
                    }
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) goto LAB_0016323d;
                        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      }
                    }
                    goto LAB_00163245;
                  }
                  piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  if (piVar134 != (int *)0x0) {
                    LOCK();
                    *piVar134 = *piVar134 + -1;
                    UNLOCK();
                    if (*piVar134 == 0) {
                      if (opt_q._32_8_ == 0) goto LAB_00163228;
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                    }
                  }
                }
                else {
                  local_1c8 = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator._0_4_ = 0;
                  opt_q.workspace_allocator._4_4_ = 0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  Mat::create((Mat *)&opt_q,iVar146,4,local_5c0->workspace_allocator);
                  if ((opt_q._0_8_ == 0) || ((long)(int)opt_q._56_4_ * local_1c8 == 0)) {
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) {
LAB_00163228:
                          free((void *)opt_q._0_8_);
                        }
                        else {
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
                  }
                  else {
                    iVar164 = 0;
                    if (iVar149 < 1) {
                      iVar149 = 0;
                    }
                    for (; iVar149 != iVar164; iVar164 = iVar164 + 1) {
                      iVar137 = (iVar164 / iVar167) * iVar135;
                      iVar160 = (int)((long)iVar164 % (long)iVar167) * iVar117;
                      iVar146 = (int)local_468 - iVar137;
                      if (iVar135 < iVar146) {
                        iVar146 = iVar135;
                      }
                      iVar177 = (int)local_470 - iVar160;
                      if (iVar117 < iVar177) {
                        iVar177 = iVar117;
                      }
                      conv3x3s1_winograd43_transform_input_tile_int8
                                (&local_4d8,(Mat *)&opt_q,iVar137,iVar146,iVar160,iVar177,
                                 (int)pAVar817);
                      m.cstep = (long)local_368.h * (long)local_368.w;
                      m.data = (void *)((long)local_368.data +
                                       ((long)iVar164 % (long)iVar167 & 0xffffffffU) *
                                       local_368.elemsize * m.cstep +
                                       (long)(iVar164 / iVar167) * local_368.cstep *
                                       local_368.elemsize);
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize = local_368.elemsize;
                      m.elempack = local_368.elempack;
                      m.allocator = local_368.allocator;
                      m.dims = 2;
                      m.w = local_368.w;
                      m.h = local_368.h;
                      m.d = 1;
                      m.c = 1;
                      transpose_pack_B_tile_int8((Mat *)&opt_q,&m,0x24,iVar146,iVar177,(int)m.cstep)
                      ;
                    }
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) {
LAB_0016323d:
                          free((void *)opt_q._0_8_);
                        }
                        else {
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
LAB_00163245:
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize = 0;
                    m.elempack = 0;
                    m.allocator = (Allocator *)0x0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    Mat::create(&m,TILE_N * TILE_M * 0x24,1,(int)local_5a0,4,
                                local_5c0->workspace_allocator);
                    iVar164 = -100;
                    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                      local_5a4 = 0;
                      if ((int)uVar150 < 1) {
                        uVar150 = 0;
                      }
                      for (; iVar164 = TILE_M, local_5a4 != uVar150; local_5a4 = local_5a4 + 1) {
                        iVar135 = get_omp_thread_num();
                        m_1.data = (void *)((long)iVar135 * m.cstep * m.elemsize + (long)m.data);
                        m_1.refcount = (int *)0x0;
                        m_1.elemsize = m.elemsize;
                        m_1.elempack = m.elempack;
                        m_1.allocator = m.allocator;
                        m_1.w = m.w;
                        m_1.h = m.h;
                        m_1.d = 1;
                        m_1.c = m.d;
                        m_1.dims = m.dims + -1;
                        m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0)
                                    / m.elemsize;
                        if (m.dims == 4) {
                          m_1.cstep = (long)m.h * (long)m.w;
                        }
                        uVar144 = iVar164 * local_5a4;
                        local_5a0 = (ulong)uVar144;
                        iVar135 = (int)local_378 - uVar144;
                        if (iVar164 < iVar135) {
                          iVar135 = iVar164;
                        }
                        local_538 = (ulong)(int)uVar144;
                        local_310 = CONCAT44(local_310._4_4_,iVar135);
                        local_5e0 = (undefined1 (*) [16])(long)iVar135;
                        uVar127 = 0;
                        while( true ) {
                          iVar117 = TILE_K;
                          iVar135 = TILE_M;
                          iVar164 = TILE_N;
                          local_558._0_8_ = uVar127;
                          uVar144 = (int)local_468 - (int)uVar127;
                          if (uVar144 == 0 || (int)local_468 < (int)uVar127) break;
                          if (TILE_N < (int)uVar144) {
                            uVar144 = TILE_N;
                          }
                          local_540 = (ulong)uVar144;
                          iVar146 = (int)local_470;
                          uVar127 = local_470 & 0xffffffff;
                          iVar149 = 0;
                          while( true ) {
                            iVar137 = (int)uVar127;
                            iVar160 = (int)local_540;
                            iVar167 = local_558._0_4_;
                            if (iVar146 <= iVar149) break;
                            iVar177 = iVar137;
                            if (iVar117 < iVar137) {
                              iVar177 = iVar117;
                            }
                            opt_q._44_4_ = (this->weight_winograd43_data).w;
                            opt_q.flush_denormals = (this->weight_winograd43_data).h;
                            sVar41 = (this->weight_winograd43_data).elemsize;
                            opt_q.openmp_blocktime = (this->weight_winograd43_data).elempack;
                            opt_q._32_8_ = (this->weight_winograd43_data).allocator;
                            local_1c8 = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                            opt_q._0_8_ = (long)(this->weight_winograd43_data).data +
                                          sVar41 * local_1c8 * (long)(iVar149 / iVar117) +
                                          (long)(int)((long)((ulong)(uint)((int)local_5a0 >> 0x1f)
                                                             << 0x20 | local_5a0 & 0xffffffff) /
                                                     (long)iVar135) *
                                          (this->weight_winograd43_data).cstep * sVar41;
                            opt_q.blob_allocator._0_4_ = 0;
                            opt_q.blob_allocator._4_4_ = 0;
                            opt_q.workspace_allocator._0_4_ = (undefined4)sVar41;
                            opt_q.workspace_allocator._4_4_ = (int)(sVar41 >> 0x20);
                            local_298.dims = 2;
                            opt_q.use_local_pool_allocator = true;
                            opt_q.use_shader_local_memory = false;
                            opt_q.use_cooperative_matrix = false;
                            opt_q.use_winograd23_convolution = false;
                            opt_q.use_winograd43_convolution = true;
                            opt_q.use_winograd63_convolution = false;
                            opt_q.use_a53_a55_optimized_kernel = false;
                            opt_q.use_fp16_uniform = false;
                            local_298.cstep = (long)local_368.h * (long)local_368.w;
                            local_298.data =
                                 (void *)((long)local_368.data +
                                         local_298.cstep * local_368.elemsize *
                                         (long)(iVar149 / iVar117) +
                                         (long)(int)((long)((ulong)(uint)(iVar167 >> 0x1f) << 0x20 |
                                                           local_558._0_8_ & 0xffffffff) /
                                                    (long)iVar164) * local_368.cstep *
                                         local_368.elemsize);
                            local_298.refcount = (int *)0x0;
                            local_298.elemsize = local_368.elemsize;
                            local_298.elempack = local_368.elempack;
                            local_298.allocator = local_368.allocator;
                            local_298.w = local_368.w;
                            local_298.h = local_368.h;
                            local_298.d = 1;
                            local_298.c = 1;
                            opt_q.vulkan_device_index = local_298.dims;
                            gemm_transB_packed_tile_int8
                                      ((Mat *)&opt_q,&local_298,&m_1,0x24,(int)local_310,iVar160,
                                       iVar149,iVar177,iVar146 <= iVar149 + iVar117);
                            uVar127 = (ulong)(uint)-(iVar117 - iVar137);
                            iVar149 = iVar149 + iVar117;
                          }
                          iVar164 = (int)local_3c8.cstep * local_3c8.elempack;
                          iVar135 = (local_3c8.w + 3) / 4;
                          local_448._0_4_ = iVar135;
                          local_4f8 = (void *)(long)(iVar160 * 4);
                          local_580 = (undefined1 (*) [16])(long)(iVar160 * 8);
                          lVar142 = (long)iVar164;
                          lVar125 = (long)(iVar164 * 2);
                          local_5b8._0_8_ = lVar142;
                          lVar126 = (long)(iVar164 * 3);
                          iVar164 = 0;
                          uVar127 = 0;
                          if (0 < iVar160) {
                            uVar127 = local_540 & 0xffffffff;
                          }
                          local_4e8._0_8_ = uVar127;
                          lVar180 = (long)(iVar160 * 0x14) * 4;
                          local_488._0_8_ = lVar180;
                          local_4f0 = (long)(iVar160 * 0xc) * 4;
                          local_530 = (int *)((long)local_580 * 4);
                          local_500 = (void *)((long)local_4f8 * 4);
                          for (uVar178 = 0; (long)(uVar178 | 3) < (long)local_5e0;
                              uVar178 = uVar178 + 4) {
                            lVar128 = (long)iVar164;
                            lVar130 = lVar180 + lVar128 * 4;
                            lVar141 = (long)(iVar160 << 4) * 4 + lVar128 * 4;
                            lVar123 = local_4f0 + lVar128 * 4;
                            local_458._0_4_ = (uint)uVar178;
                            local_458._4_4_ = (uint)(uVar178 >> 0x20);
                            iVar117 = (int)local_5a0 + (uint)local_458;
                            local_578._0_4_ = iVar117;
                            piVar134 = (int *)0x0;
                            for (uVar163 = 0; piVar124 = piVar134, uVar163 != uVar127;
                                uVar163 = uVar163 + 1) {
                              lVar143 = (long)m_1.data + (long)piVar124;
                              for (lVar129 = -0x50; lVar129 != 0; lVar129 = lVar129 + 0x10) {
                                piVar134 = (int *)((long)local_500 + lVar143 + lVar128 * 4);
                                piVar175 = (int *)((long)local_530 + lVar143 + lVar128 * 4);
                                piVar2 = (int *)(lVar143 + lVar123);
                                piVar3 = (int *)(lVar143 + lVar141);
                                piVar4 = (int *)(lVar143 + lVar130);
                                iVar149 = *piVar4;
                                iVar146 = piVar4[1];
                                iVar137 = piVar4[2];
                                iVar177 = piVar4[3];
                                iVar544 = *piVar175 + *piVar134;
                                iVar591 = piVar175[1] + piVar134[1];
                                iVar593 = piVar175[2] + piVar134[2];
                                iVar595 = piVar175[3] + piVar134[3];
                                iVar597 = *piVar3 + *piVar2;
                                iVar621 = piVar3[1] + piVar2[1];
                                iVar623 = piVar3[2] + piVar2[2];
                                iVar624 = piVar3[3] + piVar2[3];
                                iVar263 = *piVar134 - *piVar175;
                                iVar406 = piVar134[1] - piVar175[1];
                                iVar410 = piVar134[2] - piVar175[2];
                                iVar411 = piVar134[3] - piVar175[3];
                                iVar500 = *piVar2 - *piVar3;
                                iVar510 = piVar2[1] - piVar3[1];
                                iVar511 = piVar2[2] - piVar3[2];
                                iVar512 = piVar2[3] - piVar3[3];
                                piVar134 = (int *)(lVar143 + lVar128 * 4);
                                iVar261 = piVar134[1];
                                iVar262 = piVar134[2];
                                iVar264 = piVar134[3];
                                *(int *)((long)aiStack_1c0 + lVar129 + 8) =
                                     *piVar134 + iVar544 + iVar597;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0xc) =
                                     iVar261 + iVar591 + iVar621;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x10) =
                                     iVar262 + iVar593 + iVar623;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x14) =
                                     iVar264 + iVar595 + iVar624;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x68) = iVar500 * 2 + iVar263
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x6c) = iVar510 * 2 + iVar406
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x70) = iVar511 * 2 + iVar410
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x74) = iVar512 * 2 + iVar411
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 200) = iVar597 * 4 + iVar544;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0xcc) = iVar621 * 4 + iVar591
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0xd0) = iVar623 * 4 + iVar593
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0xd4) = iVar624 * 4 + iVar595
                                ;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x128) =
                                     iVar149 * 4 + iVar263 + iVar500 * 8;
                                *(int *)((long)aiStack_1c0 + lVar129 + 300) =
                                     iVar146 * 4 + iVar406 + iVar510 * 8;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x130) =
                                     iVar137 * 4 + iVar410 + iVar511 * 8;
                                *(int *)((long)aiStack_1c0 + lVar129 + 0x134) =
                                     iVar177 * 4 + iVar411 + iVar512 * 8;
                                lVar143 = lVar143 + (long)(iVar160 * 0x18) * 4;
                              }
                              local_528._0_8_ = uVar163;
                              iVar146 = iVar167 + (int)uVar163;
                              piVar134 = (int *)(lVar143 + lVar123);
                              piVar175 = (int *)(lVar143 + lVar141);
                              piVar2 = (int *)((long)local_500 + lVar143 + lVar128 * 4);
                              piVar3 = (int *)((long)local_530 + lVar143 + lVar128 * 4);
                              piVar4 = (int *)(lVar143 + lVar130);
                              iVar411 = *piVar134 + *piVar175;
                              iVar500 = piVar134[1] + piVar175[1];
                              iVar510 = piVar134[2] + piVar175[2];
                              iVar511 = piVar134[3] + piVar175[3];
                              iVar264 = *piVar3 + *piVar2;
                              iVar263 = piVar3[1] + piVar2[1];
                              iVar406 = piVar3[2] + piVar2[2];
                              iVar410 = piVar3[3] + piVar2[3];
                              piVar5 = (int *)(lVar143 + lVar128 * 4);
                              iVar149 = iVar146 % iVar135;
                              iVar137 = *piVar134 - *piVar175;
                              iVar177 = piVar134[1] - piVar175[1];
                              iVar261 = piVar134[2] - piVar175[2];
                              iVar262 = piVar134[3] - piVar175[3];
                              iVar512 = (*piVar2 - *piVar3) * 4;
                              iVar544 = (piVar2[1] - piVar3[1]) * 4;
                              iVar591 = (piVar2[2] - piVar3[2]) * 4;
                              iVar593 = (piVar2[3] - piVar3[3]) * 4;
                              aiStack_1c0[2] = (iVar264 + iVar411 + *piVar5) * 4;
                              aiStack_1c0[3] = (iVar263 + iVar500 + piVar5[1]) * 4;
                              aiStack_1c0[4] = (iVar406 + iVar510 + piVar5[2]) * 4;
                              aiStack_1c0[5] = (iVar410 + iVar511 + piVar5[3]) * 4;
                              aiStack_1c0[0x1a] = iVar137 * 8 + iVar512;
                              aiStack_1c0[0x1b] = iVar177 * 8 + iVar544;
                              aiStack_1c0[0x1c] = iVar261 * 8 + iVar591;
                              aiStack_1c0[0x1d] = iVar262 * 8 + iVar593;
                              aiStack_1c0[0x32] = iVar264 * 4 + iVar411 * 0x10;
                              aiStack_1c0[0x33] = iVar263 * 4 + iVar500 * 0x10;
                              aiStack_1c0[0x34] = iVar406 * 4 + iVar510 * 0x10;
                              aiStack_1c0[0x35] = iVar410 * 4 + iVar511 * 0x10;
                              aiStack_1c0[0x4a] = *piVar4 * 0x10 + iVar137 * 0x20 + iVar512;
                              aiStack_1c0[0x4b] = piVar4[1] * 0x10 + iVar177 * 0x20 + iVar544;
                              aiStack_1c0[0x4c] = piVar4[2] * 0x10 + iVar261 * 0x20 + iVar591;
                              aiStack_1c0[0x4d] = piVar4[3] * 0x10 + iVar262 * 0x20 + iVar593;
                              uVar144 = iVar146 / iVar135 << 2;
                              piVar134 = (int *)((long)local_3c8.data +
                                                (long)(iVar149 * 4 * local_3c8.elempack) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar144 +
                                                (long)(iVar117 / local_3c8.elempack) *
                                                local_3c8.cstep * local_3c8.elemsize);
                              iVar146 = iVar149 * 4 + 1;
                              iVar137 = iVar149 * 4 + 2;
                              iVar149 = iVar149 * 4 + 3;
                              piVar175 = aiStack_1c0 + 2;
                              for (lVar129 = 0; lVar129 != 4; lVar129 = lVar129 + 1) {
                                if ((int)(uVar144 | (uint)lVar129) < local_3c8.h) {
                                  iVar545 = piVar175[-0xc] + piVar175[-0x10];
                                  iVar592 = piVar175[-0xb] + piVar175[-0xf];
                                  iVar594 = piVar175[-10] + piVar175[-0xe];
                                  iVar596 = piVar175[-9] + piVar175[-0xd];
                                  iVar263 = piVar175[-4] + piVar175[-8];
                                  iVar406 = piVar175[-3] + piVar175[-7];
                                  iVar410 = piVar175[-2] + piVar175[-6];
                                  iVar411 = piVar175[-1] + piVar175[-5];
                                  iVar177 = piVar175[-0x10] - piVar175[-0xc];
                                  iVar261 = piVar175[-0xf] - piVar175[-0xb];
                                  iVar262 = piVar175[-0xe] - piVar175[-10];
                                  iVar264 = piVar175[-0xd] - piVar175[-9];
                                  iVar544 = piVar175[-8] - piVar175[-4];
                                  iVar593 = piVar175[-7] - piVar175[-3];
                                  iVar597 = piVar175[-6] - piVar175[-2];
                                  iVar623 = piVar175[-5] - piVar175[-1];
                                  iVar591 = (int)((float)(piVar175[-0x14] + iVar545 + iVar263) *
                                                 0.0017361111);
                                  iVar595 = (int)((float)(piVar175[-0x13] + iVar592 + iVar406) *
                                                 0.0017361111);
                                  iVar621 = (int)((float)(piVar175[-0x12] + iVar594 + iVar410) *
                                                 0.0017361111);
                                  iVar624 = (int)((float)(piVar175[-0x11] + iVar596 + iVar411) *
                                                 0.0017361111);
                                  iVar500 = (int)((float)(iVar544 * 2 + iVar177) * 0.0017361111);
                                  iVar510 = (int)((float)(iVar593 * 2 + iVar261) * 0.0017361111);
                                  iVar511 = (int)((float)(iVar597 * 2 + iVar262) * 0.0017361111);
                                  iVar512 = (int)((float)(iVar623 * 2 + iVar264) * 0.0017361111);
                                  iVar263 = (int)((float)(iVar263 * 4 + iVar545) * 0.0017361111);
                                  iVar406 = (int)((float)(iVar406 * 4 + iVar592) * 0.0017361111);
                                  iVar410 = (int)((float)(iVar410 * 4 + iVar594) * 0.0017361111);
                                  iVar411 = (int)((float)(iVar411 * 4 + iVar596) * 0.0017361111);
                                  iVar177 = (int)((float)(iVar177 + *piVar175 + iVar544 * 8) *
                                                 0.0017361111);
                                  iVar261 = (int)((float)(iVar261 + piVar175[1] + iVar593 * 8) *
                                                 0.0017361111);
                                  iVar262 = (int)((float)(iVar262 + piVar175[2] + iVar597 * 8) *
                                                 0.0017361111);
                                  iVar264 = (int)((float)(iVar264 + piVar175[3] + iVar623 * 8) *
                                                 0.0017361111);
                                  if (local_3c8.elempack == 1) {
                                    *piVar134 = iVar591;
                                    piVar134[lVar142] = iVar595;
                                    piVar134[lVar125] = iVar621;
                                    piVar134[lVar126] = iVar624;
                                    if (iVar146 < local_3c8.w) {
                                      piVar134[1] = iVar500;
                                      piVar134[lVar142 + 1] = iVar510;
                                      piVar134[lVar125 + 1] = iVar511;
                                      piVar134[lVar126 + 1] = iVar512;
                                    }
                                    if (iVar137 < local_3c8.w) {
                                      piVar134[2] = iVar263;
                                      piVar134[lVar142 + 2] = iVar406;
                                      piVar134[lVar125 + 2] = iVar410;
                                      piVar134[lVar126 + 2] = iVar411;
                                    }
                                    if (iVar149 < local_3c8.w) {
                                      piVar134[3] = iVar177;
                                      piVar134[lVar142 + 3] = iVar261;
                                      piVar134[lVar125 + 3] = iVar262;
                                      piVar134[lVar126 + 3] = iVar264;
                                    }
                                  }
                                  else if (local_3c8.elempack == 4) {
                                    *piVar134 = iVar591;
                                    piVar134[1] = iVar595;
                                    piVar134[2] = iVar621;
                                    piVar134[3] = iVar624;
                                    if (iVar146 < local_3c8.w) {
                                      piVar134[4] = iVar500;
                                      piVar134[5] = iVar510;
                                      piVar134[6] = iVar511;
                                      piVar134[7] = iVar512;
                                    }
                                    if (iVar137 < local_3c8.w) {
                                      piVar134[8] = iVar263;
                                      piVar134[9] = iVar406;
                                      piVar134[10] = iVar410;
                                      piVar134[0xb] = iVar411;
                                    }
                                    if (iVar149 < local_3c8.w) {
                                      piVar134[0xc] = iVar177;
                                      piVar134[0xd] = iVar261;
                                      piVar134[0xe] = iVar262;
                                      piVar134[0xf] = iVar264;
                                    }
                                  }
                                  piVar134 = piVar134 + local_3c8.elempack * local_3c8.w;
                                }
                                piVar175 = piVar175 + 0x18;
                              }
                              piVar134 = piVar124 + 4;
                              local_518 = piVar124;
                            }
                            iVar164 = iVar164 + iVar160 * 0x90;
                          }
                          lVar125 = (long)(iVar160 * 2);
                          lVar126 = (long)(iVar160 * 6);
                          local_5d8 = (ulong)(iVar160 * 10);
                          for (; (long)(uVar178 | 1) < (long)local_5e0; uVar178 = uVar178 + 2) {
                            local_460 = local_3c8.elemsize;
                            local_500 = (void *)((local_538 + uVar178) * local_3c8.cstep *
                                                 local_3c8.elemsize + (long)local_3c8.data);
                            local_458._0_4_ = (uint)uVar178;
                            local_458._4_4_ = (uint)(uVar178 >> 0x20);
                            piVar134 = (int *)((long)iVar164 * 4 + (long)m_1.data);
                            for (uVar163 = 0; piVar124 = piVar134, uVar163 != uVar127;
                                uVar163 = uVar163 + 1) {
                              piVar134 = piVar124;
                              for (lVar180 = -5; lVar180 != 0; lVar180 = lVar180 + 1) {
                                iVar117 = piVar134[(long)local_4f8] + piVar134[lVar125];
                                iVar149 = piVar134[(long)local_4f8 + 1] + piVar134[lVar125 + 1];
                                iVar263 = piVar134[lVar125] - piVar134[(long)local_4f8];
                                iVar264 = piVar134[lVar125 + 1] - piVar134[(long)local_4f8 + 1];
                                iVar146 = piVar134[(long)local_580] + piVar134[lVar126];
                                iVar410 = piVar134[lVar126] - piVar134[(long)local_580];
                                iVar137 = piVar134[(long)(*local_580 + 1)] + piVar134[lVar126 + 1];
                                iVar406 = piVar134[lVar126 + 1] - piVar134[(long)(*local_580 + 1)];
                                iVar177 = piVar134[local_5d8];
                                iVar261 = piVar134[local_5d8 + 1];
                                iVar262 = piVar134[1];
                                (&opt_q.vulkan_device_index)[lVar180 * 2] =
                                     iVar146 + iVar117 + *piVar134;
                                *(int *)(&opt_q.use_reserved_1 + lVar180 * 8) =
                                     iVar137 + iVar149 + iVar262;
                                aiStack_1c0[lVar180 * 2 + 4] = iVar263 + iVar410 * 2;
                                aiStack_1c0[lVar180 * 2 + 5] = iVar264 + iVar406 * 2;
                                aiStack_1c0[lVar180 * 2 + 0x10] = iVar117 + iVar146 * 4;
                                aiStack_1c0[lVar180 * 2 + 0x11] = iVar149 + iVar137 * 4;
                                aiStack_1c0[lVar180 * 2 + 0x1c] =
                                     iVar263 + iVar410 * 8 + iVar177 * 4;
                                aiStack_1c0[lVar180 * 2 + 0x1d] =
                                     iVar264 + iVar406 * 8 + iVar261 * 4;
                                piVar134 = piVar134 + iVar160 * 0xc;
                              }
                              iVar261 = piVar134[lVar126 + 1] - piVar134[(long)(*local_580 + 1)];
                              iVar117 = piVar134[lVar125 + 1];
                              local_518 = (int *)CONCAT44(local_518._4_4_,iVar117);
                              iVar137 = iVar117 - piVar134[(long)local_4f8 + 1];
                              iVar406 = piVar134[lVar126] - piVar134[(long)local_580];
                              iVar264 = piVar134[lVar125] - piVar134[(long)local_4f8];
                              iVar262 = piVar134[lVar126 + 1] + piVar134[(long)(*local_580 + 1)];
                              iVar117 = piVar134[(long)local_4f8 + 1] + iVar117;
                              iVar263 = piVar134[(long)local_580] + piVar134[lVar126];
                              iVar177 = piVar134[(long)local_4f8] + piVar134[lVar125];
                              iVar146 = iVar167 + (int)uVar163;
                              iVar149 = iVar146 % iVar135;
                              opt_q.vulkan_device_index = (iVar177 + iVar263 + *piVar134) * 4;
                              opt_q._44_4_ = (iVar117 + iVar262 + piVar134[1]) * 4;
                              aiStack_1c0[4] = iVar406 * 8 + iVar264 * 4;
                              aiStack_1c0[5] = iVar261 * 8 + iVar137 * 4;
                              aiStack_1c0[0x10] = iVar263 * 0x10 + iVar177 * 4;
                              aiStack_1c0[0x11] = iVar262 * 0x10 + iVar117 * 4;
                              aiStack_1c0[0x1c] =
                                   piVar134[local_5d8] * 0x10 + iVar406 * 0x20 + iVar264 * 4;
                              aiStack_1c0[0x1d] =
                                   piVar134[local_5d8 + 1] * 0x10 + iVar261 * 0x20 + iVar137 * 4;
                              uVar144 = iVar146 / iVar135 << 2;
                              piVar134 = (int *)((long)local_500 +
                                                (long)(iVar149 * 4) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar144);
                              iVar117 = iVar149 * 4 + 1;
                              local_578._0_4_ = iVar117;
                              iVar146 = iVar149 * 4 + 3;
                              local_488._0_4_ = iVar146;
                              pbVar133 = &opt_q.use_reserved_1;
                              local_528._0_4_ = uVar144;
                              for (lVar180 = 0; lVar180 != 4; lVar180 = lVar180 + 1) {
                                if ((int)(uVar144 | (uint)lVar180) < local_3c8.h) {
                                  iVar137 = *(int *)(pbVar133 + -0x1c) + *(int *)(pbVar133 + -0x24);
                                  iVar177 = *(int *)(pbVar133 + -0x18) + *(int *)(pbVar133 + -0x20);
                                  iVar261 = *(int *)(pbVar133 + -0xc) + *(int *)(pbVar133 + -0x14);
                                  iVar511 = *(int *)(pbVar133 + -0x24) - *(int *)(pbVar133 + -0x1c);
                                  iVar262 = *(int *)(pbVar133 + -8) + *(int *)(pbVar133 + -0x10);
                                  iVar510 = *(int *)(pbVar133 + -0x20) - *(int *)(pbVar133 + -0x18);
                                  iVar500 = *(int *)(pbVar133 + -0x14) - *(int *)(pbVar133 + -0xc);
                                  iVar264 = *(int *)(pbVar133 + -0x28);
                                  iVar411 = *(int *)(pbVar133 + -0x10) - *(int *)(pbVar133 + -8);
                                  iVar263 = *(int *)(pbVar133 + -4);
                                  iVar406 = *(int *)pbVar133;
                                  iVar410 = (iVar261 + iVar137 + *(int *)(pbVar133 + -0x2c)) / 0x240
                                  ;
                                  local_518 = (int *)CONCAT44(local_518._4_4_,iVar410);
                                  *piVar134 = iVar410;
                                  piVar134[lVar142] = (iVar262 + iVar177 + iVar264) / 0x240;
                                  if (iVar117 < local_3c8.w) {
                                    piVar134[1] = (iVar511 + iVar500 * 2) / 0x240;
                                    piVar134[lVar142 + 1] = (iVar510 + iVar411 * 2) / 0x240;
                                  }
                                  if (iVar149 * 4 + 2 < local_3c8.w) {
                                    piVar134[2] = (iVar137 + iVar261 * 4) / 0x240;
                                    piVar134[lVar142 + 2] = (iVar177 + iVar262 * 4) / 0x240;
                                  }
                                  if (iVar146 < local_3c8.w) {
                                    piVar134[3] = (iVar511 + iVar500 * 8 + iVar263) / 0x240;
                                    piVar134[lVar142 + 3] =
                                         (iVar510 + iVar411 * 8 + iVar406) / 0x240;
                                  }
                                  piVar134 = piVar134 + local_3c8.w;
                                }
                                pbVar133 = pbVar133 + 0x30;
                              }
                              piVar134 = piVar124 + 2;
                              local_530 = piVar124;
                            }
                            iVar164 = iVar164 + iVar160 * 0x48;
                          }
                          lVar180 = (long)iVar160;
                          local_598 = (void *)(long)(iVar160 * 3);
                          lVar142 = (long)(iVar160 * 5);
                          local_578._0_8_ = lVar180;
                          local_488._0_8_ = lVar142;
                          for (; (long)uVar178 < (long)local_5e0; uVar178 = uVar178 + 1) {
                            local_528._0_8_ = local_3c8.elemsize;
                            local_518 = (int *)((local_538 + uVar178) * local_3c8.cstep *
                                                local_3c8.elemsize + (long)local_3c8.data);
                            piVar134 = (int *)((long)iVar164 * 4 + (long)m_1.data);
                            local_458._0_4_ = (uint)uVar178;
                            local_458._4_4_ = (uint)(uVar178 >> 0x20);
                            uVar163 = 0;
                            while (uVar138 = uVar163, uVar138 != uVar127) {
                              piVar124 = piVar134;
                              for (lVar130 = -5; lVar130 != 0; lVar130 = lVar130 + 1) {
                                iVar117 = piVar124[lVar125] + piVar124[lVar180];
                                iVar149 = piVar124[(long)local_4f8] + piVar124[(long)local_598];
                                iVar137 = piVar124[lVar180] - piVar124[lVar125];
                                iVar177 = piVar124[(long)local_598] - piVar124[(long)local_4f8];
                                iVar146 = piVar124[lVar142];
                                *(int *)((long)&opt_q.workspace_allocator + lVar130 * 4 + 4) =
                                     iVar149 + iVar117 + *piVar124;
                                *(int *)(&opt_q.use_reserved_1 + lVar130 * 4) =
                                     iVar137 + iVar177 * 2;
                                *(int *)((long)&local_1c8 + lVar130 * 4 + 4) = iVar117 + iVar149 * 4
                                ;
                                aiStack_1c0[lVar130 + 5] = iVar137 + iVar177 * 8 + iVar146 * 4;
                                piVar124 = piVar124 + lVar126;
                              }
                              iVar137 = piVar124[(long)local_598] - piVar124[(long)local_4f8];
                              iVar261 = piVar124[lVar180] - piVar124[lVar125];
                              iVar149 = piVar124[(long)local_598] + piVar124[(long)local_4f8];
                              iVar177 = piVar124[lVar125] + piVar124[lVar180];
                              iVar146 = (int)uVar138 + iVar167;
                              iVar117 = iVar146 % iVar135;
                              opt_q.workspace_allocator._4_4_ = (iVar177 + iVar149 + *piVar124) * 4;
                              opt_q._44_4_ = iVar137 * 8 + iVar261 * 4;
                              local_1c8 = CONCAT44(iVar149 * 0x10 + iVar177 * 4,
                                                   (undefined4)local_1c8);
                              aiStack_1c0[5] =
                                   piVar124[lVar142] * 0x10 + iVar137 * 0x20 + iVar261 * 4;
                              uVar144 = iVar146 / iVar135 << 2;
                              piVar124 = (int *)((long)local_518 +
                                                (long)(iVar117 * 4) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar144);
                              iVar149 = iVar117 * 4 + 1;
                              local_5b8._0_4_ = iVar149;
                              piVar175 = (int *)((long)&opt_q.workspace_allocator + 4);
                              for (lVar130 = 0; lVar130 != 4; lVar130 = lVar130 + 1) {
                                if ((int)(uVar144 | (uint)lVar130) < local_3c8.h) {
                                  iVar146 = piVar175[-3] + piVar175[-4];
                                  iVar137 = piVar175[-1] + piVar175[-2];
                                  iVar262 = piVar175[-4] - piVar175[-3];
                                  iVar261 = piVar175[-2] - piVar175[-1];
                                  iVar177 = *piVar175;
                                  *piVar124 = (iVar137 + iVar146 + piVar175[-5]) / 0x240;
                                  if (iVar149 < local_3c8.w) {
                                    piVar124[1] = (iVar262 + iVar261 * 2) / 0x240;
                                  }
                                  if (iVar117 * 4 + 2 < local_3c8.w) {
                                    piVar124[2] = (iVar146 + iVar137 * 4) / 0x240;
                                  }
                                  if (iVar117 * 4 + 3 < local_3c8.w) {
                                    piVar124[3] = (iVar262 + iVar261 * 8 + iVar177) / 0x240;
                                  }
                                  piVar124 = piVar124 + local_3c8.w;
                                }
                                piVar175 = piVar175 + 6;
                              }
                              piVar134 = piVar134 + 1;
                              local_5d8 = uVar138;
                              uVar163 = uVar138 + 1;
                            }
                            iVar164 = iVar164 + iVar160 * 0x24;
                          }
                          uVar127 = (ulong)(uint)(iVar167 + TILE_N);
                        }
                        if (m_1.refcount != (int *)0x0) {
                          LOCK();
                          *m_1.refcount = *m_1.refcount + -1;
                          UNLOCK();
                          if (*m_1.refcount == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              free(m_1.data);
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      iVar164 = 0;
                    }
                    piVar134 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          free(m.data);
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                }
              }
              piVar134 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  pvVar161 = local_368.data;
                  if (local_368.allocator == (Allocator *)0x0) goto LAB_001644eb;
                  (*(local_368.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              iVar164 = conv3x3s1_winograd43_int8_xop
                                  (&local_4d8,&local_3c8,&this->weight_winograd43_data,
                                   (int)local_5a0,local_5c0);
            }
          }
          else {
            iVar164 = cpu_support_x86_xop();
            if (iVar164 == 0) {
              uVar150 = local_3c8.elempack * local_3c8.c;
              uVar127 = (ulong)uVar150;
              iVar137 = ((local_3c8.h + 1) / 2) * ((local_3c8.w + 1) / 2);
              uVar144 = local_4d8.elempack * local_4d8.c;
              pauVar157 = (undefined1 (*) [16])(ulong)uVar144;
              get_optimal_tile_mnk_int8
                        (uVar150,iVar137,uVar144,&TILE_M,&TILE_N,&TILE_K,(int)local_5a0);
              iVar117 = TILE_K;
              iVar135 = TILE_N;
              local_538 = CONCAT44(local_538._4_4_,(int)(TILE_M + uVar150 + -1) / TILE_M);
              iVar149 = (iVar137 + TILE_N + -1) / TILE_N;
              iVar167 = (int)(uVar144 + TILE_K + -1) / TILE_K;
              pAVar817 = local_5c0->workspace_allocator;
              local_368.cstep = 0;
              iVar146 = TILE_K * TILE_N;
              local_368.data = (void *)0x0;
              local_368.refcount._0_4_ = 0;
              local_368.refcount._4_4_ = 0;
              local_368.elemsize = 0;
              local_368.elempack = 0;
              local_368.allocator = (Allocator *)0x0;
              local_368.dims = 0;
              local_368.w = 0;
              local_368.h = 0;
              local_368.d = 0;
              local_368.c = 0;
              Mat::create(&local_368,iVar146,0x10,iVar167,iVar149,2,pAVar817);
              iVar164 = -100;
              local_580 = pauVar157;
              local_540 = uVar127;
              if ((local_368.data != (void *)0x0) && ((long)local_368.c * local_368.cstep != 0)) {
                iVar149 = iVar149 * iVar167;
                iVar146 = iVar146 * 0x10;
                if (((int)local_5a0 < 2) || ((int)local_5a0 <= iVar149)) {
                  local_1c8 = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator._0_4_ = 0;
                  opt_q.workspace_allocator._4_4_ = 0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  Mat::create((Mat *)&opt_q,iVar146,1,(int)local_5a0,2,
                              local_5c0->workspace_allocator);
                  if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_1c8 != 0)) {
                    iVar164 = 0;
                    if (iVar149 < 1) {
                      iVar149 = iVar164;
                    }
                    local_5b8._0_4_ = iVar149;
                    while (pOVar147 = local_5c0, iVar149 != iVar164) {
                      iVar160 = (iVar164 / iVar167) * iVar135;
                      iVar146 = (int)((long)iVar164 % (long)iVar167) * iVar117;
                      iVar149 = iVar137 - iVar160;
                      if (iVar135 < iVar149) {
                        iVar149 = iVar135;
                      }
                      iVar177 = (int)local_580 - iVar146;
                      if (iVar117 < iVar177) {
                        iVar177 = iVar117;
                      }
                      iVar261 = get_omp_thread_num();
                      m.elemsize = CONCAT44(opt_q.workspace_allocator._4_4_,
                                            opt_q.workspace_allocator._0_4_);
                      m.data = (void *)((long)iVar261 * local_1c8 * m.elemsize + opt_q._0_8_);
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elempack = opt_q.openmp_blocktime;
                      m.allocator = (Allocator *)opt_q._32_8_;
                      m.w._0_1_ = opt_q.use_reserved_1;
                      m.w._1_1_ = opt_q.use_image_storage;
                      m.w._2_1_ = opt_q.use_tensor_storage;
                      m.w._3_1_ = opt_q.use_reserved_2;
                      m.h = opt_q.flush_denormals;
                      m.d = 1;
                      m.c._0_1_ = opt_q.use_local_pool_allocator;
                      m.c._1_1_ = opt_q.use_shader_local_memory;
                      m.c._2_1_ = opt_q.use_cooperative_matrix;
                      m.c._3_1_ = opt_q.use_winograd23_convolution;
                      m.dims = opt_q.vulkan_device_index + -1;
                      m.cstep = (m.elemsize * (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_
                                 + 0xf & 0xfffffffffffffff0) / m.elemsize;
                      if (opt_q.vulkan_device_index == 4) {
                        m.cstep = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                      }
                      conv3x3s1_winograd23_transform_input_tile_int8
                                (&local_4d8,&m,iVar160,iVar149,iVar146,iVar177,(int)pAVar817);
                      m_1.cstep = (long)local_368.h * (long)local_368.w;
                      m_1.data = (void *)((long)local_368.data +
                                         ((long)iVar164 % (long)iVar167 & 0xffffffffU) *
                                         local_368.elemsize * m_1.cstep +
                                         (long)(iVar164 / iVar167) * local_368.cstep *
                                         local_368.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.elemsize = local_368.elemsize;
                      m_1.elempack = local_368.elempack;
                      m_1.allocator = local_368.allocator;
                      m_1.dims = 2;
                      m_1.w = local_368.w;
                      m_1.h = local_368.h;
                      m_1.d = 1;
                      m_1.c = 1;
                      transpose_pack_B_tile_int8(&m,&m_1,0x10,iVar149,iVar177,(int)m_1.cstep);
                      iVar164 = iVar164 + 1;
                      iVar149 = local_5b8._0_4_;
                    }
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) goto LAB_0016262f;
                        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                      }
                    }
                    goto LAB_00162637;
                  }
                  piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
                  if (piVar134 != (int *)0x0) {
                    LOCK();
                    *piVar134 = *piVar134 + -1;
                    UNLOCK();
                    if (*piVar134 == 0) {
                      if (opt_q._32_8_ == 0) goto LAB_001625a3;
                      (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                    }
                  }
                }
                else {
                  local_1c8 = 0;
                  opt_q.lightmode = false;
                  opt_q.use_shader_pack8 = false;
                  opt_q.use_subgroup_ops = false;
                  opt_q.use_reserved_0 = false;
                  opt_q.num_threads = 0;
                  opt_q.blob_allocator._0_4_ = 0;
                  opt_q.blob_allocator._4_4_ = 0;
                  opt_q.workspace_allocator._0_4_ = 0;
                  opt_q.workspace_allocator._4_4_ = 0;
                  opt_q.openmp_blocktime = 0;
                  opt_q.use_bf16_storage = false;
                  opt_q.use_fp16_packed = false;
                  opt_q.use_fp16_storage = false;
                  opt_q.use_fp16_arithmetic = false;
                  opt_q.use_int8_packed = false;
                  opt_q.use_int8_storage = false;
                  opt_q.use_int8_arithmetic = false;
                  opt_q.use_packing_layout = false;
                  opt_q.vulkan_device_index = 0;
                  opt_q.use_reserved_1 = false;
                  opt_q.use_image_storage = false;
                  opt_q.use_tensor_storage = false;
                  opt_q.use_reserved_2 = false;
                  opt_q.flush_denormals = 0;
                  opt_q.use_local_pool_allocator = false;
                  opt_q.use_shader_local_memory = false;
                  opt_q.use_cooperative_matrix = false;
                  opt_q.use_winograd23_convolution = false;
                  opt_q.use_winograd43_convolution = false;
                  opt_q.use_winograd63_convolution = false;
                  opt_q.use_a53_a55_optimized_kernel = false;
                  opt_q.use_fp16_uniform = false;
                  Mat::create((Mat *)&opt_q,iVar146,2,local_5c0->workspace_allocator);
                  if ((opt_q._0_8_ == 0) || ((long)(int)opt_q._56_4_ * local_1c8 == 0)) {
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) {
LAB_001625a3:
                          free((void *)opt_q._0_8_);
                        }
                        else {
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
                  }
                  else {
                    iVar164 = 0;
                    if (iVar149 < 1) {
                      iVar149 = 0;
                    }
                    for (; pOVar147 = local_5c0, iVar149 != iVar164; iVar164 = iVar164 + 1) {
                      iVar160 = (iVar164 / iVar167) * iVar135;
                      iVar177 = (int)((long)iVar164 % (long)iVar167) * iVar117;
                      iVar146 = iVar137 - iVar160;
                      if (iVar135 < iVar146) {
                        iVar146 = iVar135;
                      }
                      iVar261 = (int)local_580 - iVar177;
                      if (iVar117 < iVar261) {
                        iVar261 = iVar117;
                      }
                      conv3x3s1_winograd23_transform_input_tile_int8
                                (&local_4d8,(Mat *)&opt_q,iVar160,iVar146,iVar177,iVar261,
                                 (int)pAVar817);
                      m.cstep = (long)local_368.h * (long)local_368.w;
                      m.data = (void *)((long)local_368.data +
                                       ((long)iVar164 % (long)iVar167 & 0xffffffffU) *
                                       local_368.elemsize * m.cstep +
                                       (long)(iVar164 / iVar167) * local_368.cstep *
                                       local_368.elemsize);
                      m.refcount._0_4_ = 0;
                      m.refcount._4_4_ = 0;
                      m.elemsize = local_368.elemsize;
                      m.elempack = local_368.elempack;
                      m.allocator = local_368.allocator;
                      m.dims = 2;
                      m.w = local_368.w;
                      m.h = local_368.h;
                      m.d = 1;
                      m.c = 1;
                      transpose_pack_B_tile_int8((Mat *)&opt_q,&m,0x10,iVar146,iVar261,(int)m.cstep)
                      ;
                    }
                    piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_
                                              );
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (opt_q._32_8_ == 0) {
LAB_0016262f:
                          pOVar147 = local_5c0;
                          free((void *)opt_q._0_8_);
                        }
                        else {
                          (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                        }
                      }
                    }
LAB_00162637:
                    m.cstep = 0;
                    m.data = (void *)0x0;
                    m.refcount._0_4_ = 0;
                    m.refcount._4_4_ = 0;
                    m.elemsize = 0;
                    m.elempack = 0;
                    m.allocator = (Allocator *)0x0;
                    m.dims = 0;
                    m.w = 0;
                    m.h = 0;
                    m.d = 0;
                    m.c = 0;
                    Mat::create(&m,TILE_N * TILE_M * 0x10,1,(int)local_5a0,4,
                                pOVar147->workspace_allocator);
                    iVar164 = -100;
                    if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
                      iVar164 = (int)local_538;
                      if ((int)local_538 < 1) {
                        iVar164 = 0;
                      }
                      local_538 = CONCAT44(local_538._4_4_,iVar164);
                      iVar135 = 0;
                      while( true ) {
                        iVar117 = TILE_M;
                        iVar164 = 0;
                        if (iVar135 == (int)local_538) break;
                        local_5e0 = (undefined1 (*) [16])CONCAT44(local_5e0._4_4_,iVar135);
                        iVar164 = get_omp_thread_num();
                        m_1.data = (void *)((long)iVar164 * m.cstep * m.elemsize + (long)m.data);
                        m_1.refcount = (int *)0x0;
                        m_1.elemsize = m.elemsize;
                        m_1.elempack = m.elempack;
                        m_1.allocator = m.allocator;
                        m_1.w = m.w;
                        m_1.h = m.h;
                        m_1.d = 1;
                        m_1.c = m.d;
                        m_1.dims = m.dims + -1;
                        m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0)
                                    / m.elemsize;
                        if (m.dims == 4) {
                          m_1.cstep = (long)m.h * (long)m.w;
                        }
                        local_458._0_4_ = iVar117 * (int)local_5e0;
                        iVar164 = (int)local_540 - (uint)local_458;
                        if (iVar117 < iVar164) {
                          iVar164 = iVar117;
                        }
                        local_458._4_4_ = 0;
                        local_4f8 = (void *)(long)(int)(uint)local_458;
                        local_460 = CONCAT44(local_460._4_4_,iVar164);
                        lVar125 = (long)iVar164;
                        uVar127 = 0;
                        while (iVar117 = TILE_K, iVar135 = TILE_M, iVar164 = TILE_N,
                              uVar150 = iVar137 - (int)uVar127,
                              uVar150 != 0 && (int)uVar127 <= iVar137) {
                          if (TILE_N < (int)uVar150) {
                            uVar150 = TILE_N;
                          }
                          local_530 = (int *)(ulong)uVar150;
                          iVar146 = (int)local_580;
                          uVar178 = (ulong)local_580 & 0xffffffff;
                          iVar149 = 0;
                          local_5d8 = uVar127;
                          while( true ) {
                            iVar160 = (int)uVar178;
                            iVar177 = (int)local_530;
                            iVar167 = (int)local_5d8;
                            if (iVar146 <= iVar149) break;
                            iVar261 = iVar160;
                            if (iVar117 < iVar160) {
                              iVar261 = iVar117;
                            }
                            opt_q._44_4_ = (this->weight_winograd23_data).w;
                            opt_q.flush_denormals = (this->weight_winograd23_data).h;
                            sVar41 = (this->weight_winograd23_data).elemsize;
                            opt_q.openmp_blocktime = (this->weight_winograd23_data).elempack;
                            opt_q._32_8_ = (this->weight_winograd23_data).allocator;
                            local_1c8 = (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_;
                            opt_q._0_8_ = (long)(this->weight_winograd23_data).data +
                                          sVar41 * local_1c8 * (long)(iVar149 / iVar117) +
                                          (long)((int)(uint)local_458 / iVar135) *
                                          (this->weight_winograd23_data).cstep * sVar41;
                            opt_q.blob_allocator._0_4_ = 0;
                            opt_q.blob_allocator._4_4_ = 0;
                            opt_q.workspace_allocator._0_4_ = (undefined4)sVar41;
                            opt_q.workspace_allocator._4_4_ = (int)(sVar41 >> 0x20);
                            local_298.dims = 2;
                            opt_q.use_local_pool_allocator = true;
                            opt_q.use_shader_local_memory = false;
                            opt_q.use_cooperative_matrix = false;
                            opt_q.use_winograd23_convolution = false;
                            opt_q.use_winograd43_convolution = true;
                            opt_q.use_winograd63_convolution = false;
                            opt_q.use_a53_a55_optimized_kernel = false;
                            opt_q.use_fp16_uniform = false;
                            local_298.cstep = (long)local_368.h * (long)local_368.w;
                            local_298.data =
                                 (void *)((long)local_368.data +
                                         local_298.cstep * local_368.elemsize *
                                         (long)(iVar149 / iVar117) +
                                         (long)(int)((long)((ulong)(uint)(iVar167 >> 0x1f) << 0x20 |
                                                           local_5d8 & 0xffffffff) / (long)iVar164)
                                         * local_368.cstep * local_368.elemsize);
                            local_298.refcount = (int *)0x0;
                            local_298.elemsize = local_368.elemsize;
                            local_298.elempack = local_368.elempack;
                            local_298.allocator = local_368.allocator;
                            local_298.w = local_368.w;
                            local_298.h = local_368.h;
                            local_298.d = 1;
                            local_298.c = 1;
                            opt_q.vulkan_device_index = local_298.dims;
                            gemm_transB_packed_tile_int8
                                      ((Mat *)&opt_q,&local_298,&m_1,0x10,(int)local_460,iVar177,
                                       iVar149,iVar261,iVar146 <= iVar149 + iVar117);
                            uVar178 = (ulong)(uint)-(iVar117 - iVar160);
                            iVar149 = iVar149 + iVar117;
                          }
                          iVar135 = (int)local_3c8.cstep * local_3c8.elempack;
                          iVar164 = (local_3c8.w + 1) / 2;
                          iVar117 = iVar177 * 0x10;
                          lVar126 = (long)(iVar177 * 4);
                          auVar112._8_8_ = 0;
                          auVar112._0_8_ = local_558._8_8_;
                          local_558 = auVar112 << 0x40;
                          uVar127 = 0;
                          if (0 < iVar177) {
                            uVar127 = (ulong)local_530 & 0xffffffff;
                          }
                          local_5b8._0_8_ = uVar127;
                          lVar142 = (long)(iVar177 * 0xc) * 4;
                          local_488._0_8_ = lVar142;
                          local_4f0 = CONCAT44(local_4f0._4_4_,iVar117);
                          lVar180 = (long)(iVar177 * 8) * 4;
                          local_4e8._0_8_ = lVar126;
                          local_528._0_8_ = lVar126 * 4;
                          local_578._0_8_ = lVar180;
                          for (uVar178 = 0; auVar528 = local_558, (long)(uVar178 | 3) < lVar125;
                              uVar178 = uVar178 + 4) {
                            lVar130 = (long)(int)local_558._0_4_;
                            local_448._0_8_ = uVar178;
                            iVar149 = (uint)local_458 + (int)uVar178;
                            local_598 = (void *)CONCAT44(local_598._4_4_,iVar149);
                            piVar134 = (int *)0x0;
                            for (uVar163 = 0; piVar124 = piVar134, uVar163 != uVar127;
                                uVar163 = uVar163 + 1) {
                              lVar123 = (long)m_1.data + (long)piVar124;
                              for (lVar141 = -0x40; lVar141 != 0; lVar141 = lVar141 + 0x10) {
                                piVar134 = (int *)(lVar123 + lVar126 * 4 + lVar130 * 4);
                                iVar146 = *piVar134;
                                iVar160 = piVar134[1];
                                iVar261 = piVar134[2];
                                iVar262 = piVar134[3];
                                piVar134 = (int *)(lVar123 + lVar180 + lVar130 * 4);
                                iVar264 = *piVar134;
                                iVar263 = piVar134[1];
                                iVar406 = piVar134[2];
                                iVar410 = piVar134[3];
                                piVar134 = (int *)(lVar123 + lVar130 * 4);
                                iVar411 = piVar134[1];
                                iVar500 = piVar134[2];
                                iVar510 = piVar134[3];
                                piVar175 = (int *)(lVar123 + lVar142 + lVar130 * 4);
                                iVar511 = *piVar175;
                                iVar512 = piVar175[1];
                                iVar544 = piVar175[2];
                                iVar591 = piVar175[3];
                                *(int *)((long)&local_1c8 + lVar141) = *piVar134 + iVar146 + iVar264
                                ;
                                *(int *)((long)&local_1c8 + lVar141 + 4) =
                                     iVar411 + iVar160 + iVar263;
                                *(int *)((long)aiStack_1c0 + lVar141) = iVar500 + iVar261 + iVar406;
                                *(int *)((long)aiStack_1c0 + lVar141 + 4) =
                                     iVar510 + iVar262 + iVar410;
                                *(int *)((long)aiStack_1c0 + lVar141 + 0x38) =
                                     (iVar146 - iVar264) + iVar511;
                                *(int *)((long)aiStack_1c0 + lVar141 + 0x3c) =
                                     (iVar160 - iVar263) + iVar512;
                                *(int *)((long)aiStack_1c0 + lVar141 + 0x40) =
                                     (iVar261 - iVar406) + iVar544;
                                *(int *)((long)aiStack_1c0 + lVar141 + 0x44) =
                                     (iVar262 - iVar410) + iVar591;
                                lVar123 = lVar123 + (long)iVar117 * 4;
                              }
                              iVar160 = iVar167 + (int)uVar163;
                              iVar146 = iVar160 % iVar164;
                              uVar150 = (iVar160 / iVar164) * 2;
                              piVar134 = (int *)((long)local_3c8.data +
                                                (long)(iVar146 * 2 * local_3c8.elempack) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar150 +
                                                (long)(iVar149 / local_3c8.elempack) *
                                                local_3c8.cstep * local_3c8.elemsize);
                              iVar146 = iVar146 * 2 + 1;
                              piVar175 = &opt_q.flush_denormals;
                              for (lVar141 = 0; lVar141 != 2; lVar141 = lVar141 + 1) {
                                if ((int)(uVar150 | (uint)lVar141) < local_3c8.h) {
                                  iVar263 = *(int *)(piVar175 + -0xc) + piVar175[-8] + piVar175[-4]
                                            >> 2;
                                  iVar406 = piVar175[-0xb] + piVar175[-7] + piVar175[-3] >> 2;
                                  iVar410 = piVar175[-10] + piVar175[-6] + piVar175[-2] >> 2;
                                  iVar411 = piVar175[-9] + piVar175[-5] + piVar175[-1] >> 2;
                                  iVar160 = (piVar175[-8] - piVar175[-4]) + *piVar175 >> 2;
                                  iVar261 = (piVar175[-7] - piVar175[-3]) + piVar175[1] >> 2;
                                  iVar262 = (piVar175[-6] - piVar175[-2]) + piVar175[2] >> 2;
                                  iVar264 = (piVar175[-5] - piVar175[-1]) + piVar175[3] >> 2;
                                  if (local_3c8.elempack == 1) {
                                    *piVar134 = iVar263;
                                    piVar134[iVar135] = iVar406;
                                    piVar134[iVar135 * 2] = iVar410;
                                    piVar134[iVar135 * 3] = iVar411;
                                    if (iVar146 < local_3c8.w) {
                                      piVar134[1] = iVar160;
                                      piVar134[(long)iVar135 + 1] = iVar261;
                                      piVar134[(long)(iVar135 * 2) + 1] = iVar262;
                                      piVar134[(long)(iVar135 * 3) + 1] = iVar264;
                                    }
                                  }
                                  else if (local_3c8.elempack == 4) {
                                    *piVar134 = iVar263;
                                    piVar134[1] = iVar406;
                                    piVar134[2] = iVar410;
                                    piVar134[3] = iVar411;
                                    if (iVar146 < local_3c8.w) {
                                      piVar134[4] = iVar160;
                                      piVar134[5] = iVar261;
                                      piVar134[6] = iVar262;
                                      piVar134[7] = iVar264;
                                    }
                                  }
                                  piVar134 = piVar134 + local_3c8.elempack * local_3c8.w;
                                }
                                piVar175 = piVar175 + 0x10;
                              }
                              piVar134 = piVar124 + 4;
                              local_518 = piVar124;
                            }
                            local_558._4_4_ = 0;
                            local_558._0_4_ = local_558._0_4_ + iVar177 * 0x40;
                            local_558._8_8_ = auVar528._8_8_;
                          }
                          lVar142 = (long)(iVar177 * 2);
                          local_500 = (void *)CONCAT44(local_500._4_4_,iVar177 * 0x20);
                          for (; auVar528 = local_558, (long)(uVar178 | 1) < lVar125;
                              uVar178 = uVar178 + 2) {
                            local_448._0_8_ = uVar178;
                            local_488._0_8_ = local_3c8.elemsize;
                            local_598 = (void *)(((long)local_4f8 + uVar178) * local_3c8.cstep *
                                                 local_3c8.elemsize + (long)local_3c8.data);
                            piVar134 = (int *)((long)(int)local_558._0_4_ * 4 + (long)m_1.data);
                            for (uVar163 = 0; piVar124 = piVar134, uVar163 != uVar127;
                                uVar163 = uVar163 + 1) {
                              piVar134 = piVar124;
                              for (lVar180 = -4; lVar180 != 0; lVar180 = lVar180 + 1) {
                                iVar149 = piVar134[lVar142];
                                iVar146 = piVar134[lVar126];
                                *(int *)(&opt_q.use_bf16_storage + lVar180 * 8) =
                                     *piVar134 + iVar149 + iVar146;
                                iVar160 = piVar134[lVar142 + 1];
                                iVar261 = piVar134[lVar126 + 1];
                                *(int *)(&opt_q.use_int8_packed + lVar180 * 8) =
                                     piVar134[1] + iVar160 + iVar261;
                                *(int *)(&local_1c8 + lVar180) =
                                     (iVar149 - iVar146) + piVar134[iVar177 * 6];
                                *(int *)((long)&local_1c8 + lVar180 * 8 + 4) =
                                     (iVar160 - iVar261) + piVar134[(long)(iVar177 * 6) + 1];
                                piVar134 = piVar134 + iVar177 * 8;
                              }
                              iVar146 = iVar167 + (int)uVar163;
                              iVar149 = iVar146 % iVar164;
                              uVar150 = (iVar146 / iVar164) * 2;
                              piVar134 = (int *)((long)local_598 +
                                                (long)(iVar149 * 2) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar150);
                              pbVar133 = &opt_q.use_winograd_convolution;
                              for (lVar180 = 0; lVar180 != 2; lVar180 = lVar180 + 1) {
                                if ((int)(uVar150 | (uint)lVar180) < local_3c8.h) {
                                  iVar146 = *(int *)(pbVar133 + -0x14);
                                  iVar160 = *(int *)(pbVar133 + -0x10);
                                  iVar261 = *(int *)(pbVar133 + -0xc);
                                  iVar262 = *(int *)(pbVar133 + -0x18);
                                  iVar264 = *(int *)(pbVar133 + -8);
                                  iVar263 = *(int *)(pbVar133 + -4);
                                  iVar406 = *(int *)pbVar133;
                                  *piVar134 = *(int *)(pbVar133 + -0x1c) + iVar146 + iVar261 >> 2;
                                  piVar134[iVar135] = iVar262 + iVar160 + iVar264 >> 2;
                                  if (iVar149 * 2 + 1 < local_3c8.w) {
                                    piVar134[1] = (iVar146 - iVar261) + iVar263 >> 2;
                                    piVar134[(long)iVar135 + 1] = (iVar160 - iVar264) + iVar406 >> 2
                                    ;
                                  }
                                  piVar134 = piVar134 + local_3c8.w;
                                }
                                pbVar133 = pbVar133 + 0x20;
                              }
                              piVar134 = piVar124 + 2;
                              local_518 = piVar124;
                            }
                            local_558._4_4_ = 0;
                            local_558._0_4_ = local_558._0_4_ + iVar177 * 0x20;
                            local_558._8_8_ = auVar528._8_8_;
                          }
                          for (; auVar528 = local_558, (long)uVar178 < lVar125;
                              uVar178 = uVar178 + 1) {
                            local_448._0_8_ = uVar178;
                            piVar134 = (int *)((long)(int)local_558._0_4_ * 4 + (long)m_1.data);
                            for (uVar163 = 0; uVar163 != uVar127; uVar163 = uVar163 + 1) {
                              piVar124 = piVar134;
                              for (lVar180 = -4; lVar180 != 0; lVar180 = lVar180 + 1) {
                                iVar135 = piVar124[iVar177];
                                iVar149 = piVar124[lVar142];
                                *(int *)((long)&opt_q.workspace_allocator + lVar180 * 4) =
                                     *piVar124 + iVar135 + iVar149;
                                *(int *)(&opt_q.use_bf16_storage + lVar180 * 4) =
                                     (iVar135 - iVar149) + piVar124[iVar177 * 3];
                                piVar124 = piVar124 + lVar126;
                              }
                              iVar149 = iVar167 + (int)uVar163;
                              iVar135 = iVar149 % iVar164;
                              uVar150 = (iVar149 / iVar164) * 2;
                              piVar124 = (int *)((long)local_3c8.data +
                                                (long)(iVar135 * 2) * 4 +
                                                (long)local_3c8.w * local_3c8.elemsize *
                                                (long)(int)uVar150 +
                                                (uVar178 + (long)local_4f8) * local_3c8.cstep *
                                                local_3c8.elemsize);
                              piVar175 = (int *)((long)&opt_q.blob_allocator + 4);
                              for (lVar180 = 0; lVar180 != 2; lVar180 = lVar180 + 1) {
                                if ((int)(uVar150 | (uint)lVar180) < local_3c8.h) {
                                  iVar149 = piVar175[-2];
                                  iVar146 = piVar175[-1];
                                  iVar160 = *piVar175;
                                  *piVar124 = piVar175[-3] + iVar149 + iVar146 >> 2;
                                  if (iVar135 * 2 + 1 < local_3c8.w) {
                                    piVar124[1] = (iVar149 - iVar146) + iVar160 >> 2;
                                  }
                                  piVar124 = piVar124 + local_3c8.w;
                                }
                                piVar175 = piVar175 + 4;
                              }
                              piVar134 = piVar134 + 1;
                            }
                            local_558._4_4_ = 0;
                            local_558._0_4_ = local_558._0_4_ + iVar117;
                            local_558._8_8_ = auVar528._8_8_;
                          }
                          uVar127 = (ulong)(uint)(iVar167 + TILE_N);
                        }
                        if (m_1.refcount != (int *)0x0) {
                          LOCK();
                          *m_1.refcount = *m_1.refcount + -1;
                          UNLOCK();
                          if (*m_1.refcount == 0) {
                            if (m_1.allocator == (Allocator *)0x0) {
                              free(m_1.data);
                            }
                            else {
                              (*(m_1.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        iVar135 = (int)local_5e0 + 1;
                      }
                    }
                    piVar134 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                    if (piVar134 != (int *)0x0) {
                      LOCK();
                      *piVar134 = *piVar134 + -1;
                      UNLOCK();
                      if (*piVar134 == 0) {
                        if (m.allocator == (Allocator *)0x0) {
                          free(m.data);
                        }
                        else {
                          (*(m.allocator)->_vptr_Allocator[3])();
                        }
                      }
                    }
                  }
                }
              }
              piVar134 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  pvVar161 = local_368.data;
                  if (local_368.allocator == (Allocator *)0x0) goto LAB_001644eb;
                  (*(local_368.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              iVar164 = conv3x3s1_winograd23_int8_xop
                                  (&local_4d8,&local_3c8,&this->weight_winograd23_data,
                                   (int)local_5a0,local_5c0);
            }
          }
LAB_001644f6:
          if (iVar164 != 0) goto LAB_00164879;
        }
        else {
          local_5d8 = CONCAT44(auVar550._4_4_,auVar550._4_4_);
          local_5b8._8_4_ = uVar17;
          local_5b8._0_8_ = auVar550._8_8_;
          local_5b8._12_4_ = uVar28;
          iStack_5d0 = auVar550._4_4_;
          iStack_5cc = auVar550._4_4_;
          local_458._0_4_ = uVar28;
          local_458._4_4_ = uVar28;
          uStack_450 = uVar28;
          uStack_44c = uVar28;
          if (pOVar147->use_sgemm_convolution == true) {
            iVar137 = iVar117 * iVar135;
            uVar144 = local_3c8.elempack * local_3c8.c;
            uVar178 = (ulong)uVar144;
            uVar179 = local_3c8.h * local_3c8.w;
            piVar134 = (int *)(ulong)uVar179;
            uVar150 = local_4d8.c * iVar137 * local_4d8.elempack;
            uVar127 = (ulong)uVar150;
            convolution_im2col_gemm_get_optimal_tile_mnk_int8
                      (uVar144,uVar179,uVar150,&TILE_M,&TILE_N,&TILE_K,(int)local_5a0);
            iVar146 = (int)(TILE_M + uVar144 + -1) / TILE_M;
            iVar164 = (int)(uVar179 + TILE_N + -1) / TILE_N;
            iVar167 = (int)(uVar150 + TILE_K + -1) / TILE_K;
            local_1c8 = 0;
            opt_q.lightmode = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_ops = false;
            opt_q.use_reserved_0 = false;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.vulkan_device_index = 0;
            opt_q.use_reserved_1 = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_2 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_fp16_uniform = false;
            local_580 = (undefined1 (*) [16])CONCAT44(local_580._4_4_,iVar164);
            Mat::create((Mat *)&opt_q,TILE_K * TILE_N,iVar167,iVar164,1,
                        local_5c0->workspace_allocator);
            auVar528 = _DAT_00537fd0;
            iVar164 = -100;
            local_530 = piVar134;
            local_4f0 = uVar127;
            local_310 = uVar178;
            if ((opt_q._0_8_ != 0) && ((long)(int)opt_q._56_4_ * local_1c8 != 0)) {
              bVar131 = (byte)iVar149;
              bVar156 = (bVar131 & 4) >> 2;
              iVar149 = (int)local_580 * iVar167;
              bVar131 = (iVar117 == 1 && iVar135 == 1) & bVar131 & bVar131 >> 1 & bVar131 >> 3 &
                        bVar156;
              local_5e0 = (undefined1 (*) [16])CONCAT71(local_5e0._1_7_,bVar131);
              uVar144 = ~((iVar135 + -1) * auVar550._0_4_);
              local_538 = (ulong)uVar144;
              iVar164 = 0;
              if (iVar149 < 1) {
                iVar149 = 0;
              }
              local_580 = (undefined1 (*) [16])CONCAT44(local_580._4_4_,iVar149);
              iVar117 = (int)local_5d8;
              local_540 = CONCAT44(local_540._4_4_,(int)local_5d8);
              uVar151 = local_5b8._0_4_;
              local_488[0] = bVar156;
              local_448._0_4_ = local_5b8._0_4_;
              local_528._0_4_ = auVar550._0_4_;
              local_608 = auVar550;
              for (; iVar164 != iVar149; iVar164 = iVar164 + 1) {
                local_460 = CONCAT44(local_460._4_4_,iVar164);
                uVar159 = TILE_N * (iVar164 / iVar167);
                local_598 = (void *)(ulong)uVar159;
                iVar177 = TILE_K * (iVar164 % iVar167);
                iVar160 = uVar179 - uVar159;
                if (TILE_N < (int)(uVar179 - uVar159)) {
                  iVar160 = TILE_N;
                }
                iVar261 = uVar150 - iVar177;
                if (TILE_K < (int)(uVar150 - iVar177)) {
                  iVar261 = TILE_K;
                }
                pauVar157 = (undefined1 (*) [16])
                            ((ulong)(uint)(iVar164 % iVar167) * (long)(int)opt_q._44_4_ *
                             CONCAT44(opt_q.workspace_allocator._4_4_,
                                      opt_q.workspace_allocator._0_4_) +
                            (long)(iVar164 / iVar167) * local_1c8 *
                            CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_
                                    ) + opt_q._0_8_);
                local_608._0_4_ = iVar261;
                iVar262 = (int)local_4d8.cstep;
                if (bVar131 == 0) {
                  local_578._0_4_ = iVar160;
                  local_5d8 = CONCAT44(local_5d8._4_4_,local_4d8.elempack);
                  uVar127 = (ulong)(uint)local_4d8.w;
                  uVar45 = (int)(uVar144 + local_4d8.w) / (int)uVar151;
                  uVar165 = uVar45 + 1;
                  uVar145 = 0;
                  uVar152 = 0;
                  uVar116 = 1;
                  uVar136 = 0;
                  if (uVar45 != 0) {
                    uVar152 = 0x1f;
                    if (uVar45 != 0) {
                      for (; uVar45 >> uVar152 == 0; uVar152 = uVar152 - 1) {
                      }
                    }
                    iVar264 = 1 << (-(char)(uVar152 ^ 0x1f) & 0x1fU);
                    if ((uVar152 ^ 0x1f) == 0) {
                      iVar264 = 0;
                    }
                    auVar43._4_8_ = 0;
                    auVar43._0_4_ = uVar165;
                    auVar46._4_8_ = 0;
                    auVar46._0_4_ = iVar264 - uVar165;
                    uVar116 = SUB124((auVar46 << 0x20) / auVar43,0) + 1;
                    uVar136 = 1;
                  }
                  local_558._0_4_ = uVar165;
                  iVar406 = local_4d8.w * iVar117;
                  iVar263 = iVar261 / 8;
                  uVar178 = (long)iVar177 / 8 & 0xffffffff;
                  local_5b8._0_8_ = uVar178;
                  local_518 = (int *)CONCAT44(local_518._4_4_,iVar263);
                  iVar264 = 0;
                  if (0 < iVar263) {
                    iVar264 = iVar263;
                  }
                  while( true ) {
                    uVar138 = (ulong)uVar136;
                    uVar163 = (ulong)uVar152;
                    if (iVar160 <= (int)(uVar145 | 7)) break;
                    iVar410 = uVar159 + uVar145;
                    auVar679._0_4_ = iVar410 + auVar528._0_4_;
                    auVar679._4_4_ = iVar410 + auVar528._4_4_;
                    auVar679._8_4_ = iVar410 + auVar528._8_4_;
                    auVar679._12_4_ = iVar410 + auVar528._12_4_;
                    auVar773._0_8_ = (ulong)auVar679._0_4_ * (ulong)uVar116 >> 0x20;
                    auVar773._8_8_ = (auVar679._8_8_ & 0xffffffff) * (ulong)uVar116 >> 0x20;
                    auVar772._0_8_ = (ulong)auVar679._4_4_ * (ulong)uVar116;
                    auVar772._8_8_ = (auVar679._8_8_ >> 0x20) * (ulong)uVar116;
                    auVar773 = auVar772 & _DAT_00537fe0 | auVar773;
                    auVar690._0_4_ = iVar410 + 4;
                    auVar690._4_4_ = iVar410 + 5;
                    auVar690._8_4_ = iVar410 + 6;
                    auVar690._12_4_ = iVar410 + 7;
                    auVar750._0_4_ =
                         (auVar679._0_4_ - auVar773._0_4_ >> uVar138) + auVar773._0_4_ >> uVar163;
                    auVar750._4_4_ =
                         (auVar679._4_4_ - auVar773._4_4_ >> uVar138) + auVar773._4_4_ >> uVar163;
                    auVar750._8_4_ =
                         ((uint)(auVar679._8_4_ - auVar773._8_4_) >> uVar138) + auVar773._8_4_ >>
                         uVar163;
                    auVar750._12_4_ =
                         ((uint)(auVar679._12_4_ - auVar773._12_4_) >> uVar138) + auVar773._12_4_ >>
                         uVar163;
                    auVar775._0_8_ = (ulong)auVar690._0_4_ * (ulong)uVar116 >> 0x20;
                    auVar775._8_8_ = (auVar690._8_8_ & 0xffffffff) * (ulong)uVar116 >> 0x20;
                    auVar774._0_8_ = (ulong)auVar690._4_4_ * (ulong)uVar116;
                    auVar774._8_8_ = (auVar690._8_8_ >> 0x20) * (ulong)uVar116;
                    auVar775 = auVar774 & _DAT_00537fe0 | auVar775;
                    auVar727._0_4_ =
                         (auVar690._0_4_ - auVar775._0_4_ >> uVar138) + auVar775._0_4_ >> uVar163;
                    auVar727._4_4_ =
                         (auVar690._4_4_ - auVar775._4_4_ >> uVar138) + auVar775._4_4_ >> uVar163;
                    auVar727._8_4_ =
                         ((uint)(auVar690._8_4_ - auVar775._8_4_) >> uVar138) + auVar775._8_4_ >>
                         uVar163;
                    auVar727._12_4_ =
                         ((uint)(auVar690._12_4_ - auVar775._12_4_) >> uVar138) + auVar775._12_4_ >>
                         uVar163;
                    auVar791._4_4_ = auVar750._4_4_;
                    auVar791._0_4_ = auVar750._4_4_;
                    auVar791._8_4_ = auVar750._12_4_;
                    auVar791._12_4_ = auVar750._12_4_;
                    auVar680._0_4_ = auVar679._0_4_ - auVar750._0_4_ * uVar165;
                    auVar680._4_4_ = auVar679._4_4_ - auVar750._4_4_ * uVar165;
                    auVar680._8_4_ =
                         auVar679._8_4_ - (int)((auVar750._8_8_ & 0xffffffff) * (ulong)uVar165);
                    auVar680._12_4_ =
                         auVar679._12_4_ - (int)((auVar791._8_8_ & 0xffffffff) * (ulong)uVar165);
                    auVar413._4_4_ = auVar727._4_4_;
                    auVar413._0_4_ = auVar727._4_4_;
                    auVar413._8_4_ = auVar727._12_4_;
                    auVar413._12_4_ = auVar727._12_4_;
                    uVar260 = (undefined4)((ulong)auVar750._4_4_ * (ulong)(uint)local_458);
                    uVar405 = (undefined4)((auVar791._8_8_ & 0xffffffff) * (ulong)uStack_450);
                    uVar183 = (undefined4)((ulong)auVar727._4_4_ * (ulong)(uint)local_458);
                    uVar259 = (undefined4)((auVar413._8_8_ & 0xffffffff) * (ulong)uStack_450);
                    auVar776._4_4_ = auVar680._4_4_;
                    auVar776._0_4_ = auVar680._4_4_;
                    auVar776._8_4_ = auVar680._12_4_;
                    auVar776._12_4_ = auVar680._12_4_;
                    auVar271._4_4_ = uVar260;
                    auVar271._0_4_ = uVar260;
                    auVar271._8_4_ = uVar405;
                    auVar271._12_4_ = uVar405;
                    auVar792._4_4_ = uVar183;
                    auVar792._0_4_ = uVar183;
                    auVar792._8_4_ = uVar259;
                    auVar792._12_4_ = uVar259;
                    iVar512 = (int)(((ulong)auVar750._0_4_ * (ulong)(uint)local_458 & 0xffffffff) *
                                   uVar127);
                    iVar410 = auVar680._0_4_ * uVar17 + iVar512;
                    iVar411 = auVar680._4_4_ * uVar17 +
                              (int)(((ulong)auVar750._4_4_ * (ulong)(uint)local_458 & 0xffffffff) *
                                   uVar127);
                    iVar500 = (int)((auVar680._8_8_ & 0xffffffff) * (ulong)(uint)uVar17) +
                              (int)(((auVar750._8_8_ & 0xffffffff) * (ulong)uStack_450 & 0xffffffff)
                                   * uVar127);
                    iVar510 = (int)((auVar776._8_8_ & 0xffffffff) * (ulong)(uint)uVar17) +
                              (int)((auVar271._8_8_ & 0xffffffff) * uVar127);
                    iVar511 = (int)((auVar792._8_8_ & 0xffffffff) * uVar127);
                    if ((-(iVar511 == iVar512) & bVar156) == 1) {
                      if (local_4d8.elempack == 1) {
                        for (iVar411 = 0; iVar411 + 1 < iVar261; iVar411 = iVar411 + 2) {
                          uVar163 = (long)(iVar177 + iVar411) % (long)iVar137;
                          iVar500 = iVar177 + iVar411 + 1;
                          uVar138 = (long)iVar500 % (long)iVar137;
                          uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          uVar138 = (ulong)(uint)((int)uVar138 >> 0x1f) << 0x20 |
                                    uVar138 & 0xffffffff;
                          uVar163 = *(ulong *)((long)local_4d8.data +
                                              (long)((int)((long)uVar163 % (long)iVar135) *
                                                     auVar550._0_4_ +
                                                     ((iVar177 + iVar411) / iVar137) * iVar262 +
                                                     iVar410 +
                                                    (int)((long)uVar163 / (long)iVar135) * iVar406))
                          ;
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data +
                                     (long)((int)((long)uVar138 % (long)iVar135) * auVar550._0_4_ +
                                            (iVar500 / iVar137) * iVar262 + iVar410 +
                                           (int)((long)uVar138 / (long)iVar135) * iVar406));
                          auVar279._8_6_ = 0;
                          auVar279._0_8_ = uVar163;
                          auVar279[0xe] = (char)(uVar163 >> 0x38);
                          auVar279[0xf] = (char)((ulong)uVar184 >> 0x38);
                          auVar278._14_2_ = auVar279._14_2_;
                          auVar278._8_5_ = 0;
                          auVar278._0_8_ = uVar163;
                          auVar278[0xd] = (char)((ulong)uVar184 >> 0x30);
                          auVar277._13_3_ = auVar278._13_3_;
                          auVar277._8_4_ = 0;
                          auVar277._0_8_ = uVar163;
                          auVar277[0xc] = (char)(uVar163 >> 0x30);
                          auVar276._12_4_ = auVar277._12_4_;
                          auVar276._8_3_ = 0;
                          auVar276._0_8_ = uVar163;
                          auVar276[0xb] = (char)((ulong)uVar184 >> 0x28);
                          auVar275._11_5_ = auVar276._11_5_;
                          auVar275._8_2_ = 0;
                          auVar275._0_8_ = uVar163;
                          auVar275[10] = (char)(uVar163 >> 0x28);
                          auVar274._10_6_ = auVar275._10_6_;
                          auVar274[8] = 0;
                          auVar274._0_8_ = uVar163;
                          auVar274[9] = (char)((ulong)uVar184 >> 0x20);
                          auVar273._9_7_ = auVar274._9_7_;
                          auVar273[8] = (char)(uVar163 >> 0x20);
                          auVar273._0_8_ = uVar163;
                          auVar272._8_8_ = auVar273._8_8_;
                          auVar272[7] = (char)((ulong)uVar184 >> 0x18);
                          auVar272[6] = (char)(uVar163 >> 0x18);
                          auVar272[5] = (char)((ulong)uVar184 >> 0x10);
                          auVar272[4] = (char)(uVar163 >> 0x10);
                          auVar272[3] = (char)((ulong)uVar184 >> 8);
                          auVar272[2] = (char)(uVar163 >> 8);
                          auVar272[0] = (undefined1)uVar163;
                          auVar272[1] = (char)uVar184;
                          *pauVar157 = auVar272;
                          pauVar157 = pauVar157 + 1;
                        }
                        for (; iVar411 < iVar261; iVar411 = iVar411 + 1) {
                          uVar163 = (long)(iVar177 + iVar411) % (long)iVar137;
                          uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          *(undefined8 *)*pauVar157 =
                               *(undefined8 *)
                                ((long)local_4d8.data +
                                (long)((int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                       ((iVar177 + iVar411) / iVar137) * iVar262 + iVar410 +
                                      (int)((long)uVar163 / (long)iVar135) * iVar406));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        }
                      }
                      uVar163 = uVar178;
                      iVar411 = iVar264;
                      if (local_4d8.elempack == 8) {
                        while (iVar411 != 0) {
                          iVar500 = (int)uVar163;
                          uVar163 = (ulong)(uint)((int)((long)iVar500 % (long)iVar137) >> 0x1f) <<
                                    0x20 | (long)iVar500 % (long)iVar137 & 0xffffffffU;
                          lVar125 = (long)((int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                           (iVar500 / iVar137) * iVar262 + iVar410 +
                                          (int)((long)uVar163 / (long)iVar135) * iVar406);
                          auVar300 = *(undefined1 (*) [16])((long)local_4d8.data + lVar125 * 8);
                          puVar118 = (undefined2 *)((long)local_4d8.data + lVar125 * 8 + 0x10);
                          uVar39 = puVar118[2];
                          uVar47 = puVar118[3];
                          uVar48 = puVar118[6];
                          uVar49 = puVar118[7];
                          auVar600 = *(undefined1 (*) [16])
                                      ((long)local_4d8.data + lVar125 * 8 + 0x20);
                          puVar6 = (undefined2 *)((long)local_4d8.data + lVar125 * 8 + 0x30);
                          auVar731._0_12_ = auVar300._0_12_;
                          auVar731._12_2_ = auVar300._6_2_;
                          auVar731._14_2_ = uVar47;
                          auVar730._12_4_ = auVar731._12_4_;
                          auVar730._0_10_ = auVar300._0_10_;
                          auVar730._10_2_ = uVar39;
                          auVar729._10_6_ = auVar730._10_6_;
                          auVar729._0_8_ = auVar300._0_8_;
                          auVar729._8_2_ = auVar300._4_2_;
                          auVar80._2_8_ = auVar729._8_8_;
                          auVar80._0_2_ = puVar118[1];
                          auVar80._10_6_ = 0;
                          auVar728._12_4_ = 0;
                          auVar728._0_12_ = SUB1612(auVar80 << 0x30,4);
                          auVar728 = auVar728 << 0x20;
                          auVar417._0_12_ = auVar600._0_12_;
                          auVar417._12_2_ = auVar600._6_2_;
                          auVar417._14_2_ = puVar6[3];
                          auVar416._12_4_ = auVar417._12_4_;
                          auVar416._0_10_ = auVar600._0_10_;
                          auVar416._10_2_ = puVar6[2];
                          auVar415._10_6_ = auVar416._10_6_;
                          auVar415._0_8_ = auVar600._0_8_;
                          auVar415._8_2_ = auVar600._4_2_;
                          auVar81._2_8_ = auVar415._8_8_;
                          auVar81._0_2_ = puVar6[1];
                          auVar81._10_6_ = 0;
                          auVar414._12_4_ = 0;
                          auVar414._0_12_ = SUB1612(auVar81 << 0x30,4);
                          auVar414 = auVar414 << 0x20;
                          auVar695._0_12_ = auVar728._0_12_;
                          auVar695._12_2_ = puVar118[1];
                          auVar695._14_2_ = puVar118[5];
                          auVar694._12_4_ = auVar695._12_4_;
                          auVar694._0_10_ = auVar728._0_10_;
                          auVar694._10_2_ = auVar300._10_2_;
                          auVar693._10_6_ = auVar694._10_6_;
                          auVar693._0_8_ = auVar728._0_8_;
                          auVar693._8_2_ = auVar300._2_2_;
                          auVar692._8_8_ = auVar693._8_8_;
                          auVar692._6_2_ = puVar118[4];
                          auVar692._4_2_ = *puVar118;
                          auVar692._2_2_ = auVar300._8_2_;
                          auVar692._0_2_ = auVar300._0_2_;
                          auVar754._0_12_ = auVar414._0_12_;
                          auVar754._12_2_ = puVar6[1];
                          auVar754._14_2_ = puVar6[5];
                          auVar753._12_4_ = auVar754._12_4_;
                          auVar753._0_10_ = auVar414._0_10_;
                          auVar753._10_2_ = auVar600._10_2_;
                          auVar752._10_6_ = auVar753._10_6_;
                          auVar752._0_8_ = auVar414._0_8_;
                          auVar752._8_2_ = auVar600._2_2_;
                          auVar751._8_8_ = auVar752._8_8_;
                          auVar751._6_2_ = puVar6[4];
                          auVar751._4_2_ = *puVar6;
                          auVar751._2_2_ = auVar600._8_2_;
                          auVar751._0_2_ = auVar600._0_2_;
                          auVar418._0_8_ =
                               CONCAT26(puVar6[6],
                                        CONCAT24(puVar6[2],CONCAT22(auVar600._12_2_,auVar600._4_2_))
                                       );
                          auVar418._8_2_ = auVar600._6_2_;
                          auVar418._10_2_ = auVar600._14_2_;
                          auVar418._12_2_ = puVar6[3];
                          auVar418._14_2_ = puVar6[7];
                          auVar281._0_8_ = auVar692._0_8_;
                          auVar281._8_8_ = auVar751._0_8_;
                          auVar696._8_8_ = auVar751._8_8_;
                          auVar696._0_8_ = auVar692._8_8_;
                          *pauVar157 = auVar281;
                          pauVar157[1] = auVar696;
                          *(short *)pauVar157[2] = auVar300._4_2_;
                          *(short *)(pauVar157[2] + 2) = auVar300._12_2_;
                          *(undefined2 *)(pauVar157[2] + 4) = uVar39;
                          *(undefined2 *)(pauVar157[2] + 6) = uVar48;
                          *(undefined8 *)(pauVar157[2] + 8) = auVar418._0_8_;
                          *(short *)(pauVar157[3] + 8) = auVar300._6_2_;
                          *(short *)(pauVar157[3] + 10) = auVar300._14_2_;
                          *(undefined2 *)(pauVar157[3] + 0xc) = uVar47;
                          *(undefined2 *)(pauVar157[3] + 0xe) = uVar49;
                          *(long *)(pauVar157[3] + 8) = auVar418._8_8_;
                          pauVar157 = pauVar157 + 4;
                          uVar163 = (ulong)(iVar500 + 1);
                          iVar411 = iVar411 + -1;
                        }
                      }
                    }
                    else {
                      auVar691._0_4_ = auVar690._0_4_ - auVar727._0_4_ * uVar165;
                      auVar691._4_4_ = auVar690._4_4_ - auVar727._4_4_ * uVar165;
                      auVar691._8_4_ =
                           auVar690._8_4_ - (int)((auVar727._8_8_ & 0xffffffff) * (ulong)uVar165);
                      auVar691._12_4_ =
                           auVar690._12_4_ - (int)((auVar413._8_8_ & 0xffffffff) * (ulong)uVar165);
                      auVar280._4_4_ = auVar691._4_4_;
                      auVar280._0_4_ = auVar691._4_4_;
                      auVar280._8_4_ = auVar691._12_4_;
                      auVar280._12_4_ = auVar691._12_4_;
                      iVar512 = (int)(((ulong)auVar727._0_4_ * (ulong)(uint)local_458 & 0xffffffff)
                                     * uVar127) + auVar691._0_4_ * uVar17;
                      iVar544 = (int)(((ulong)auVar727._4_4_ * (ulong)(uint)local_458 & 0xffffffff)
                                     * uVar127) + auVar691._4_4_ * uVar17;
                      iVar591 = (int)(((auVar727._8_8_ & 0xffffffff) * (ulong)uStack_450 &
                                      0xffffffff) * uVar127) +
                                (int)((auVar691._8_8_ & 0xffffffff) * (ulong)(uint)uVar17);
                      iVar511 = iVar511 + (int)((auVar280._8_8_ & 0xffffffff) * (ulong)(uint)uVar17)
                      ;
                      if (local_4d8.elempack == 1) {
                        for (iVar593 = 0; iVar593 + 1 < iVar261; iVar593 = iVar593 + 2) {
                          uVar163 = (long)(iVar177 + iVar593) % (long)iVar137;
                          iVar595 = iVar177 + iVar593 + 1;
                          uVar138 = (long)iVar595 % (long)iVar137;
                          uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          uVar138 = (ulong)(uint)((int)uVar138 >> 0x1f) << 0x20 |
                                    uVar138 & 0xffffffff;
                          iVar597 = (int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar593) / iVar137) * iVar262 +
                                    (int)((long)uVar163 / (long)iVar135) * iVar406;
                          iVar595 = (int)((long)uVar138 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar595 / iVar137) * iVar262 +
                                    (int)((long)uVar138 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar410));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar410));
                          (*pauVar157)[2] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar411));
                          (*pauVar157)[3] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar411));
                          (*pauVar157)[4] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar500));
                          (*pauVar157)[5] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar500));
                          (*pauVar157)[6] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar510));
                          (*pauVar157)[7] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar510));
                          (*pauVar157)[8] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar512));
                          (*pauVar157)[9] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar512));
                          (*pauVar157)[10] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar544));
                          (*pauVar157)[0xb] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar544));
                          (*pauVar157)[0xc] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar591));
                          (*pauVar157)[0xd] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar591));
                          (*pauVar157)[0xe] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar597 + iVar511));
                          (*pauVar157)[0xf] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar511));
                          pauVar157 = pauVar157 + 1;
                        }
                        for (; iVar593 < iVar261; iVar593 = iVar593 + 1) {
                          uVar163 = (long)(iVar177 + iVar593) % (long)iVar137;
                          uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          iVar595 = (int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar593) / iVar137) * iVar262 +
                                    (int)((long)uVar163 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar410));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar411));
                          (*pauVar157)[2] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar500));
                          (*pauVar157)[3] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar510));
                          (*pauVar157)[4] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar512));
                          (*pauVar157)[5] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar544));
                          (*pauVar157)[6] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar591));
                          (*pauVar157)[7] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar595 + iVar511));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        }
                      }
                      uVar163 = uVar178;
                      iVar593 = iVar264;
                      if (local_4d8.elempack == 8) {
                        while (iVar593 != 0) {
                          iVar597 = (int)uVar163;
                          uVar163 = (ulong)(uint)((int)((long)iVar597 % (long)iVar137) >> 0x1f) <<
                                    0x20 | (long)iVar597 % (long)iVar137 & 0xffffffffU;
                          iVar595 = (int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar597 / iVar137) * iVar262 +
                                    (int)((long)uVar163 / (long)iVar135) * iVar406;
                          auVar282._0_4_ = iVar595 + iVar410;
                          auVar282._4_4_ = iVar595 + iVar411;
                          auVar282._8_4_ = iVar595 + iVar500;
                          auVar282._12_4_ = iVar595 + iVar510;
                          auVar755._0_4_ = iVar595 + iVar512;
                          auVar755._4_4_ = iVar595 + iVar544;
                          auVar755._8_4_ = iVar595 + iVar591;
                          auVar755._12_4_ = iVar595 + iVar511;
                          auVar419._4_4_ = auVar282._0_4_;
                          auVar419._0_4_ = auVar282._4_4_;
                          auVar419._8_4_ = auVar282._12_4_;
                          auVar419._12_4_ = auVar282._8_4_;
                          auVar777._4_4_ = auVar755._0_4_;
                          auVar777._0_4_ = auVar755._4_4_;
                          auVar777._8_4_ = auVar755._12_4_;
                          auVar777._12_4_ = auVar755._8_4_;
                          uVar163 = *(ulong *)((long)local_4d8.data + (long)(auVar282._0_4_ * 8));
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(auVar282._4_4_ * 8));
                          auVar735._8_4_ = 0;
                          auVar735._0_8_ = uVar163;
                          auVar735._12_2_ = (short)(uVar163 >> 0x30);
                          auVar735._14_2_ = (short)((ulong)uVar184 >> 0x30);
                          auVar734._12_4_ = auVar735._12_4_;
                          auVar734._8_2_ = 0;
                          auVar734._0_8_ = uVar163;
                          auVar734._10_2_ = (short)((ulong)uVar184 >> 0x20);
                          auVar733._10_6_ = auVar734._10_6_;
                          auVar733._8_2_ = (short)(uVar163 >> 0x20);
                          auVar733._0_8_ = uVar163;
                          auVar82._4_8_ = auVar733._8_8_;
                          auVar82._2_2_ = (short)((ulong)uVar184 >> 0x10);
                          auVar82._0_2_ = (short)(uVar163 >> 0x10);
                          auVar732._0_4_ = CONCAT22((short)uVar184,(short)uVar163);
                          auVar732._4_12_ = auVar82;
                          uVar163 = *(ulong *)((long)local_4d8.data +
                                              (long)(int)(auVar282._8_8_ << 3));
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(int)(auVar419._8_8_ << 3));
                          auVar285._8_4_ = 0;
                          auVar285._0_8_ = uVar163;
                          auVar285._12_2_ = (short)(uVar163 >> 0x30);
                          auVar285._14_2_ = (short)((ulong)uVar184 >> 0x30);
                          auVar284._12_4_ = auVar285._12_4_;
                          auVar284._8_2_ = 0;
                          auVar284._0_8_ = uVar163;
                          auVar284._10_2_ = (short)((ulong)uVar184 >> 0x20);
                          auVar283._10_6_ = auVar284._10_6_;
                          auVar283._8_2_ = (short)(uVar163 >> 0x20);
                          auVar283._0_8_ = uVar163;
                          auVar83._4_8_ = auVar283._8_8_;
                          auVar83._2_2_ = (short)((ulong)uVar184 >> 0x10);
                          auVar83._0_2_ = (short)(uVar163 >> 0x10);
                          uVar138 = *(ulong *)((long)local_4d8.data + (long)(auVar755._0_4_ * 8));
                          uVar513 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(auVar755._4_4_ * 8));
                          auVar423._8_4_ = 0;
                          auVar423._0_8_ = uVar138;
                          auVar423._12_2_ = (short)(uVar138 >> 0x30);
                          auVar423._14_2_ = (short)((ulong)uVar513 >> 0x30);
                          auVar422._12_4_ = auVar423._12_4_;
                          auVar422._8_2_ = 0;
                          auVar422._0_8_ = uVar138;
                          auVar422._10_2_ = (short)((ulong)uVar513 >> 0x20);
                          auVar421._10_6_ = auVar422._10_6_;
                          auVar421._8_2_ = (short)(uVar138 >> 0x20);
                          auVar421._0_8_ = uVar138;
                          auVar84._4_8_ = auVar421._8_8_;
                          auVar84._2_2_ = (short)((ulong)uVar513 >> 0x10);
                          auVar84._0_2_ = (short)(uVar138 >> 0x10);
                          auVar420._0_4_ = CONCAT22((short)uVar513,(short)uVar138);
                          auVar420._4_12_ = auVar84;
                          uVar138 = *(ulong *)((long)local_4d8.data +
                                              (long)(int)(auVar755._8_8_ << 3));
                          uVar513 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(int)(auVar777._8_8_ << 3));
                          auVar758._8_4_ = 0;
                          auVar758._0_8_ = uVar138;
                          auVar758._12_2_ = (short)(uVar138 >> 0x30);
                          auVar758._14_2_ = (short)((ulong)uVar513 >> 0x30);
                          auVar757._12_4_ = auVar758._12_4_;
                          auVar757._8_2_ = 0;
                          auVar757._0_8_ = uVar138;
                          auVar757._10_2_ = (short)((ulong)uVar513 >> 0x20);
                          auVar756._10_6_ = auVar757._10_6_;
                          auVar756._8_2_ = (short)(uVar138 >> 0x20);
                          auVar756._0_8_ = uVar138;
                          auVar85._4_8_ = auVar756._8_8_;
                          auVar85._2_2_ = (short)((ulong)uVar513 >> 0x10);
                          auVar85._0_2_ = (short)(uVar138 >> 0x10);
                          auVar778._0_8_ = auVar732._0_8_;
                          auVar778._8_4_ = auVar82._0_4_;
                          auVar778._12_4_ = auVar83._0_4_;
                          auVar736._0_8_ = CONCAT44(auVar283._8_4_,auVar733._8_4_);
                          auVar736._8_4_ = auVar734._12_4_;
                          auVar736._12_4_ = auVar284._12_4_;
                          auVar286._0_8_ = auVar420._0_8_;
                          auVar286._8_4_ = auVar84._0_4_;
                          auVar286._12_4_ = auVar85._0_4_;
                          auVar424._0_8_ = CONCAT44(auVar756._8_4_,auVar421._8_4_);
                          auVar424._8_4_ = auVar422._12_4_;
                          auVar424._12_4_ = auVar757._12_4_;
                          auVar287._8_8_ = auVar424._0_8_;
                          auVar287._0_8_ = auVar736._0_8_;
                          *(ulong *)*pauVar157 =
                               CONCAT44(CONCAT22((short)uVar184,(short)uVar163),auVar732._0_4_);
                          *(ulong *)(*pauVar157 + 8) =
                               CONCAT44(CONCAT22((short)uVar513,(short)uVar138),auVar420._0_4_);
                          *(long *)pauVar157[1] = auVar778._8_8_;
                          *(long *)(pauVar157[1] + 8) = auVar286._8_8_;
                          pauVar157[2] = auVar287;
                          *(long *)pauVar157[3] = auVar736._8_8_;
                          *(long *)(pauVar157[3] + 8) = auVar424._8_8_;
                          pauVar157 = pauVar157 + 4;
                          uVar163 = (ulong)(iVar597 + 1);
                          iVar593 = iVar593 + -1;
                        }
                      }
                    }
                    uVar145 = uVar145 + 8;
                  }
                  for (; (int)(uVar145 | 3) < iVar160; uVar145 = uVar145 + 4) {
                    iVar410 = uVar159 + uVar145;
                    auVar739._0_4_ = iVar410 + auVar528._0_4_;
                    auVar739._4_4_ = iVar410 + auVar528._4_4_;
                    auVar739._8_4_ = iVar410 + auVar528._8_4_;
                    auVar739._12_4_ = iVar410 + auVar528._12_4_;
                    auVar425._0_8_ = (ulong)auVar739._0_4_ * (ulong)uVar116 >> 0x20;
                    auVar425._8_8_ = (auVar739._8_8_ & 0xffffffff) * (ulong)uVar116 >> 0x20;
                    auVar704._0_8_ = (ulong)auVar739._4_4_ * (ulong)uVar116;
                    auVar704._8_8_ = (auVar739._8_8_ >> 0x20) * (ulong)uVar116;
                    auVar425 = auVar704 & _DAT_00537fe0 | auVar425;
                    auVar661._0_4_ =
                         (auVar739._0_4_ - auVar425._0_4_ >> uVar138) + auVar425._0_4_ >> uVar163;
                    auVar661._4_4_ =
                         (auVar739._4_4_ - auVar425._4_4_ >> uVar138) + auVar425._4_4_ >> uVar163;
                    auVar661._8_4_ =
                         ((uint)(auVar739._8_4_ - auVar425._8_4_) >> uVar138) + auVar425._8_4_ >>
                         uVar163;
                    auVar661._12_4_ =
                         ((uint)(auVar739._12_4_ - auVar425._12_4_) >> uVar138) + auVar425._12_4_ >>
                         uVar163;
                    auVar802._4_4_ = auVar661._4_4_;
                    auVar802._0_4_ = auVar661._4_4_;
                    auVar802._8_4_ = auVar661._12_4_;
                    auVar802._12_4_ = auVar661._12_4_;
                    auVar741._0_4_ = auVar739._0_4_ - auVar661._0_4_ * uVar165;
                    auVar741._4_4_ = auVar739._4_4_ - auVar661._4_4_ * uVar165;
                    auVar741._8_4_ =
                         auVar739._8_4_ - (int)((auVar661._8_8_ & 0xffffffff) * (ulong)uVar165);
                    auVar741._12_4_ =
                         auVar739._12_4_ - (int)((auVar802._8_8_ & 0xffffffff) * (ulong)uVar165);
                    auVar804._0_4_ = (undefined4)((ulong)auVar661._4_4_ * (ulong)(uint)local_458);
                    auVar804._8_4_ = (undefined4)((auVar802._8_8_ & 0xffffffff) * (ulong)uStack_450)
                    ;
                    auVar686._4_4_ = auVar741._4_4_;
                    auVar686._0_4_ = auVar741._4_4_;
                    auVar686._8_4_ = auVar741._12_4_;
                    auVar686._12_4_ = auVar741._12_4_;
                    auVar804._4_4_ = auVar804._0_4_;
                    auVar804._12_4_ = auVar804._8_4_;
                    iVar410 = (int)(((ulong)auVar661._0_4_ * (ulong)(uint)local_458 & 0xffffffff) *
                                   uVar127);
                    iVar512 = (int)((auVar804._8_8_ & 0xffffffff) * uVar127);
                    iVar411 = auVar741._0_4_ * uVar17 + iVar410;
                    iVar500 = auVar741._4_4_ * uVar17 +
                              (int)(((ulong)auVar661._4_4_ * (ulong)(uint)local_458 & 0xffffffff) *
                                   uVar127);
                    iVar510 = (int)((auVar741._8_8_ & 0xffffffff) * (ulong)(uint)uVar17) +
                              (int)(((auVar661._8_8_ & 0xffffffff) * (ulong)uStack_450 & 0xffffffff)
                                   * uVar127);
                    iVar511 = (int)((auVar686._8_8_ & 0xffffffff) * (ulong)(uint)uVar17) + iVar512;
                    if ((-(iVar512 == iVar410) & bVar156) == 1) {
                      if (local_4d8.elempack == 1) {
                        for (iVar410 = 0; iVar410 + 1 < iVar261; iVar410 = iVar410 + 2) {
                          uVar172 = (long)(iVar177 + iVar410) % (long)iVar137;
                          iVar500 = iVar177 + iVar410 + 1;
                          uVar140 = (long)iVar500 % (long)iVar137;
                          uVar172 = (ulong)(uint)((int)uVar172 >> 0x1f) << 0x20 |
                                    uVar172 & 0xffffffff;
                          uVar140 = (ulong)(uint)((int)uVar140 >> 0x1f) << 0x20 |
                                    uVar140 & 0xffffffff;
                          uVar172 = *(ulong *)((long)local_4d8.data +
                                              (long)((int)((long)uVar172 % (long)iVar135) *
                                                     auVar550._0_4_ +
                                                     ((iVar177 + iVar410) / iVar137) * iVar262 +
                                                     iVar411 +
                                                    (int)((long)uVar172 / (long)iVar135) * iVar406))
                          ;
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data +
                                     (long)((int)((long)uVar140 % (long)iVar135) * auVar550._0_4_ +
                                            (iVar500 / iVar137) * iVar262 + iVar411 +
                                           (int)((long)uVar140 / (long)iVar135) * iVar406));
                          auVar295._8_6_ = 0;
                          auVar295._0_8_ = uVar172;
                          auVar295[0xe] = (char)(uVar172 >> 0x38);
                          auVar295[0xf] = (char)((ulong)uVar184 >> 0x38);
                          auVar294._14_2_ = auVar295._14_2_;
                          auVar294._8_5_ = 0;
                          auVar294._0_8_ = uVar172;
                          auVar294[0xd] = (char)((ulong)uVar184 >> 0x30);
                          auVar293._13_3_ = auVar294._13_3_;
                          auVar293._8_4_ = 0;
                          auVar293._0_8_ = uVar172;
                          auVar293[0xc] = (char)(uVar172 >> 0x30);
                          auVar292._12_4_ = auVar293._12_4_;
                          auVar292._8_3_ = 0;
                          auVar292._0_8_ = uVar172;
                          auVar292[0xb] = (char)((ulong)uVar184 >> 0x28);
                          auVar291._11_5_ = auVar292._11_5_;
                          auVar291._8_2_ = 0;
                          auVar291._0_8_ = uVar172;
                          auVar291[10] = (char)(uVar172 >> 0x28);
                          auVar290._10_6_ = auVar291._10_6_;
                          auVar290[8] = 0;
                          auVar290._0_8_ = uVar172;
                          auVar290[9] = (char)((ulong)uVar184 >> 0x20);
                          auVar289._9_7_ = auVar290._9_7_;
                          auVar289[8] = (char)(uVar172 >> 0x20);
                          auVar289._0_8_ = uVar172;
                          auVar288._8_8_ = auVar289._8_8_;
                          auVar288[7] = (char)((ulong)uVar184 >> 0x18);
                          auVar288[6] = (char)(uVar172 >> 0x18);
                          auVar288[5] = (char)((ulong)uVar184 >> 0x10);
                          auVar288[4] = (char)(uVar172 >> 0x10);
                          auVar288[3] = (char)((ulong)uVar184 >> 8);
                          auVar288[2] = (char)(uVar172 >> 8);
                          auVar288[0] = (undefined1)uVar172;
                          auVar288[1] = (char)uVar184;
                          *(long *)*pauVar157 = auVar288._0_8_;
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        }
                        for (; iVar410 < iVar261; iVar410 = iVar410 + 1) {
                          uVar172 = (long)(iVar177 + iVar410) % (long)iVar137;
                          uVar172 = (ulong)(uint)((int)uVar172 >> 0x1f) << 0x20 |
                                    uVar172 & 0xffffffff;
                          lVar125 = (long)((int)((long)uVar172 % (long)iVar135) * auVar550._0_4_ +
                                           ((iVar177 + iVar410) / iVar137) * iVar262 + iVar411 +
                                          (int)((long)uVar172 / (long)iVar135) * iVar406);
                          (*pauVar157)[0] = *(undefined1 *)((long)local_4d8.data + lVar125);
                          (*pauVar157)[1] = *(undefined1 *)((long)local_4d8.data + lVar125 + 1);
                          (*pauVar157)[2] = *(undefined1 *)((long)local_4d8.data + lVar125 + 2);
                          (*pauVar157)[3] = *(undefined1 *)((long)local_4d8.data + lVar125 + 3);
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        }
                      }
                      uVar172 = uVar178;
                      iVar410 = iVar264;
                      if (local_4d8.elempack == 8) {
                        while (iVar410 != 0) {
                          iVar500 = (int)uVar172;
                          uVar172 = (ulong)(uint)((int)((long)iVar500 % (long)iVar137) >> 0x1f) <<
                                    0x20 | (long)iVar500 % (long)iVar137 & 0xffffffffU;
                          lVar125 = (long)((int)((long)uVar172 % (long)iVar135) * auVar550._0_4_ +
                                           (iVar500 / iVar137) * iVar262 + iVar411 +
                                          (int)((long)uVar172 / (long)iVar135) * iVar406);
                          auVar300 = *(undefined1 (*) [16])((long)local_4d8.data + lVar125 * 8);
                          puVar118 = (undefined2 *)((long)local_4d8.data + lVar125 * 8 + 0x10);
                          uVar39 = puVar118[2];
                          uVar47 = puVar118[3];
                          uVar48 = puVar118[6];
                          uVar49 = puVar118[7];
                          auVar684._0_12_ = auVar300._0_12_;
                          auVar684._12_2_ = auVar300._6_2_;
                          auVar684._14_2_ = uVar47;
                          auVar683._12_4_ = auVar684._12_4_;
                          auVar683._0_10_ = auVar300._0_10_;
                          auVar683._10_2_ = uVar39;
                          auVar682._10_6_ = auVar683._10_6_;
                          auVar682._0_8_ = auVar300._0_8_;
                          auVar682._8_2_ = auVar300._4_2_;
                          auVar88._2_8_ = auVar682._8_8_;
                          auVar88._0_2_ = puVar118[1];
                          auVar88._10_6_ = 0;
                          auVar681._12_4_ = 0;
                          auVar681._0_12_ = SUB1612(auVar88 << 0x30,4);
                          auVar681 = auVar681 << 0x20;
                          auVar432._0_12_ = auVar681._0_12_;
                          auVar432._12_2_ = puVar118[1];
                          auVar432._14_2_ = puVar118[5];
                          auVar431._12_4_ = auVar432._12_4_;
                          auVar431._0_10_ = auVar681._0_10_;
                          auVar431._10_2_ = auVar300._10_2_;
                          auVar430._10_6_ = auVar431._10_6_;
                          auVar430._0_8_ = auVar681._0_8_;
                          auVar430._8_2_ = auVar300._2_2_;
                          auVar429._8_8_ = auVar430._8_8_;
                          auVar429._6_2_ = puVar118[4];
                          auVar429._4_2_ = *puVar118;
                          auVar429._2_2_ = auVar300._8_2_;
                          auVar429._0_2_ = auVar300._0_2_;
                          *pauVar157 = auVar429;
                          *(short *)pauVar157[1] = auVar300._4_2_;
                          *(short *)(pauVar157[1] + 2) = auVar300._12_2_;
                          *(undefined2 *)(pauVar157[1] + 4) = uVar39;
                          *(undefined2 *)(pauVar157[1] + 6) = uVar48;
                          *(short *)(pauVar157[1] + 8) = auVar300._6_2_;
                          *(short *)(pauVar157[1] + 10) = auVar300._14_2_;
                          *(undefined2 *)(pauVar157[1] + 0xc) = uVar47;
                          *(undefined2 *)(pauVar157[1] + 0xe) = uVar49;
                          pauVar157 = pauVar157 + 2;
                          uVar172 = (ulong)(iVar500 + 1);
                          iVar410 = iVar410 + -1;
                        }
                      }
                    }
                    else {
                      if (local_4d8.elempack == 1) {
                        for (iVar410 = 0; iVar410 + 1 < iVar261; iVar410 = iVar410 + 2) {
                          uVar172 = (long)(iVar177 + iVar410) % (long)iVar137;
                          iVar512 = iVar177 + iVar410 + 1;
                          uVar140 = (long)iVar512 % (long)iVar137;
                          uVar172 = (ulong)(uint)((int)uVar172 >> 0x1f) << 0x20 |
                                    uVar172 & 0xffffffff;
                          uVar140 = (ulong)(uint)((int)uVar140 >> 0x1f) << 0x20 |
                                    uVar140 & 0xffffffff;
                          iVar544 = (int)((long)uVar172 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar410) / iVar137) * iVar262 +
                                    (int)((long)uVar172 / (long)iVar135) * iVar406;
                          iVar512 = (int)((long)uVar140 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar512 / iVar137) * iVar262 +
                                    (int)((long)uVar140 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar544 + iVar411));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar411));
                          (*pauVar157)[2] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar544 + iVar500));
                          (*pauVar157)[3] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar500));
                          (*pauVar157)[4] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar544 + iVar510));
                          (*pauVar157)[5] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar510));
                          (*pauVar157)[6] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar544 + iVar511));
                          (*pauVar157)[7] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar511));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        }
                        for (; iVar410 < iVar261; iVar410 = iVar410 + 1) {
                          uVar172 = (long)(iVar177 + iVar410) % (long)iVar137;
                          uVar172 = (ulong)(uint)((int)uVar172 >> 0x1f) << 0x20 |
                                    uVar172 & 0xffffffff;
                          iVar512 = (int)((long)uVar172 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar410) / iVar137) * iVar262 +
                                    (int)((long)uVar172 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar411));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar500));
                          (*pauVar157)[2] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar510));
                          (*pauVar157)[3] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar512 + iVar511));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        }
                      }
                      uVar172 = uVar178;
                      iVar410 = iVar264;
                      if (local_4d8.elempack == 8) {
                        while (iVar410 != 0) {
                          iVar544 = (int)uVar172;
                          uVar172 = (ulong)(uint)((int)((long)iVar544 % (long)iVar137) >> 0x1f) <<
                                    0x20 | (long)iVar544 % (long)iVar137 & 0xffffffffU;
                          iVar512 = (int)((long)uVar172 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar544 / iVar137) * iVar262 +
                                    (int)((long)uVar172 / (long)iVar135) * iVar406;
                          auVar808._0_4_ = iVar512 + iVar411;
                          auVar808._4_4_ = iVar512 + iVar500;
                          auVar808._8_4_ = iVar512 + iVar510;
                          auVar808._12_4_ = iVar512 + iVar511;
                          auVar426._4_4_ = auVar808._0_4_;
                          auVar426._0_4_ = auVar808._4_4_;
                          auVar426._8_4_ = auVar808._12_4_;
                          auVar426._12_4_ = auVar808._8_4_;
                          uVar172 = *(ulong *)((long)local_4d8.data + (long)(auVar808._0_4_ * 8));
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(auVar808._4_4_ * 8));
                          auVar700._8_4_ = 0;
                          auVar700._0_8_ = uVar172;
                          auVar700._12_2_ = (short)(uVar172 >> 0x30);
                          auVar700._14_2_ = (short)((ulong)uVar184 >> 0x30);
                          auVar699._12_4_ = auVar700._12_4_;
                          auVar699._8_2_ = 0;
                          auVar699._0_8_ = uVar172;
                          auVar699._10_2_ = (short)((ulong)uVar184 >> 0x20);
                          auVar698._10_6_ = auVar699._10_6_;
                          auVar698._8_2_ = (short)(uVar172 >> 0x20);
                          auVar698._0_8_ = uVar172;
                          auVar86._4_8_ = auVar698._8_8_;
                          auVar86._2_2_ = (short)((ulong)uVar184 >> 0x10);
                          auVar86._0_2_ = (short)(uVar172 >> 0x10);
                          auVar697._0_4_ = CONCAT22((short)uVar184,(short)uVar172);
                          auVar697._4_12_ = auVar86;
                          uVar172 = *(ulong *)((long)local_4d8.data +
                                              (long)(int)(auVar808._8_8_ << 3));
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(int)(auVar426._8_8_ << 3));
                          auVar298._8_4_ = 0;
                          auVar298._0_8_ = uVar172;
                          auVar298._12_2_ = (short)(uVar172 >> 0x30);
                          auVar298._14_2_ = (short)((ulong)uVar184 >> 0x30);
                          auVar297._12_4_ = auVar298._12_4_;
                          auVar297._8_2_ = 0;
                          auVar297._0_8_ = uVar172;
                          auVar297._10_2_ = (short)((ulong)uVar184 >> 0x20);
                          auVar296._10_6_ = auVar297._10_6_;
                          auVar296._8_2_ = (short)(uVar172 >> 0x20);
                          auVar296._0_8_ = uVar172;
                          auVar87._4_8_ = auVar296._8_8_;
                          auVar87._2_2_ = (short)((ulong)uVar184 >> 0x10);
                          auVar87._0_2_ = (short)(uVar172 >> 0x10);
                          auVar427._6_2_ = (short)uVar184;
                          auVar427._4_2_ = (short)uVar172;
                          auVar428._0_8_ = auVar697._0_8_;
                          auVar428._8_4_ = auVar86._0_4_;
                          auVar428._12_4_ = auVar87._0_4_;
                          auVar427._8_8_ = auVar428._8_8_;
                          auVar427._0_4_ = auVar697._0_4_;
                          auVar701._4_4_ = auVar296._8_4_;
                          auVar701._0_4_ = auVar698._8_4_;
                          auVar701._8_4_ = auVar699._12_4_;
                          auVar701._12_4_ = auVar297._12_4_;
                          *pauVar157 = auVar427;
                          pauVar157[1] = auVar701;
                          pauVar157 = pauVar157 + 2;
                          uVar172 = (ulong)(iVar544 + 1);
                          iVar410 = iVar410 + -1;
                        }
                      }
                    }
                  }
                  local_4e8._0_4_ = local_4d8.w * (uint)local_458;
                  local_4e8._4_4_ = 0;
                  for (; (int)(uVar145 | 1) < iVar160; uVar145 = uVar145 + 2) {
                    iVar410 = uVar145 + uVar159 + 1;
                    iVar500 = ((int)(uVar145 + uVar159) / (int)uVar165) * local_4e8._0_4_;
                    iVar411 = (iVar410 / (int)uVar165) * local_4e8._0_4_;
                    iVar510 = ((int)(uVar145 + uVar159) % (int)uVar165) * uVar151 + iVar500;
                    if (bVar156 == 1 && iVar500 == iVar411) {
                      if (local_4d8.elempack == 1) {
                        for (iVar410 = 0; iVar410 + 1 < iVar261; iVar410 = iVar410 + 2) {
                          uVar127 = (long)(iVar177 + iVar410) % (long)iVar137;
                          iVar411 = iVar177 + iVar410 + 1;
                          uVar163 = (long)iVar411 % (long)iVar137;
                          uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 |
                                    uVar127 & 0xffffffff;
                          uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          lVar126 = (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                           ((iVar177 + iVar410) / iVar137) * iVar262 + iVar510 +
                                          (int)((long)uVar127 / (long)iVar135) * iVar406);
                          lVar125 = (long)((int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                           (iVar411 / iVar137) * iVar262 + iVar510 +
                                          (int)((long)uVar163 / (long)iVar135) * iVar406);
                          (*pauVar157)[0] = *(undefined1 *)((long)local_4d8.data + lVar126);
                          (*pauVar157)[1] = *(undefined1 *)((long)local_4d8.data + lVar125);
                          (*pauVar157)[2] = *(undefined1 *)((long)local_4d8.data + lVar126 + 1);
                          (*pauVar157)[3] = *(undefined1 *)((long)local_4d8.data + lVar125 + 1);
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        }
                        for (; iVar410 < iVar261; iVar410 = iVar410 + 1) {
                          uVar127 = (long)(iVar177 + iVar410) % (long)iVar137;
                          uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 |
                                    uVar127 & 0xffffffff;
                          lVar125 = (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                           ((iVar177 + iVar410) / iVar137) * iVar262 + iVar510 +
                                          (int)((long)uVar127 / (long)iVar135) * iVar406);
                          (*pauVar157)[0] = *(undefined1 *)((long)local_4d8.data + lVar125);
                          (*pauVar157)[1] = *(undefined1 *)((long)local_4d8.data + lVar125 + 1);
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 2);
                        }
                      }
                      uVar127 = uVar178;
                      iVar410 = iVar264;
                      if (local_4d8.elempack == 8) {
                        while (iVar410 != 0) {
                          iVar411 = (int)uVar127;
                          uVar127 = (ulong)(uint)((int)((long)iVar411 % (long)iVar137) >> 0x1f) <<
                                    0x20 | (long)iVar411 % (long)iVar137 & 0xffffffffU;
                          puVar173 = (undefined4 *)
                                     ((long)local_4d8.data +
                                     (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                            (iVar411 / iVar137) * iVar262 + iVar510 +
                                           (int)((long)uVar127 / (long)iVar135) * iVar406) * 8);
                          auVar299._4_4_ = puVar173[2];
                          auVar299._0_4_ = *puVar173;
                          auVar299._8_4_ = puVar173[1];
                          auVar299._12_4_ = puVar173[3];
                          auVar300 = pshuflw(auVar299,auVar299,0xd8);
                          auVar300 = pshufhw(auVar300,auVar300,0xd8);
                          *pauVar157 = auVar300;
                          pauVar157 = pauVar157 + 1;
                          uVar127 = (ulong)(iVar411 + 1);
                          iVar410 = iVar410 + -1;
                        }
                      }
                    }
                    else {
                      iVar411 = (iVar410 % (int)uVar165) * uVar151 + iVar411;
                      iVar410 = 0;
                      if (local_4d8.elempack == 1) {
                        for (iVar410 = 0; iVar410 + 1 < iVar261; iVar410 = iVar410 + 2) {
                          uVar127 = (long)(iVar177 + iVar410) % (long)iVar137;
                          iVar500 = iVar177 + iVar410 + 1;
                          uVar163 = (long)iVar500 % (long)iVar137;
                          uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 |
                                    uVar127 & 0xffffffff;
                          iVar511 = (int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar410) / iVar137) * iVar262 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406;
                          uVar127 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 |
                                    uVar163 & 0xffffffff;
                          iVar500 = (int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar500 / iVar137) * iVar262 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar511 + iVar510));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar500 + iVar510));
                          (*pauVar157)[2] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar511 + iVar411));
                          (*pauVar157)[3] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar500 + iVar411));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        }
                        for (; iVar410 < iVar261; iVar410 = iVar410 + 1) {
                          uVar127 = (long)(iVar177 + iVar410) % (long)iVar137;
                          uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 |
                                    uVar127 & 0xffffffff;
                          iVar500 = (int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                    ((iVar177 + iVar410) / iVar137) * iVar262 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406;
                          (*pauVar157)[0] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar500 + iVar510));
                          (*pauVar157)[1] =
                               *(undefined1 *)((long)local_4d8.data + (long)(iVar500 + iVar411));
                          pauVar157 = (undefined1 (*) [16])(*pauVar157 + 2);
                        }
                      }
                      if (local_4d8.elempack == 8) {
                        for (; iVar410 < iVar263; iVar410 = iVar410 + 1) {
                          iVar500 = (int)((long)iVar177 / 8) + iVar410;
                          uVar127 = (long)iVar500 % (long)iVar137;
                          uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 |
                                    uVar127 & 0xffffffff;
                          iVar500 = (int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                    (iVar500 / iVar137) * iVar262 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406;
                          uVar127 = *(ulong *)((long)local_4d8.data + (long)(iVar500 + iVar510) * 8)
                          ;
                          uVar184 = *(undefined8 *)
                                     ((long)local_4d8.data + (long)(iVar500 + iVar411) * 8);
                          auVar304._8_4_ = 0;
                          auVar304._0_8_ = uVar127;
                          auVar304._12_2_ = (short)(uVar127 >> 0x30);
                          auVar304._14_2_ = (short)((ulong)uVar184 >> 0x30);
                          auVar303._12_4_ = auVar304._12_4_;
                          auVar303._8_2_ = 0;
                          auVar303._0_8_ = uVar127;
                          auVar303._10_2_ = (short)((ulong)uVar184 >> 0x20);
                          auVar302._10_6_ = auVar303._10_6_;
                          auVar302._8_2_ = (short)(uVar127 >> 0x20);
                          auVar302._0_8_ = uVar127;
                          auVar301._8_8_ = auVar302._8_8_;
                          auVar301._6_2_ = (short)((ulong)uVar184 >> 0x10);
                          auVar301._4_2_ = (short)(uVar127 >> 0x10);
                          auVar301._0_2_ = (undefined2)uVar127;
                          auVar301._2_2_ = (short)uVar184;
                          *pauVar157 = auVar301;
                          pauVar157 = pauVar157 + 1;
                        }
                      }
                    }
                  }
                  for (; (int)uVar145 < iVar160; uVar145 = uVar145 + 1) {
                    iVar263 = ((int)(uVar145 + uVar159) / (int)uVar165) * local_4e8._0_4_ +
                              ((int)(uVar145 + uVar159) % (int)uVar165) * uVar151;
                    if (local_4d8.elempack == 1) {
                      for (lVar125 = 0; iVar410 = (int)lVar125, iVar410 + 1 < iVar261;
                          lVar125 = lVar125 + 2) {
                        uVar127 = (long)(iVar177 + iVar410) % (long)iVar137;
                        iVar411 = iVar177 + iVar410 + 1;
                        uVar163 = (long)iVar411 % (long)iVar137;
                        uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 | uVar127 & 0xffffffff
                        ;
                        uVar163 = (ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 | uVar163 & 0xffffffff
                        ;
                        (*pauVar157)[lVar125] =
                             *(undefined1 *)
                              ((long)local_4d8.data +
                              (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                     ((iVar177 + iVar410) / iVar137) * iVar262 + iVar263 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406));
                        (*pauVar157)[lVar125 + 1] =
                             *(undefined1 *)
                              ((long)local_4d8.data +
                              (long)((int)((long)uVar163 % (long)iVar135) * auVar550._0_4_ +
                                     (iVar411 / iVar137) * iVar262 + iVar263 +
                                    (int)((long)uVar163 / (long)iVar135) * iVar406));
                      }
                      for (; (int)lVar125 < iVar261; lVar125 = lVar125 + 1) {
                        iVar410 = iVar177 + (int)lVar125;
                        uVar127 = (long)iVar410 % (long)iVar137;
                        uVar127 = (ulong)(uint)((int)uVar127 >> 0x1f) << 0x20 | uVar127 & 0xffffffff
                        ;
                        (*pauVar157)[lVar125] =
                             *(undefined1 *)
                              ((long)local_4d8.data +
                              (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                     (iVar410 / iVar137) * iVar262 + iVar263 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406));
                      }
                      pauVar157 = (undefined1 (*) [16])(*pauVar157 + lVar125);
                    }
                    uVar127 = uVar178;
                    iVar410 = iVar264;
                    if (local_4d8.elempack == 8) {
                      while (iVar410 != 0) {
                        iVar411 = (int)uVar127;
                        uVar127 = (ulong)(uint)((int)((long)iVar411 % (long)iVar137) >> 0x1f) <<
                                  0x20 | (long)iVar411 % (long)iVar137 & 0xffffffffU;
                        *(undefined8 *)*pauVar157 =
                             *(undefined8 *)
                              ((long)local_4d8.data +
                              (long)((int)((long)uVar127 % (long)iVar135) * auVar550._0_4_ +
                                     (iVar411 / iVar137) * iVar262 + iVar263 +
                                    (int)((long)uVar127 / (long)iVar135) * iVar406) * 8);
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        uVar127 = (ulong)(iVar411 + 1);
                        iVar410 = iVar410 + -1;
                      }
                    }
                  }
                }
                else {
                  local_598 = (void *)(long)(iVar177 / 8);
                  iVar264 = iVar261 / 8;
                  lVar126 = (long)(iVar262 * 8);
                  lVar125 = (long)iVar177;
                  local_558._0_8_ = lVar125;
                  lVar142 = (long)iVar262;
                  lVar180 = (long)(iVar262 * 2);
                  if (iVar264 < 1) {
                    iVar264 = 0;
                  }
                  local_4e8._0_4_ = iVar264;
                  local_500 = (void *)(long)(int)uVar159;
                  lVar141 = (long)iVar160;
                  lVar130 = (long)local_500 + lVar142;
                  local_610 = (long)local_500 * 8 + 0x10;
                  local_518 = (int *)((long)(iVar262 + 3) + (long)local_500);
                  local_578._0_8_ = (long)(iVar262 + 2) + (long)local_500;
                  lVar123 = (long)(iVar262 + 1) + (long)local_500;
                  uVar127 = (long)local_500 * 8 + 8;
                  local_4f8 = (void *)CONCAT44(local_4f8._4_4_,local_4d8.elempack);
                  pvVar161 = local_500;
                  for (uVar178 = 0; (long)(uVar178 | 7) < lVar141; uVar178 = uVar178 + 8) {
                    if (local_4d8.elempack == 8) {
                      puVar118 = (undefined2 *)
                                 ((long)local_4d8.data +
                                 ((long)local_500 + uVar178) * 8 +
                                 local_4d8.cstep * (long)local_598 *
                                 CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize));
                      iVar160 = iVar264;
                      while (bVar181 = iVar160 != 0, iVar160 = iVar160 + -1, bVar181) {
                        uVar54 = puVar118[1];
                        uVar55 = puVar118[4];
                        uVar56 = puVar118[5];
                        uVar39 = puVar118[8];
                        uVar47 = puVar118[9];
                        uVar48 = puVar118[0xc];
                        uVar49 = puVar118[0xd];
                        uVar57 = puVar118[0x10];
                        uVar58 = puVar118[0x11];
                        uVar59 = puVar118[0x14];
                        uVar60 = puVar118[0x15];
                        uVar50 = puVar118[0x18];
                        uVar51 = puVar118[0x19];
                        uVar52 = puVar118[0x1c];
                        uVar53 = puVar118[0x1d];
                        auVar655._0_8_ =
                             CONCAT26(puVar118[0xe],
                                      CONCAT24(puVar118[10],CONCAT22(puVar118[6],puVar118[2])));
                        auVar655._8_2_ = puVar118[3];
                        auVar655._10_2_ = puVar118[7];
                        auVar655._12_2_ = puVar118[0xb];
                        auVar655._14_2_ = puVar118[0xf];
                        auVar546._0_8_ =
                             CONCAT26(puVar118[0x1e],
                                      CONCAT24(puVar118[0x1a],
                                               CONCAT22(puVar118[0x16],puVar118[0x12])));
                        auVar546._8_2_ = puVar118[0x13];
                        auVar546._10_2_ = puVar118[0x17];
                        auVar546._12_2_ = puVar118[0x1b];
                        auVar546._14_2_ = puVar118[0x1f];
                        auVar656._8_8_ = auVar546._8_8_;
                        auVar656._0_8_ = auVar655._8_8_;
                        *(undefined2 *)*pauVar157 = *puVar118;
                        *(undefined2 *)(*pauVar157 + 2) = uVar55;
                        *(undefined2 *)(*pauVar157 + 4) = uVar39;
                        *(undefined2 *)(*pauVar157 + 6) = uVar48;
                        *(undefined2 *)(*pauVar157 + 8) = uVar57;
                        *(undefined2 *)(*pauVar157 + 10) = uVar59;
                        *(undefined2 *)(*pauVar157 + 0xc) = uVar50;
                        *(undefined2 *)(*pauVar157 + 0xe) = uVar52;
                        *(undefined2 *)(pauVar157[1] + 8) = uVar54;
                        *(undefined2 *)(pauVar157[1] + 10) = uVar56;
                        *(undefined2 *)(pauVar157[1] + 0xc) = uVar47;
                        *(undefined2 *)(pauVar157[1] + 0xe) = uVar49;
                        *(undefined2 *)pauVar157[2] = uVar58;
                        *(undefined2 *)(pauVar157[2] + 2) = uVar60;
                        *(undefined2 *)(pauVar157[2] + 4) = uVar51;
                        *(undefined2 *)(pauVar157[2] + 6) = uVar53;
                        *(undefined8 *)pauVar157[2] = auVar655._0_8_;
                        *(undefined8 *)(pauVar157[2] + 8) = auVar546._0_8_;
                        pauVar157[3] = auVar656;
                        pauVar157 = pauVar157 + 4;
                        puVar118 = (undefined2 *)((long)puVar118 + lVar126);
                      }
                    }
                    if (local_4d8.elempack == 1) {
                      local_5b8._0_8_ = lVar123;
                      lVar129 = local_4d8.cstep * lVar125 *
                                CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                      lVar128 = (long)pvVar161 + (long)local_4d8.data;
                      lVar143 = (long)local_4d8.data + lVar130;
                      for (iVar160 = 0; iVar160 + 1 < iVar261; iVar160 = iVar160 + 2) {
                        uVar163 = *(ulong *)(lVar128 + lVar129);
                        uVar184 = *(undefined8 *)(lVar143 + lVar129);
                        auVar521._8_6_ = 0;
                        auVar521._0_8_ = uVar163;
                        auVar521[0xe] = (char)(uVar163 >> 0x38);
                        auVar521[0xf] = (char)((ulong)uVar184 >> 0x38);
                        auVar520._14_2_ = auVar521._14_2_;
                        auVar520._8_5_ = 0;
                        auVar520._0_8_ = uVar163;
                        auVar520[0xd] = (char)((ulong)uVar184 >> 0x30);
                        auVar519._13_3_ = auVar520._13_3_;
                        auVar519._8_4_ = 0;
                        auVar519._0_8_ = uVar163;
                        auVar519[0xc] = (char)(uVar163 >> 0x30);
                        auVar518._12_4_ = auVar519._12_4_;
                        auVar518._8_3_ = 0;
                        auVar518._0_8_ = uVar163;
                        auVar518[0xb] = (char)((ulong)uVar184 >> 0x28);
                        auVar517._11_5_ = auVar518._11_5_;
                        auVar517._8_2_ = 0;
                        auVar517._0_8_ = uVar163;
                        auVar517[10] = (char)(uVar163 >> 0x28);
                        auVar516._10_6_ = auVar517._10_6_;
                        auVar516[8] = 0;
                        auVar516._0_8_ = uVar163;
                        auVar516[9] = (char)((ulong)uVar184 >> 0x20);
                        auVar515._9_7_ = auVar516._9_7_;
                        auVar515[8] = (char)(uVar163 >> 0x20);
                        auVar515._0_8_ = uVar163;
                        auVar514._8_8_ = auVar515._8_8_;
                        auVar514[7] = (char)((ulong)uVar184 >> 0x18);
                        auVar514[6] = (char)(uVar163 >> 0x18);
                        auVar514[5] = (char)((ulong)uVar184 >> 0x10);
                        auVar514[4] = (char)(uVar163 >> 0x10);
                        auVar514[3] = (char)((ulong)uVar184 >> 8);
                        auVar514[2] = (char)(uVar163 >> 8);
                        auVar514[0] = (undefined1)uVar163;
                        auVar514[1] = (char)uVar184;
                        *pauVar157 = auVar514;
                        pauVar157 = pauVar157 + 1;
                        lVar128 = lVar128 + lVar180;
                        lVar143 = lVar143 + lVar180;
                      }
                      puVar119 = (undefined8 *)(lVar128 + lVar129);
                      for (; local_5d8 = uVar127, iVar160 < iVar261; iVar160 = iVar160 + 1) {
                        *(undefined8 *)*pauVar157 = *puVar119;
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        puVar119 = (undefined8 *)((long)puVar119 + lVar142);
                      }
                    }
                    pvVar161 = (void *)((long)pvVar161 + 8);
                    lVar130 = lVar130 + 8;
                    local_610 = local_610 + 0x40;
                    local_518 = local_518 + 2;
                    local_578._0_8_ = local_578._0_8_ + 8;
                    lVar123 = lVar123 + 8;
                    uVar127 = uVar127 + 0x40;
                  }
                  for (; uVar163 = uVar127, (long)(uVar178 | 3) < lVar141; uVar178 = uVar178 + 4) {
                    if (local_4d8.elempack == 8) {
                      lVar128 = local_4d8.cstep * (long)local_598 *
                                CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                      lVar129 = (long)local_4d8.data + local_610;
                      iVar160 = iVar264;
                      while (bVar181 = iVar160 != 0, iVar160 = iVar160 + -1, bVar181) {
                        puVar6 = (undefined2 *)(lVar129 + -0x10 + lVar128);
                        uVar39 = puVar6[1];
                        uVar47 = puVar6[2];
                        uVar48 = puVar6[3];
                        uVar49 = puVar6[4];
                        uVar50 = puVar6[5];
                        uVar51 = puVar6[6];
                        uVar52 = puVar6[7];
                        puVar118 = (undefined2 *)(lVar129 + lVar128);
                        uVar53 = *puVar118;
                        uVar54 = puVar118[1];
                        uVar55 = puVar118[2];
                        uVar56 = puVar118[3];
                        uVar57 = puVar118[4];
                        uVar58 = puVar118[5];
                        uVar59 = puVar118[6];
                        uVar60 = puVar118[7];
                        *(undefined2 *)*pauVar157 = *puVar6;
                        *(undefined2 *)(*pauVar157 + 2) = uVar49;
                        *(undefined2 *)(*pauVar157 + 4) = uVar53;
                        *(undefined2 *)(*pauVar157 + 6) = uVar57;
                        *(undefined2 *)(*pauVar157 + 8) = uVar39;
                        *(undefined2 *)(*pauVar157 + 10) = uVar50;
                        *(undefined2 *)(*pauVar157 + 0xc) = uVar54;
                        *(undefined2 *)(*pauVar157 + 0xe) = uVar58;
                        *(undefined2 *)pauVar157[1] = uVar47;
                        *(undefined2 *)(pauVar157[1] + 2) = uVar51;
                        *(undefined2 *)(pauVar157[1] + 4) = uVar55;
                        *(undefined2 *)(pauVar157[1] + 6) = uVar59;
                        *(undefined2 *)(pauVar157[1] + 8) = uVar48;
                        *(undefined2 *)(pauVar157[1] + 10) = uVar52;
                        *(undefined2 *)(pauVar157[1] + 0xc) = uVar56;
                        *(undefined2 *)(pauVar157[1] + 0xe) = uVar60;
                        pauVar157 = pauVar157 + 2;
                        lVar129 = lVar129 + lVar126;
                      }
                    }
                    if (local_4d8.elempack == 1) {
                      lVar143 = local_4d8.cstep * lVar125 *
                                CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                      lVar162 = (long)pvVar161 + (long)local_4d8.data;
                      lVar168 = (long)local_518 + (long)local_4d8.data;
                      lVar128 = (long)local_4d8.data + local_578._0_8_;
                      local_5b8._0_8_ = lVar123;
                      lVar129 = (long)local_4d8.data + lVar123;
                      lVar169 = (long)local_4d8.data + lVar130;
                      for (iVar160 = 1; iVar160 < iVar261; iVar160 = iVar160 + 2) {
                        (*pauVar157)[0] = *(undefined1 *)(lVar162 + lVar143);
                        (*pauVar157)[1] = *(undefined1 *)(lVar169 + lVar143);
                        (*pauVar157)[2] = *(undefined1 *)(lVar162 + 1 + lVar143);
                        (*pauVar157)[3] = *(undefined1 *)(lVar129 + lVar143);
                        (*pauVar157)[4] = *(undefined1 *)(lVar162 + 2 + lVar143);
                        (*pauVar157)[5] = *(undefined1 *)(lVar128 + lVar143);
                        (*pauVar157)[6] = *(undefined1 *)(lVar162 + 3 + lVar143);
                        (*pauVar157)[7] = *(undefined1 *)(lVar168 + lVar143);
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        lVar162 = lVar162 + lVar180;
                        lVar168 = lVar168 + lVar180;
                        lVar128 = lVar128 + lVar180;
                        lVar129 = lVar129 + lVar180;
                        lVar169 = lVar169 + lVar180;
                      }
                      puVar120 = (undefined1 *)(lVar162 + lVar143);
                      for (iVar160 = iVar160 + -1; iVar160 < iVar261; iVar160 = iVar160 + 1) {
                        (*pauVar157)[0] = *puVar120;
                        (*pauVar157)[1] = puVar120[1];
                        (*pauVar157)[2] = puVar120[2];
                        (*pauVar157)[3] = puVar120[3];
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        puVar120 = puVar120 + lVar142;
                      }
                    }
                    local_610 = local_610 + 0x20;
                    pvVar161 = (void *)((long)pvVar161 + 4);
                    local_518 = local_518 + 1;
                    local_578._0_8_ = local_578._0_8_ + 4;
                    lVar123 = lVar123 + 4;
                    lVar130 = lVar130 + 4;
                    uVar127 = uVar163 + 0x20;
                    local_5d8 = uVar163;
                  }
                  for (; (long)(uVar178 | 1) < lVar141; uVar178 = uVar178 + 2) {
                    local_5b8._0_8_ = lVar123;
                    if (local_4d8.elempack == 8) {
                      lVar128 = local_4d8.cstep * (long)local_598 *
                                CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                      lVar129 = (long)local_4d8.data + uVar163;
                      iVar160 = iVar264;
                      while (bVar181 = iVar160 != 0, iVar160 = iVar160 + -1, bVar181) {
                        uVar127 = *(ulong *)(lVar129 + -8 + lVar128);
                        uVar184 = *(undefined8 *)(lVar129 + lVar128);
                        auVar525._8_4_ = 0;
                        auVar525._0_8_ = uVar127;
                        auVar525._12_2_ = (short)(uVar127 >> 0x30);
                        auVar525._14_2_ = (short)((ulong)uVar184 >> 0x30);
                        auVar524._12_4_ = auVar525._12_4_;
                        auVar524._8_2_ = 0;
                        auVar524._0_8_ = uVar127;
                        auVar524._10_2_ = (short)((ulong)uVar184 >> 0x20);
                        auVar523._10_6_ = auVar524._10_6_;
                        auVar523._8_2_ = (short)(uVar127 >> 0x20);
                        auVar523._0_8_ = uVar127;
                        auVar522._8_8_ = auVar523._8_8_;
                        auVar522._6_2_ = (short)((ulong)uVar184 >> 0x10);
                        auVar522._4_2_ = (short)(uVar127 >> 0x10);
                        auVar522._0_2_ = (undefined2)uVar127;
                        auVar522._2_2_ = (short)uVar184;
                        *pauVar157 = auVar522;
                        pauVar157 = pauVar157 + 1;
                        lVar129 = lVar129 + lVar126;
                      }
                    }
                    if (local_4d8.elempack == 1) {
                      lVar129 = local_4d8.cstep * lVar125 *
                                CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                      lVar143 = (long)pvVar161 + (long)local_4d8.data;
                      lVar128 = (long)local_4d8.data + lVar123;
                      lVar169 = (long)local_4d8.data + lVar130;
                      for (iVar160 = 0; iVar160 + 1 < iVar261; iVar160 = iVar160 + 2) {
                        (*pauVar157)[0] = *(undefined1 *)(lVar143 + lVar129);
                        (*pauVar157)[1] = *(undefined1 *)(lVar169 + lVar129);
                        (*pauVar157)[2] = *(undefined1 *)(lVar143 + 1 + lVar129);
                        (*pauVar157)[3] = *(undefined1 *)(lVar128 + lVar129);
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                        lVar143 = lVar143 + lVar180;
                        lVar128 = lVar128 + lVar180;
                        lVar169 = lVar169 + lVar180;
                      }
                      for (; local_5d8 = uVar163, iVar160 < iVar261; iVar160 = iVar160 + 1) {
                        (*pauVar157)[0] = *(undefined1 *)(lVar143 + lVar129);
                        (*pauVar157)[1] = *(undefined1 *)(lVar143 + 1 + lVar129);
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 2);
                        lVar129 = lVar129 + lVar142;
                      }
                    }
                    uVar163 = uVar163 + 0x10;
                    pvVar161 = (void *)((long)pvVar161 + 2);
                    lVar123 = lVar123 + 2;
                    lVar130 = lVar130 + 2;
                  }
                  if (iVar261 < 1) {
                    iVar261 = 0;
                  }
                  for (; (long)uVar178 < lVar141; uVar178 = uVar178 + 1) {
                    if (local_4d8.elempack == 8) {
                      puVar119 = (undefined8 *)
                                 ((long)local_4d8.data +
                                 (uVar178 + (long)local_500) * 8 +
                                 local_4d8.cstep * (long)local_598 *
                                 CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize));
                      iVar160 = iVar264;
                      while (bVar181 = iVar160 != 0, iVar160 = iVar160 + -1, bVar181) {
                        *(undefined8 *)*pauVar157 = *puVar119;
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        puVar119 = (undefined8 *)((long)puVar119 + lVar126);
                      }
                    }
                    if (local_4d8.elempack == 1) {
                      puVar120 = (undefined1 *)
                                 ((long)local_4d8.data +
                                  uVar178 + local_4d8.cstep * lVar125 *
                                            CONCAT44(local_4d8.elemsize._4_4_,
                                                     (undefined4)local_4d8.elemsize) +
                                 (long)local_500);
                      iVar160 = iVar261;
                      while (bVar181 = iVar160 != 0, iVar160 = iVar160 + -1, bVar181) {
                        (*pauVar157)[0] = *puVar120;
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 1);
                        puVar120 = puVar120 + lVar142;
                      }
                    }
                  }
                }
              }
              local_368.cstep = 0;
              local_368.data = (void *)0x0;
              local_368.refcount._0_4_ = 0;
              local_368.refcount._4_4_ = 0;
              local_368.elemsize = 0;
              local_368.elempack = 0;
              local_368.allocator = (Allocator *)0x0;
              local_368.dims = 0;
              local_368.w = 0;
              local_368.h = 0;
              local_368.d = 0;
              local_368.c = 0;
              Mat::create(&local_368,TILE_M * TILE_N,1,(int)local_5a0,4,
                          local_5c0->workspace_allocator);
              iVar164 = -100;
              if ((local_368.data != (void *)0x0) && ((long)local_368.c * local_368.cstep != 0)) {
                if (iVar146 < 1) {
                  iVar146 = 0;
                }
                iVar135 = 0;
                uVar127 = local_310;
                piVar134 = local_530;
                while (iVar164 = 0, iVar135 != iVar146) {
                  local_4e8._0_4_ = iVar135;
                  local_518 = (int *)CONCAT44(local_518._4_4_,TILE_M * iVar135);
                  iVar164 = (int)uVar127 - TILE_M * iVar135;
                  if (TILE_M < iVar164) {
                    iVar164 = TILE_M;
                  }
                  local_528._0_4_ = iVar164;
                  iVar164 = get_omp_thread_num();
                  m.data = (void *)((long)iVar164 * local_368.cstep * local_368.elemsize +
                                   (long)local_368.data);
                  m.refcount._0_4_ = 0;
                  m.refcount._4_4_ = 0;
                  m.elemsize = local_368.elemsize;
                  m.elempack = local_368.elempack;
                  m.allocator = local_368.allocator;
                  m.w = local_368.w;
                  m.h = local_368.h;
                  m.d = 1;
                  m.c = local_368.d;
                  m.dims = local_368.dims + -1;
                  m.cstep = (local_368.elemsize * (long)local_368.h * (long)local_368.w + 0xf &
                            0xfffffffffffffff0) / local_368.elemsize;
                  if (local_368.dims == 4) {
                    m.cstep = (long)local_368.h * (long)local_368.w;
                  }
                  lVar125 = (long)(int)local_518;
                  lVar126 = (long)(int)local_528._0_4_;
                  local_598 = (void *)(lVar125 * 4);
                  local_5b8._0_8_ = lVar125;
                  local_488._0_8_ = lVar125 * 4 + 4;
                  for (iVar164 = 0; uVar127 = local_310, uVar178 = local_4f0,
                      iVar135 = (int)piVar134 - iVar164, iVar135 != 0 && iVar164 <= (int)piVar134;
                      iVar164 = iVar164 + TILE_N) {
                    if (TILE_N < iVar135) {
                      iVar135 = TILE_N;
                    }
                    for (iVar117 = 0; iVar149 = (int)uVar178 - iVar117,
                        iVar149 != 0 && iVar117 <= (int)uVar178; iVar117 = iVar117 + TILE_K) {
                      if (TILE_K < iVar149) {
                        iVar149 = TILE_K;
                      }
                      m_1.w = (this->weight_sgemm_data).w;
                      m_1.cstep = (size_t)m_1.w;
                      m_1.elemsize = (this->weight_sgemm_data).elemsize;
                      m_1.elempack = (this->weight_sgemm_data).elempack;
                      m_1.allocator = (this->weight_sgemm_data).allocator;
                      m_1.data = (void *)((long)(this->weight_sgemm_data).data +
                                         m_1.elemsize * m_1.cstep * (long)(iVar117 / TILE_K) +
                                         (long)((int)local_518 / TILE_M) *
                                         (this->weight_sgemm_data).cstep * m_1.elemsize);
                      m_1.refcount = (int *)0x0;
                      m_1.dims = 2;
                      m_1.h = 1;
                      m_1.d = 1;
                      m_1.c = 1;
                      local_298.cstep = (size_t)(int)opt_q._44_4_;
                      local_298.elemsize =
                           CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_)
                      ;
                      local_298.data =
                           (void *)(local_298.cstep * local_298.elemsize * (long)(iVar117 / TILE_K)
                                   + (long)(iVar164 / TILE_N) * local_1c8 * local_298.elemsize +
                                     opt_q._0_8_);
                      local_298.refcount = (int *)0x0;
                      local_298.elempack = opt_q.openmp_blocktime;
                      local_298.allocator = (Allocator *)opt_q._32_8_;
                      local_298.w._0_1_ = opt_q.use_reserved_1;
                      local_298.w._1_1_ = opt_q.use_image_storage;
                      local_298.w._2_1_ = opt_q.use_tensor_storage;
                      local_298.w._3_1_ = opt_q.use_reserved_2;
                      local_298.h = 1;
                      local_298.d = 1;
                      local_298.dims = m_1.dims;
                      local_298.c = m_1.c;
                      Gemm_x86_utility::gemm_transB_packed_tile_int8
                                (&m_1,&local_298,&m,(int)local_518,local_528._0_4_,iVar164,iVar135,
                                 iVar117,iVar149);
                      if (local_298.refcount != (int *)0x0) {
                        LOCK();
                        *local_298.refcount = *local_298.refcount + -1;
                        UNLOCK();
                        if (*local_298.refcount == 0) {
                          if (local_298.allocator == (Allocator *)0x0) {
                            free(local_298.data);
                          }
                          else {
                            (*(local_298.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                      if (m_1.refcount != (int *)0x0) {
                        LOCK();
                        *m_1.refcount = *m_1.refcount + -1;
                        UNLOCK();
                        if (*m_1.refcount == 0) {
                          if (m_1.allocator == (Allocator *)0x0) {
                            free(m_1.data);
                          }
                          else {
                            (*(m_1.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    iVar117 = (int)local_3c8.cstep;
                    lVar125 = (long)iVar117;
                    lVar180 = (long)(iVar117 * 2);
                    lVar141 = (long)(local_3c8.cstep * 0x300000000) >> 0x20;
                    local_578._0_4_ = iVar164;
                    local_5d8 = (ulong)iVar164;
                    lVar130 = local_488._0_8_ * lVar125 + local_5d8 * 4 + 0x10;
                    lVar142 = lVar125 * 0x10;
                    local_630 = (long)local_598 * lVar125 + local_5d8 * 4;
                    local_608._0_8_ = local_488._0_8_ * lVar125 + local_5d8 * 4;
                    local_620 = local_630 + (long)(iVar117 + 1) * 4;
                    pauVar157 = (undefined1 (*) [16])m.data;
                    for (uVar127 = 0; (long)(uVar127 | 3) < lVar126; uVar127 = uVar127 + 4) {
                      pauVar132 = (undefined1 (*) [16])
                                  ((long)local_3c8.data +
                                  (long)(local_3c8.elempack * iVar164) * 4 +
                                  (local_5b8._0_8_ + uVar127) * lVar125 * 4);
                      for (iVar149 = 0; iVar149 + 7 < iVar135; iVar149 = iVar149 + 8) {
                        uVar61 = *(undefined4 *)(*pauVar157 + 4);
                        uVar62 = *(undefined4 *)(*pauVar157 + 0xc);
                        uVar63 = *(undefined4 *)pauVar157[1];
                        uVar64 = *(undefined4 *)(pauVar157[1] + 4);
                        uVar65 = *(undefined4 *)(pauVar157[1] + 0xc);
                        uVar66 = *(undefined4 *)(pauVar157[2] + 4);
                        uVar67 = *(undefined4 *)(pauVar157[2] + 8);
                        uVar68 = *(undefined4 *)(pauVar157[2] + 0xc);
                        uVar151 = *(undefined4 *)pauVar157[4];
                        uVar769 = *(undefined4 *)(pauVar157[4] + 8);
                        uVar183 = *(undefined4 *)pauVar157[5];
                        uVar770 = *(undefined4 *)(pauVar157[5] + 8);
                        uVar259 = *(undefined4 *)pauVar157[6];
                        uVar405 = *(undefined4 *)(pauVar157[6] + 4);
                        uVar789 = *(undefined4 *)(pauVar157[6] + 8);
                        uVar69 = *(undefined4 *)(pauVar157[3] + 4);
                        uVar70 = *(undefined4 *)(pauVar157[3] + 8);
                        uVar71 = *(undefined4 *)(pauVar157[3] + 0xc);
                        uVar260 = *(undefined4 *)pauVar157[7];
                        uVar409 = *(undefined4 *)(pauVar157[7] + 4);
                        uVar790 = *(undefined4 *)(pauVar157[7] + 8);
                        uVar654 = CONCAT44(uVar405,*(undefined4 *)*pauVar157);
                        auVar501._12_4_ = uVar405;
                        auVar501._8_4_ = *(undefined4 *)(*pauVar157 + 8);
                        uVar678 = CONCAT44(uVar409,uVar63);
                        auVar433._12_4_ = uVar409;
                        auVar433._8_4_ = *(undefined4 *)(pauVar157[1] + 8);
                        auVar305._12_4_ = *(undefined4 *)(pauVar157[4] + 0xc);
                        auVar305._8_4_ = *(undefined4 *)pauVar157[2];
                        uVar513 = CONCAT44(*(undefined4 *)(pauVar157[4] + 4),uVar67);
                        auVar191._12_4_ = *(undefined4 *)(pauVar157[5] + 0xc);
                        auVar191._8_4_ = *(undefined4 *)pauVar157[3];
                        uVar184 = CONCAT44(*(undefined4 *)(pauVar157[5] + 4),uVar70);
                        auVar305._0_8_ = uVar654;
                        auVar501._0_8_ = uVar513;
                        auVar191._0_8_ = uVar678;
                        auVar433._0_8_ = uVar184;
                        if (local_3c8.elempack == 1) {
                          auVar598._8_4_ = uVar405;
                          auVar598._0_8_ = uVar654;
                          auVar598._12_4_ = uVar61;
                          auVar306._0_8_ = CONCAT44(uVar259,*(undefined4 *)pauVar157[2]);
                          auVar306._8_4_ = *(undefined4 *)(pauVar157[4] + 0xc);
                          auVar306._12_4_ = uVar66;
                          auVar657._8_4_ = *(undefined4 *)(pauVar157[4] + 4);
                          auVar657._0_8_ = uVar513;
                          auVar657._12_4_ = uVar68;
                          auVar502._0_8_ = CONCAT44(uVar769,*(undefined4 *)(*pauVar157 + 8));
                          auVar502._8_4_ = uVar405;
                          auVar502._12_4_ = uVar62;
                          auVar307._8_8_ = auVar502._8_8_;
                          auVar307._0_8_ = auVar306._8_8_;
                          auVar503._8_4_ = uVar409;
                          auVar503._0_8_ = uVar678;
                          auVar503._12_4_ = uVar64;
                          auVar192._0_8_ = CONCAT44(uVar260,*(undefined4 *)pauVar157[3]);
                          auVar192._8_4_ = *(undefined4 *)(pauVar157[5] + 0xc);
                          auVar192._12_4_ = uVar69;
                          auVar547._8_4_ = *(undefined4 *)(pauVar157[5] + 4);
                          auVar547._0_8_ = uVar184;
                          auVar547._12_4_ = uVar71;
                          auVar434._0_8_ = CONCAT44(uVar770,*(undefined4 *)(pauVar157[1] + 8));
                          auVar434._8_4_ = uVar409;
                          auVar434._12_4_ = uVar65;
                          auVar504._8_8_ = auVar547._8_8_;
                          auVar504._0_8_ = auVar503._8_8_;
                          auVar193._8_8_ = auVar434._8_8_;
                          auVar193._0_8_ = auVar192._8_8_;
                          *(ulong *)*pauVar132 = CONCAT44(uVar151,*(undefined4 *)*pauVar157);
                          *(ulong *)(*pauVar132 + 8) = CONCAT44(uVar789,uVar67);
                          *(ulong *)pauVar132[1] = CONCAT44(uVar183,uVar63);
                          *(ulong *)(pauVar132[1] + 8) = CONCAT44(uVar790,uVar70);
                          *(long *)(*pauVar132 + lVar125 * 4) = auVar598._8_8_;
                          *(long *)((long)(*pauVar132 + lVar125 * 4) + 8) = auVar657._8_8_;
                          *(undefined1 (*) [16])(pauVar132[1] + lVar125 * 4) = auVar504;
                          *(undefined8 *)(*pauVar132 + lVar180 * 4) = auVar306._0_8_;
                          *(undefined8 *)((long)(*pauVar132 + lVar180 * 4) + 8) = auVar502._0_8_;
                          *(undefined8 *)(pauVar132[1] + lVar180 * 4) = auVar192._0_8_;
                          *(undefined8 *)((long)(pauVar132[1] + lVar180 * 4) + 8) = auVar434._0_8_;
                          *(undefined1 (*) [16])(*pauVar132 + lVar141 * 4) = auVar307;
                          *(undefined1 (*) [16])(pauVar132[1] + lVar141 * 4) = auVar193;
                          pauVar132 = pauVar132 + 2;
                        }
                        else if (local_3c8.elempack == 4) {
                          *pauVar132 = auVar305;
                          *(undefined4 *)pauVar132[1] = uVar151;
                          *(undefined4 *)(pauVar132[1] + 4) = uVar61;
                          *(undefined4 *)(pauVar132[1] + 8) = uVar259;
                          *(undefined4 *)(pauVar132[1] + 0xc) = uVar66;
                          pauVar132[2] = auVar501;
                          *(undefined4 *)pauVar132[3] = uVar789;
                          *(undefined4 *)(pauVar132[3] + 4) = uVar68;
                          *(undefined4 *)(pauVar132[3] + 8) = uVar769;
                          *(undefined4 *)(pauVar132[3] + 0xc) = uVar62;
                          pauVar132[4] = auVar191;
                          *(undefined4 *)pauVar132[5] = uVar183;
                          *(undefined4 *)(pauVar132[5] + 4) = uVar64;
                          *(undefined4 *)(pauVar132[5] + 8) = uVar260;
                          *(undefined4 *)(pauVar132[5] + 0xc) = uVar69;
                          pauVar132[6] = auVar433;
                          *(undefined4 *)pauVar132[7] = uVar790;
                          *(undefined4 *)(pauVar132[7] + 4) = uVar71;
                          *(undefined4 *)(pauVar132[7] + 8) = uVar770;
                          *(undefined4 *)(pauVar132[7] + 0xc) = uVar65;
                          pauVar132 = pauVar132 + 8;
                        }
                        pauVar157 = pauVar157 + 8;
                      }
                      for (; iVar149 + 3 < iVar135; iVar149 = iVar149 + 4) {
                        uVar151 = *(undefined4 *)(pauVar157[3] + 4);
                        uVar184 = CONCAT44(uVar151,*(undefined4 *)*pauVar157);
                        auVar308._12_4_ = uVar151;
                        auVar308._8_4_ = *(undefined4 *)(*pauVar157 + 8);
                        auVar194._12_4_ = *(undefined4 *)(pauVar157[1] + 0xc);
                        auVar194._8_4_ = *(undefined4 *)pauVar157[2];
                        uVar513 = CONCAT44(*(undefined4 *)(pauVar157[1] + 4),
                                           *(undefined4 *)(pauVar157[2] + 8));
                        auVar194._0_8_ = uVar184;
                        auVar308._0_8_ = uVar513;
                        auVar505._4_4_ = *(undefined4 *)(*pauVar157 + 4);
                        auVar505._0_4_ = *(undefined4 *)pauVar157[1];
                        auVar505._8_4_ = *(undefined4 *)pauVar157[3];
                        auVar505._12_4_ = *(undefined4 *)(pauVar157[2] + 4);
                        auVar435._4_4_ = *(undefined4 *)(pauVar157[2] + 0xc);
                        auVar435._0_4_ = *(undefined4 *)(pauVar157[3] + 8);
                        auVar435._8_4_ = *(undefined4 *)(pauVar157[1] + 8);
                        auVar435._12_4_ = *(undefined4 *)(*pauVar157 + 0xc);
                        if (local_3c8.elempack == 1) {
                          auVar526._8_4_ = uVar151;
                          auVar526._0_8_ = uVar184;
                          auVar526._12_4_ = *(undefined4 *)(*pauVar157 + 4);
                          auVar436._4_4_ = *(undefined4 *)pauVar157[1];
                          auVar436._0_4_ = *(undefined4 *)*pauVar157;
                          auVar195._0_8_ =
                               CONCAT44(*(undefined4 *)pauVar157[3],*(undefined4 *)pauVar157[2]);
                          auVar195._8_4_ = *(undefined4 *)(pauVar157[1] + 0xc);
                          auVar195._12_4_ = *(undefined4 *)(pauVar157[2] + 4);
                          auVar506._8_4_ = *(undefined4 *)(pauVar157[1] + 4);
                          auVar506._0_8_ = uVar513;
                          auVar506._12_4_ = *(undefined4 *)(pauVar157[2] + 0xc);
                          auVar436._12_4_ = *(undefined4 *)(pauVar157[3] + 8);
                          auVar436._8_4_ = *(undefined4 *)(pauVar157[2] + 8);
                          auVar309._0_8_ =
                               CONCAT44(*(undefined4 *)(pauVar157[1] + 8),
                                        *(undefined4 *)(*pauVar157 + 8));
                          auVar309._8_4_ = uVar151;
                          auVar309._12_4_ = *(undefined4 *)(*pauVar157 + 0xc);
                          auVar507._8_8_ = auVar309._0_8_;
                          auVar507._0_8_ = auVar195._0_8_;
                          auVar196._8_8_ = auVar309._8_8_;
                          auVar196._0_8_ = auVar195._8_8_;
                          *pauVar132 = auVar436;
                          *(long *)(*pauVar132 + lVar125 * 4) = auVar526._8_8_;
                          *(long *)((long)(*pauVar132 + lVar125 * 4) + 8) = auVar506._8_8_;
                          *(undefined1 (*) [16])(*pauVar132 + lVar180 * 4) = auVar507;
                          *(undefined1 (*) [16])(*pauVar132 + lVar141 * 4) = auVar196;
                          pauVar132 = pauVar132 + 1;
                        }
                        else if (local_3c8.elempack == 4) {
                          *pauVar132 = auVar194;
                          pauVar132[1] = auVar505;
                          pauVar132[2] = auVar308;
                          pauVar132[3] = auVar435;
                          pauVar132 = pauVar132 + 4;
                        }
                        pauVar157 = pauVar157 + 4;
                      }
                      for (; iVar149 + 1 < iVar135; iVar149 = iVar149 + 2) {
                        auVar528 = *pauVar157;
                        auVar300 = pauVar157[1];
                        auVar311._8_4_ = auVar528._8_4_;
                        auVar197._0_4_ = auVar300._0_4_;
                        auVar197._8_4_ = auVar300._8_4_;
                        auVar310._0_4_ = auVar528._0_4_;
                        if (local_3c8.elempack == 1) {
                          uVar184 = CONCAT44(auVar197._0_4_,auVar310._0_4_);
                          *(undefined8 *)*pauVar132 = uVar184;
                          *(int *)(*pauVar132 + lVar125 * 4) = auVar300._4_4_;
                          *(int *)(*pauVar132 + (long)(iVar117 + 1) * 4) = auVar528._4_4_;
                          uVar184 = CONCAT44(auVar197._8_4_,auVar311._8_4_);
                          *(undefined8 *)(*pauVar132 + lVar180 * 4) = uVar184;
                          *(int *)(*pauVar132 + (long)(iVar117 * 3) * 4) = auVar300._12_4_;
                          *(int *)(*pauVar132 + (long)(iVar117 * 3 + 1) * 4) = auVar528._12_4_;
                          pauVar132 = (undefined1 (*) [16])(*pauVar132 + 8);
                        }
                        else if (local_3c8.elempack == 4) {
                          auVar311._4_4_ = auVar311._8_4_;
                          auVar311._0_4_ = auVar310._0_4_;
                          auVar197._4_4_ = auVar528._4_4_;
                          auVar197._12_4_ = auVar528._12_4_;
                          auVar311._12_4_ = auVar300._12_4_;
                          auVar310._8_8_ = auVar311._8_8_;
                          auVar310._4_4_ = auVar300._4_4_;
                          *pauVar132 = auVar310;
                          pauVar132[1] = auVar197;
                          pauVar132 = pauVar132 + 2;
                        }
                        pauVar157 = pauVar157 + 2;
                      }
                      for (; iVar149 < iVar135; iVar149 = iVar149 + 1) {
                        auVar528 = *pauVar157;
                        if (local_3c8.elempack == 1) {
                          *(int *)*pauVar132 = auVar528._0_4_;
                          *(int *)(*pauVar132 + lVar125 * 4) = auVar528._4_4_;
                          *(int *)(*pauVar132 + lVar180 * 4) = auVar528._8_4_;
                          *(int *)(*pauVar132 + lVar141 * 4) = auVar528._12_4_;
                          pauVar132 = (undefined1 (*) [16])(*pauVar132 + 4);
                        }
                        else if (local_3c8.elempack == 4) {
                          *pauVar132 = auVar528;
                          pauVar132 = pauVar132 + 1;
                        }
                        pauVar157 = pauVar157 + 1;
                      }
                      lVar130 = lVar130 + lVar142;
                      local_630 = local_630 + lVar142;
                      local_608._0_8_ = local_608._0_8_ + lVar142;
                      local_620 = local_620 + lVar142;
                    }
                    lVar142 = lVar125 * 8;
                    for (; (long)(uVar127 | 1) < lVar126; uVar127 = uVar127 + 2) {
                      lVar180 = (long)local_3c8.data +
                                local_5d8 * 4 + (local_5b8._0_8_ + uVar127) * lVar125 * 4;
                      puVar173 = (undefined4 *)((long)local_3c8.data + local_608._0_8_);
                      pauVar132 = pauVar157;
                      for (lVar141 = 0; (int)lVar141 + 7 < iVar135; lVar141 = lVar141 + 8) {
                        puVar10 = (undefined4 *)(*pauVar157 + lVar141 * 8);
                        uVar260 = puVar10[1];
                        uVar405 = puVar10[3];
                        puVar7 = (undefined4 *)(pauVar157[1] + lVar141 * 8);
                        uVar409 = *puVar7;
                        uVar769 = puVar7[2];
                        puVar8 = (undefined4 *)(pauVar157[2] + lVar141 * 8);
                        uVar151 = *puVar8;
                        uVar259 = puVar8[2];
                        puVar9 = (undefined4 *)(pauVar157[3] + lVar141 * 8);
                        uVar183 = puVar9[1];
                        auVar508._4_4_ = puVar8[1];
                        auVar508._0_4_ = *puVar10;
                        auVar508._12_4_ = puVar8[3];
                        auVar508._8_4_ = puVar10[2];
                        auVar437._4_4_ = puVar7[1];
                        auVar437._0_4_ = *puVar9;
                        auVar437._8_4_ = puVar9[2];
                        auVar437._12_4_ = puVar7[3];
                        *(undefined1 (*) [16])((long)local_3c8.data + lVar141 * 4 + local_630) =
                             auVar508;
                        puVar119 = (undefined8 *)
                                   ((long)local_3c8.data + lVar141 * 4 + local_630 + 0x10);
                        *puVar119 = CONCAT44(uVar183,uVar409);
                        puVar119[1] = CONCAT44(uVar183,uVar769);
                        puVar10 = (undefined4 *)
                                  ((long)local_3c8.data + lVar141 * 4 + lVar130 + -0x10);
                        *puVar10 = uVar151;
                        puVar10[1] = uVar260;
                        puVar10[2] = uVar259;
                        puVar10[3] = uVar405;
                        *(undefined1 (*) [16])((long)local_3c8.data + lVar141 * 4 + lVar130) =
                             auVar437;
                        lVar180 = lVar180 + 0x20;
                        pauVar132 = pauVar132 + 4;
                        puVar173 = puVar173 + 8;
                      }
                      for (; (int)lVar141 + 3 < iVar135; lVar141 = lVar141 + 4) {
                        auVar528 = *(undefined1 (*) [16])(*pauVar157 + lVar141 * 8);
                        puVar10 = (undefined4 *)(pauVar157[1] + lVar141 * 8);
                        auVar312._4_4_ = *puVar10;
                        auVar312._0_4_ = auVar528._0_4_;
                        auVar312._12_4_ = puVar10[2];
                        auVar312._8_4_ = auVar528._8_4_;
                        auVar198._12_4_ = auVar528._12_4_;
                        auVar198._4_4_ = auVar528._4_4_;
                        auVar198._0_4_ = puVar10[3];
                        auVar198._8_4_ = puVar10[1];
                        *(undefined1 (*) [16])((long)local_3c8.data + lVar141 * 4 + local_630) =
                             auVar312;
                        *(undefined1 (*) [16])((long)local_3c8.data + lVar141 * 4 + local_608._0_8_)
                             = auVar198;
                        lVar180 = lVar180 + 0x10;
                        pauVar132 = pauVar132 + 2;
                        puVar173 = puVar173 + 4;
                      }
                      for (; (int)lVar141 + 1 < iVar135; lVar141 = lVar141 + 2) {
                        uVar151 = *(undefined4 *)(*pauVar157 + lVar141 * 8 + 8);
                        uVar183 = *(undefined4 *)(*pauVar157 + lVar141 * 8 + 0xc);
                        *(undefined8 *)((long)local_3c8.data + lVar141 * 4 + local_630) =
                             *(undefined8 *)(*pauVar157 + lVar141 * 8);
                        *(undefined4 *)((long)local_3c8.data + lVar141 * 4 + local_608._0_8_) =
                             uVar151;
                        *(undefined4 *)((long)local_3c8.data + lVar141 * 4 + local_620) = uVar183;
                        lVar180 = lVar180 + 8;
                        pauVar132 = pauVar132 + 1;
                        puVar173 = puVar173 + 2;
                      }
                      pauVar157 = pauVar132;
                      for (lVar123 = 0; (int)lVar141 + (int)lVar123 < iVar135; lVar123 = lVar123 + 1
                          ) {
                        uVar151 = *(undefined4 *)(*pauVar157 + 4);
                        *(undefined4 *)(lVar180 + lVar123 * 4) = *(undefined4 *)*pauVar157;
                        *puVar173 = uVar151;
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                        puVar173 = puVar173 + 1;
                      }
                      lVar130 = lVar130 + lVar142;
                      local_630 = local_630 + lVar142;
                      local_608._0_8_ = local_608._0_8_ + lVar142;
                      local_620 = local_620 + lVar142;
                    }
                    for (; (long)uVar127 < lVar126; uVar127 = uVar127 + 1) {
                      pauVar132 = (undefined1 (*) [16])
                                  ((long)local_3c8.data +
                                  local_5d8 * 4 + (local_5b8._0_8_ + uVar127) * lVar125 * 4);
                      for (iVar117 = 0; iVar117 + 7 < iVar135; iVar117 = iVar117 + 8) {
                        auVar528 = pauVar157[1];
                        *pauVar132 = *pauVar157;
                        pauVar132[1] = auVar528;
                        pauVar132 = pauVar132 + 2;
                        pauVar157 = pauVar157 + 2;
                      }
                      for (; iVar117 + 3 < iVar135; iVar117 = iVar117 + 4) {
                        *pauVar132 = *pauVar157;
                        pauVar132 = pauVar132 + 1;
                        pauVar157 = pauVar157 + 1;
                      }
                      for (; iVar117 + 1 < iVar135; iVar117 = iVar117 + 2) {
                        *(undefined8 *)*pauVar132 = *(undefined8 *)*pauVar157;
                        pauVar132 = (undefined1 (*) [16])(*pauVar132 + 8);
                        pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                      }
                      lVar142 = 0;
                      for (; iVar117 < iVar135; iVar117 = iVar117 + 1) {
                        *(undefined4 *)(*pauVar132 + lVar142) =
                             *(undefined4 *)(*pauVar157 + lVar142);
                        lVar142 = lVar142 + 4;
                      }
                      pauVar157 = (undefined1 (*) [16])(*pauVar157 + lVar142);
                    }
                    piVar134 = local_530;
                  }
                  piVar124 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
                  if (piVar124 != (int *)0x0) {
                    LOCK();
                    *piVar124 = *piVar124 + -1;
                    UNLOCK();
                    if (*piVar124 == 0) {
                      if (m.allocator == (Allocator *)0x0) {
                        free(m.data);
                      }
                      else {
                        (*(m.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  iVar135 = local_4e8._0_4_ + 1;
                }
              }
              piVar134 = (int *)CONCAT44(local_368.refcount._4_4_,local_368.refcount._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  if (local_368.allocator == (Allocator *)0x0) {
                    free(local_368.data);
                  }
                  else {
                    (*(local_368.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar134 != (int *)0x0) {
              LOCK();
              *piVar134 = *piVar134 + -1;
              UNLOCK();
              if (*piVar134 == 0) {
                pvVar161 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) {
LAB_001644eb:
                  free(pvVar161);
                }
                else {
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            goto LAB_001644f6;
          }
          iVar167 = cpu_support_x86_xop();
          iVar146 = local_3c8.h;
          iVar149 = local_4d8.w;
          iVar164 = local_4d8.elempack;
          if (iVar167 == 0) {
            local_20c = (int)local_4d8.cstep;
            lVar125 = (long)local_4d8.elempack;
            lVar142 = (long)local_4d8.c;
            local_36c = local_3c8.w;
            local_538 = (ulong)local_3c8.elempack;
            lVar126 = (long)local_3c8.c;
            uVar144 = iVar117 * iVar135;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar144,
                       (allocator_type *)&local_368);
            uVar150 = (uint)local_458;
            iVar137 = auVar550._0_4_ * iVar135;
            iVar167 = 0;
            if (iVar135 < 1) {
              iVar135 = 0;
            }
            if (iVar117 < 1) {
              iVar117 = iVar167;
            }
            iVar160 = 0;
            iVar177 = 0;
            iVar261 = iVar135;
            for (; iVar167 != iVar117; iVar167 = iVar167 + 1) {
              iVar262 = iVar160 * iVar164;
              iVar160 = (iVar149 * (int)local_5d8 - iVar137) + iVar160;
              for (lVar180 = (long)iVar177; iVar261 != lVar180; lVar180 = lVar180 + 1) {
                *(int *)(opt_q._0_8_ + lVar180 * 4) = iVar262;
                iVar160 = iVar160 + auVar550._0_4_;
                iVar262 = iVar262 + iVar164 * auVar550._0_4_;
              }
              iVar261 = iVar261 + iVar135;
              iVar177 = iVar177 + iVar135;
            }
            lVar142 = lVar142 * lVar125;
            uVar163 = lVar126 * local_538;
            uVar127 = (long)((ulong)(uint)((int)uVar163 >> 0x1f) << 0x20 | uVar163 & 0xffffffff) / 4
            ;
            uVar151 = local_5b8._0_4_;
            local_468 = CONCAT44(local_468._4_4_,local_5b8._0_4_);
            iVar135 = iVar164 * local_5b8._0_4_;
            local_470 = CONCAT44(local_470._4_4_,iVar135);
            uVar178 = (ulong)uVar144;
            if ((int)uVar144 < 1) {
              uVar178 = 0;
            }
            local_530 = (int *)(uVar178 * 8);
            lVar125 = uVar178 * 4;
            local_488._0_8_ = uVar178 * 0x20;
            iVar117 = (int)uVar127;
            uVar138 = 0;
            if (0 < iVar117) {
              uVar138 = uVar127 & 0xffffffff;
            }
            local_5a4 = (uint)local_458;
            uVar127 = 0;
            while( true ) {
              uVar172 = uVar127;
              lVar126 = CONCAT44(local_458._4_4_,(uint)local_458);
              local_618 = (int)lVar142;
              if (uVar172 == uVar138) break;
              local_5e0 = (undefined1 (*) [16])
                          ((long)(((int)uVar172 * 4) / (int)local_538) * local_3c8.cstep *
                           local_3c8.elemsize + (long)local_3c8.data);
              iVar149 = (int)local_3c8.cstep * (int)local_538;
              iVar167 = local_3c8.h * local_3c8.w;
              local_5a0 = CONCAT44(local_5a0._4_4_,iVar167);
              lVar143 = (long)((int)local_4d8.cstep * iVar164);
              lVar180 = lVar143 * 3;
              local_5b8._0_8_ = lVar180;
              local_380 = (long)iVar149;
              local_318 = (void *)(long)(iVar149 + 1);
              local_218 = (long)(iVar149 + 2);
              local_220 = (long)(iVar149 + 3);
              lVar141 = (long)(iVar149 * 2);
              local_228 = (long)(iVar149 * 2 + 2);
              lVar123 = (long)(iVar149 * 3);
              lVar128 = (long)(iVar149 * 3 + 1);
              local_230 = (ulong)(iVar149 * 3 + 2);
              lVar130 = lVar143 * 5;
              lVar129 = lVar143 * 6;
              local_518 = (int *)(lVar143 * 7);
              uVar144 = 0;
              while( true ) {
                local_458._4_4_ = (uint)((ulong)lVar126 >> 0x20);
                local_458._0_4_ = (uint)lVar126;
                if (iVar167 <= (int)(uVar144 | 3)) break;
                uVar127 = CONCAT44((int)(uVar144 | 1) >> 0x1f,uVar144) | 1;
                uVar140 = CONCAT44((int)(uVar144 | 2) >> 0x1f,uVar144) | 2;
                iVar137 = (int)((long)uVar140 / (long)local_3c8.w);
                local_528._0_4_ = iVar137;
                uVar44 = CONCAT44((int)(uVar144 | 3) >> 0x1f,uVar144) | 3;
                pvVar174 = (void *)((this->weight_data_tm).cstep * uVar172 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                iVar177 = (int)((long)uVar127 % (long)local_3c8.w);
                local_310 = CONCAT44(local_310._4_4_,iVar177);
                iVar261 = (int)((long)uVar140 % (long)local_3c8.w);
                local_598 = (void *)(local_4d8.cstep *
                                    CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize
                                            ));
                lVar126 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                iVar160 = (int)((long)uVar44 % (long)local_3c8.w);
                local_378 = (int *)CONCAT44(local_378._4_4_,iVar160);
                lVar169 = (int)(((int)uVar144 / local_3c8.w) * uVar150) * lVar126;
                lVar168 = (int)((int)((long)uVar127 / (long)local_3c8.w) * uVar150) * lVar126;
                lVar162 = (int)(iVar137 * uVar150) * lVar126;
                lVar126 = (int)((int)((long)uVar44 / (long)local_3c8.w) * uVar150) * lVar126;
                local_500 = (void *)((long)local_4d8.data + iVar177 * iVar135 + lVar168);
                local_580 = (undefined1 (*) [16])
                            ((long)local_4d8.data + iVar160 * iVar135 + lVar126);
                auVar658 = (undefined1  [16])0x0;
                iVar137 = 0;
                iVar262 = 0;
                iVar264 = 0;
                iVar263 = 0;
                auVar702 = (undefined1  [16])0x0;
                auVar737 = (undefined1  [16])0x0;
                pvVar161 = (void *)0x0;
                while (pvVar122 = pvVar161, (int)((uint)pvVar122 | 7) < local_618) {
                  lVar121 = (long)(int)((long)((ulong)(uint)((int)(uint)pvVar122 >> 0x1f) << 0x20 |
                                              (ulong)pvVar122 & 0xffffffff) / (long)iVar164) *
                            (long)local_598;
                  lVar166 = (long)local_4d8.data +
                            lVar121 + ((int)uVar144 % local_3c8.w) * iVar135 + lVar169;
                  lVar139 = (long)local_4d8.data + lVar121 + iVar261 * iVar135 + lVar162;
                  local_528._0_8_ = lVar166;
                  local_578._0_8_ = lVar139;
                  for (lVar158 = 0; lVar125 != lVar158; lVar158 = lVar158 + 4) {
                    lVar170 = (long)*(int *)(opt_q._0_8_ + lVar158);
                    puVar154 = (ulong *)(lVar166 + lVar170);
                    puVar153 = (ulong *)((long)local_500 + lVar170 + lVar121);
                    puVar1 = (ulong *)(lVar139 + lVar170);
                    puVar171 = (ulong *)(*local_580 + lVar170 + lVar121);
                    if (iVar164 == 8) {
                      auVar749._8_6_ = 0;
                      auVar749._0_8_ = *puVar154;
                      auVar771._8_6_ = 0;
                      auVar771._0_8_ = *puVar153;
                      auVar185._8_6_ = 0;
                      auVar185._0_8_ = *puVar1;
                      auVar265._8_6_ = 0;
                      auVar265._0_8_ = *puVar171;
                    }
                    else {
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar154 + lVar143)),8);
                      auVar186 = DAT_00537f60._0_14_;
                      auVar806 = DAT_00537f70._0_14_;
                      auVar268 = DAT_00537f80._0_14_;
                      bVar131 = *(byte *)((long)puVar154 + lVar143 * 4);
                      auVar188 = DAT_00537f90._0_14_;
                      auVar190 = DAT_00537fa0._0_14_;
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar749 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar154 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar154 + lVar129)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar154 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar268 & ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x18 |
                                 ~auVar806 &
                                 ZEXT114(*(byte *)((long)puVar154 + lVar143 * 2)) << 0x10 |
                                 ~auVar186 & auVar528._0_14_ |
                                 ZEXT114((byte)*puVar154) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                      auVar266 = SUB1614(ZEXT416(0xffff00ff),0);
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar153 + lVar143)),8);
                      bVar131 = *(byte *)((long)puVar153 + lVar143 * 4);
                      auVar771 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar153 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar153 + lVar129)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar153 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar268 & ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x18 |
                                 ~auVar806 &
                                 ZEXT114(*(byte *)((long)puVar153 + lVar143 * 2)) << 0x10 |
                                 ~auVar186 & auVar528._0_14_ | ZEXT114((byte)*puVar153) & auVar266)
                                 & auVar689) & auVar270;
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar1 + lVar143)),8);
                      bVar131 = *(byte *)((long)puVar1 + lVar143 * 4);
                      auVar185 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar1 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar1 + lVar129)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar1 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar268 & ZEXT114(*(byte *)((long)puVar1 + lVar180)) << 0x18 |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar1 + lVar143 * 2)) << 0x10
                                 | ~auVar186 & auVar528._0_14_ | ZEXT114((byte)*puVar1) & auVar266)
                                 & auVar689) & auVar270;
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar171 + lVar143)),8);
                      bVar131 = *(byte *)((long)puVar171 + lVar143 * 4);
                      auVar265 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar171 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar171 + lVar129)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar171 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar268 & ZEXT114(*(byte *)((long)puVar171 + lVar180)) << 0x18 |
                                 ~auVar806 &
                                 ZEXT114(*(byte *)((long)puVar171 + lVar143 * 2)) << 0x10 |
                                 ~auVar186 & auVar528._0_14_ | ZEXT114((byte)*puVar171) & auVar266)
                                 & auVar689) & auVar270;
                    }
                    auVar759[0] = auVar749[0];
                    auVar766[0xe] = auVar749[7];
                    auVar766._0_14_ = auVar749;
                    auVar766[0xf] = -(auVar749[7] < '\0');
                    auVar765._14_2_ = auVar766._14_2_;
                    auVar765._0_13_ = auVar749._0_13_;
                    auVar765[0xd] = -(auVar749[6] < '\0');
                    auVar764._13_3_ = auVar765._13_3_;
                    auVar764._0_12_ = auVar749._0_12_;
                    auVar764[0xc] = auVar749[6];
                    auVar763._12_4_ = auVar764._12_4_;
                    auVar763._0_11_ = auVar749._0_11_;
                    auVar763[0xb] = -(auVar749[5] < '\0');
                    auVar762._11_5_ = auVar763._11_5_;
                    auVar762._0_10_ = auVar749._0_10_;
                    auVar762[10] = auVar749[5];
                    auVar761._10_6_ = auVar762._10_6_;
                    auVar761._0_9_ = auVar749._0_9_;
                    auVar761[9] = -(auVar749[4] < '\0');
                    auVar760._9_7_ = auVar761._9_7_;
                    auVar760._0_8_ = auVar749._0_8_;
                    auVar760[8] = auVar749[4];
                    auVar89._4_8_ = auVar760._8_8_;
                    auVar89[3] = -(auVar749[3] < '\0');
                    auVar89[2] = auVar749[3];
                    auVar89[1] = -(auVar749[2] < '\0');
                    auVar89[0] = auVar749[2];
                    auVar759._4_12_ = auVar89;
                    auVar759[3] = -(auVar749[1] < '\0');
                    auVar759[2] = auVar749[1];
                    auVar759[1] = -(auVar759[0] < '\0');
                    auVar779[0] = auVar771[0];
                    auVar786[0xe] = auVar771[7];
                    auVar786._0_14_ = auVar771;
                    auVar786[0xf] = -(auVar771[7] < '\0');
                    auVar785._14_2_ = auVar786._14_2_;
                    auVar785._0_13_ = auVar771._0_13_;
                    auVar785[0xd] = -(auVar771[6] < '\0');
                    auVar784._13_3_ = auVar785._13_3_;
                    auVar784._0_12_ = auVar771._0_12_;
                    auVar784[0xc] = auVar771[6];
                    auVar783._12_4_ = auVar784._12_4_;
                    auVar783._0_11_ = auVar771._0_11_;
                    auVar783[0xb] = -(auVar771[5] < '\0');
                    auVar782._11_5_ = auVar783._11_5_;
                    auVar782._0_10_ = auVar771._0_10_;
                    auVar782[10] = auVar771[5];
                    auVar781._10_6_ = auVar782._10_6_;
                    auVar781._0_9_ = auVar771._0_9_;
                    auVar781[9] = -(auVar771[4] < '\0');
                    auVar780._9_7_ = auVar781._9_7_;
                    auVar780._0_8_ = auVar771._0_8_;
                    auVar780[8] = auVar771[4];
                    auVar90._4_8_ = auVar780._8_8_;
                    auVar90[3] = -(auVar771[3] < '\0');
                    auVar90[2] = auVar771[3];
                    auVar90[1] = -(auVar771[2] < '\0');
                    auVar90[0] = auVar771[2];
                    auVar779._4_12_ = auVar90;
                    auVar779[3] = -(auVar771[1] < '\0');
                    auVar779[2] = auVar771[1];
                    auVar779[1] = -(auVar779[0] < '\0');
                    auVar199[0] = auVar185[0];
                    auVar206[0xe] = auVar185[7];
                    auVar206._0_14_ = auVar185;
                    auVar206[0xf] = -(auVar185[7] < '\0');
                    auVar205._14_2_ = auVar206._14_2_;
                    auVar205._0_13_ = auVar185._0_13_;
                    auVar205[0xd] = -(auVar185[6] < '\0');
                    auVar204._13_3_ = auVar205._13_3_;
                    auVar204._0_12_ = auVar185._0_12_;
                    auVar204[0xc] = auVar185[6];
                    auVar203._12_4_ = auVar204._12_4_;
                    auVar203._0_11_ = auVar185._0_11_;
                    auVar203[0xb] = -(auVar185[5] < '\0');
                    auVar202._11_5_ = auVar203._11_5_;
                    auVar202._0_10_ = auVar185._0_10_;
                    auVar202[10] = auVar185[5];
                    auVar201._10_6_ = auVar202._10_6_;
                    auVar201._0_9_ = auVar185._0_9_;
                    auVar201[9] = -(auVar185[4] < '\0');
                    auVar200._9_7_ = auVar201._9_7_;
                    auVar200._0_8_ = auVar185._0_8_;
                    auVar200[8] = auVar185[4];
                    auVar91._4_8_ = auVar200._8_8_;
                    auVar91[3] = -(auVar185[3] < '\0');
                    auVar91[2] = auVar185[3];
                    auVar91[1] = -(auVar185[2] < '\0');
                    auVar91[0] = auVar185[2];
                    auVar199._4_12_ = auVar91;
                    auVar199[3] = -(auVar185[1] < '\0');
                    auVar199[2] = auVar185[1];
                    auVar199[1] = -(auVar199[0] < '\0');
                    auVar313[0] = auVar265[0];
                    auVar320[0xe] = auVar265[7];
                    auVar320._0_14_ = auVar265;
                    auVar320[0xf] = -(auVar265[7] < '\0');
                    auVar319._14_2_ = auVar320._14_2_;
                    auVar319._0_13_ = auVar265._0_13_;
                    auVar319[0xd] = -(auVar265[6] < '\0');
                    auVar318._13_3_ = auVar319._13_3_;
                    auVar318._0_12_ = auVar265._0_12_;
                    auVar318[0xc] = auVar265[6];
                    auVar317._12_4_ = auVar318._12_4_;
                    auVar317._0_11_ = auVar265._0_11_;
                    auVar317[0xb] = -(auVar265[5] < '\0');
                    auVar316._11_5_ = auVar317._11_5_;
                    auVar316._0_10_ = auVar265._0_10_;
                    auVar316[10] = auVar265[5];
                    auVar315._10_6_ = auVar316._10_6_;
                    auVar315._0_9_ = auVar265._0_9_;
                    auVar315[9] = -(auVar265[4] < '\0');
                    auVar314._9_7_ = auVar315._9_7_;
                    auVar314._0_8_ = auVar265._0_8_;
                    auVar314[8] = auVar265[4];
                    auVar92._4_8_ = auVar314._8_8_;
                    auVar92[3] = -(auVar265[3] < '\0');
                    auVar92[2] = auVar265[3];
                    auVar92[1] = -(auVar265[2] < '\0');
                    auVar92[0] = auVar265[2];
                    auVar313._4_12_ = auVar92;
                    auVar313[3] = -(auVar265[1] < '\0');
                    auVar313[2] = auVar265[1];
                    auVar313[1] = -(auVar313[0] < '\0');
                    auVar528 = *(undefined1 (*) [16])((long)pvVar174 + lVar158 * 8);
                    auVar300 = *(undefined1 (*) [16])((long)pvVar174 + lVar158 * 8 + 0x10);
                    auVar800._0_14_ = auVar528._0_14_;
                    auVar800[0xe] = auVar528[7];
                    auVar800[0xf] = -(auVar528[7] < '\0');
                    auVar799._14_2_ = auVar800._14_2_;
                    auVar799._0_13_ = auVar528._0_13_;
                    auVar799[0xd] = -(auVar528[6] < '\0');
                    auVar798._13_3_ = auVar799._13_3_;
                    auVar798._0_12_ = auVar528._0_12_;
                    auVar798[0xc] = auVar528[6];
                    auVar797._12_4_ = auVar798._12_4_;
                    auVar797._0_11_ = auVar528._0_11_;
                    auVar797[0xb] = -(auVar528[5] < '\0');
                    auVar796._11_5_ = auVar797._11_5_;
                    auVar796._0_10_ = auVar528._0_10_;
                    auVar796[10] = auVar528[5];
                    auVar795._10_6_ = auVar796._10_6_;
                    auVar795._0_9_ = auVar528._0_9_;
                    auVar795[9] = -(auVar528[4] < '\0');
                    auVar794._9_7_ = auVar795._9_7_;
                    auVar794._0_8_ = auVar528._0_8_;
                    auVar794[8] = auVar528[4];
                    auVar793._8_8_ = auVar794._8_8_;
                    auVar793[7] = -(auVar528[3] < '\0');
                    auVar793[6] = auVar528[3];
                    auVar793[5] = -(auVar528[2] < '\0');
                    auVar793[4] = auVar528[2];
                    auVar793[3] = -(auVar528[1] < '\0');
                    auVar793[2] = auVar528[1];
                    auVar793[1] = -(auVar528[0] < '\0');
                    auVar793[0] = auVar528[0];
                    auVar548[1] = -(auVar528[8] < '\0');
                    auVar548[0] = auVar528[8];
                    auVar548[2] = auVar528[9];
                    auVar548[3] = -(auVar528[9] < '\0');
                    auVar548[4] = auVar528[10];
                    auVar548[5] = -(auVar528[10] < '\0');
                    auVar548[6] = auVar528[0xb];
                    auVar548[7] = -(auVar528[0xb] < '\0');
                    auVar548[8] = auVar528[0xc];
                    auVar548[9] = -(auVar528[0xc] < '\0');
                    auVar548[10] = auVar528[0xd];
                    auVar548[0xb] = -(auVar528[0xd] < '\0');
                    auVar548[0xc] = auVar528[0xe];
                    auVar548[0xd] = -(auVar528[0xe] < '\0');
                    auVar548[0xe] = auVar528[0xf];
                    auVar548[0xf] = -(auVar528[0xf] < '\0');
                    auVar445._0_14_ = auVar300._0_14_;
                    auVar445[0xe] = auVar300[7];
                    auVar445[0xf] = -(auVar300[7] < '\0');
                    auVar444._14_2_ = auVar445._14_2_;
                    auVar444._0_13_ = auVar300._0_13_;
                    auVar444[0xd] = -(auVar300[6] < '\0');
                    auVar443._13_3_ = auVar444._13_3_;
                    auVar443._0_12_ = auVar300._0_12_;
                    auVar443[0xc] = auVar300[6];
                    auVar442._12_4_ = auVar443._12_4_;
                    auVar442._0_11_ = auVar300._0_11_;
                    auVar442[0xb] = -(auVar300[5] < '\0');
                    auVar441._11_5_ = auVar442._11_5_;
                    auVar441._0_10_ = auVar300._0_10_;
                    auVar441[10] = auVar300[5];
                    auVar440._10_6_ = auVar441._10_6_;
                    auVar440._0_9_ = auVar300._0_9_;
                    auVar440[9] = -(auVar300[4] < '\0');
                    auVar439._9_7_ = auVar440._9_7_;
                    auVar439._0_8_ = auVar300._0_8_;
                    auVar439[8] = auVar300[4];
                    auVar438._8_8_ = auVar439._8_8_;
                    auVar438[7] = -(auVar300[3] < '\0');
                    auVar438[6] = auVar300[3];
                    auVar438[5] = -(auVar300[2] < '\0');
                    auVar438[4] = auVar300[2];
                    auVar438[3] = -(auVar300[1] < '\0');
                    auVar438[2] = auVar300[1];
                    auVar438[1] = -(auVar300[0] < '\0');
                    auVar438[0] = auVar300[0];
                    auVar627[1] = -(auVar300[8] < '\0');
                    auVar627[0] = auVar300[8];
                    auVar627[2] = auVar300[9];
                    auVar627[3] = -(auVar300[9] < '\0');
                    auVar627[4] = auVar300[10];
                    auVar627[5] = -(auVar300[10] < '\0');
                    auVar627[6] = auVar300[0xb];
                    auVar627[7] = -(auVar300[0xb] < '\0');
                    auVar627[8] = auVar300[0xc];
                    auVar627[9] = -(auVar300[0xc] < '\0');
                    auVar627[10] = auVar300[0xd];
                    auVar627[0xb] = -(auVar300[0xd] < '\0');
                    auVar627[0xc] = auVar300[0xe];
                    auVar627[0xd] = -(auVar300[0xe] < '\0');
                    auVar627[0xe] = auVar300[0xf];
                    auVar627[0xf] = -(auVar300[0xf] < '\0');
                    uVar183 = auVar759._0_4_;
                    uVar769 = auVar89._0_4_;
                    uVar770 = auVar760._8_4_;
                    auVar807._4_4_ = uVar183;
                    auVar807._0_4_ = uVar183;
                    auVar807._8_4_ = uVar183;
                    auVar807._12_4_ = uVar183;
                    auVar808 = pmaddwd(auVar807,auVar793);
                    iVar512 = auVar737._4_4_;
                    iVar544 = auVar737._8_4_;
                    iVar591 = auVar737._12_4_;
                    uVar183 = auVar779._0_4_;
                    uVar789 = auVar90._0_4_;
                    uVar790 = auVar780._8_4_;
                    auVar738._4_4_ = uVar183;
                    auVar738._0_4_ = uVar183;
                    auVar738._8_4_ = uVar183;
                    auVar738._12_4_ = uVar183;
                    auVar739 = pmaddwd(auVar738,auVar793);
                    iVar500 = auVar702._4_4_;
                    iVar510 = auVar702._8_4_;
                    iVar511 = auVar702._12_4_;
                    uVar183 = auVar199._0_4_;
                    uVar259 = auVar91._0_4_;
                    uVar260 = auVar200._8_4_;
                    auVar703._4_4_ = uVar183;
                    auVar703._0_4_ = uVar183;
                    auVar703._8_4_ = uVar183;
                    auVar703._12_4_ = uVar183;
                    auVar704 = pmaddwd(auVar703,auVar793);
                    uVar183 = auVar313._0_4_;
                    uVar405 = auVar92._0_4_;
                    uVar409 = auVar314._8_4_;
                    auVar685._4_4_ = uVar183;
                    auVar685._0_4_ = uVar183;
                    auVar685._8_4_ = uVar183;
                    auVar685._12_4_ = uVar183;
                    auVar686 = pmaddwd(auVar685,auVar793);
                    iVar406 = auVar658._4_4_;
                    iVar410 = auVar658._8_4_;
                    iVar411 = auVar658._12_4_;
                    auVar527._4_4_ = uVar769;
                    auVar527._0_4_ = uVar769;
                    auVar527._8_4_ = uVar769;
                    auVar527._12_4_ = uVar769;
                    auVar528 = pmaddwd(auVar527,auVar548);
                    auVar659._4_4_ = uVar789;
                    auVar659._0_4_ = uVar789;
                    auVar659._8_4_ = uVar789;
                    auVar659._12_4_ = uVar789;
                    auVar425 = pmaddwd(auVar659,auVar548);
                    auVar801._4_4_ = uVar259;
                    auVar801._0_4_ = uVar259;
                    auVar801._8_4_ = uVar259;
                    auVar801._12_4_ = uVar259;
                    auVar802 = pmaddwd(auVar801,auVar548);
                    auVar599._4_4_ = uVar405;
                    auVar599._0_4_ = uVar405;
                    auVar599._8_4_ = uVar405;
                    auVar599._12_4_ = uVar405;
                    auVar600 = pmaddwd(auVar599,auVar548);
                    auVar549._4_4_ = uVar770;
                    auVar549._0_4_ = uVar770;
                    auVar549._8_4_ = uVar770;
                    auVar549._12_4_ = uVar770;
                    auVar550 = pmaddwd(auVar549,auVar438);
                    auVar529._4_4_ = uVar790;
                    auVar529._0_4_ = uVar790;
                    auVar529._8_4_ = uVar790;
                    auVar529._12_4_ = uVar790;
                    auVar300 = pmaddwd(auVar529,auVar438);
                    auVar660._4_4_ = uVar260;
                    auVar660._0_4_ = uVar260;
                    auVar660._8_4_ = uVar260;
                    auVar660._12_4_ = uVar260;
                    auVar661 = pmaddwd(auVar660,auVar438);
                    auVar803._4_4_ = uVar409;
                    auVar803._0_4_ = uVar409;
                    auVar803._8_4_ = uVar409;
                    auVar803._12_4_ = uVar409;
                    auVar804 = pmaddwd(auVar803,auVar438);
                    auVar740._4_4_ = auVar763._12_4_;
                    auVar740._0_4_ = auVar763._12_4_;
                    auVar740._8_4_ = auVar763._12_4_;
                    auVar740._12_4_ = auVar763._12_4_;
                    auVar741 = pmaddwd(auVar740,auVar627);
                    auVar737._0_4_ =
                         auVar741._0_4_ +
                         auVar550._0_4_ + auVar528._0_4_ + auVar808._0_4_ + auVar737._0_4_;
                    auVar737._4_4_ =
                         auVar741._4_4_ + auVar550._4_4_ + auVar528._4_4_ + auVar808._4_4_ + iVar512
                    ;
                    auVar737._8_4_ =
                         auVar741._8_4_ + auVar550._8_4_ + auVar528._8_4_ + auVar808._8_4_ + iVar544
                    ;
                    auVar737._12_4_ =
                         auVar741._12_4_ +
                         auVar550._12_4_ + auVar528._12_4_ + auVar808._12_4_ + iVar591;
                    auVar705._4_4_ = auVar783._12_4_;
                    auVar705._0_4_ = auVar783._12_4_;
                    auVar705._8_4_ = auVar783._12_4_;
                    auVar705._12_4_ = auVar783._12_4_;
                    auVar528 = pmaddwd(auVar705,auVar627);
                    auVar702._0_4_ =
                         auVar528._0_4_ +
                         auVar300._0_4_ + auVar425._0_4_ + auVar739._0_4_ + auVar702._0_4_;
                    auVar702._4_4_ =
                         auVar528._4_4_ + auVar300._4_4_ + auVar425._4_4_ + auVar739._4_4_ + iVar500
                    ;
                    auVar702._8_4_ =
                         auVar528._8_4_ + auVar300._8_4_ + auVar425._8_4_ + auVar739._8_4_ + iVar510
                    ;
                    auVar702._12_4_ =
                         auVar528._12_4_ +
                         auVar300._12_4_ + auVar425._12_4_ + auVar739._12_4_ + iVar511;
                    auVar687._4_4_ = auVar203._12_4_;
                    auVar687._0_4_ = auVar203._12_4_;
                    auVar687._8_4_ = auVar203._12_4_;
                    auVar687._12_4_ = auVar203._12_4_;
                    auVar528 = pmaddwd(auVar687,auVar627);
                    iVar137 = auVar528._0_4_ +
                              auVar661._0_4_ + auVar802._0_4_ + auVar704._0_4_ + iVar137;
                    iVar262 = auVar528._4_4_ +
                              auVar661._4_4_ + auVar802._4_4_ + auVar704._4_4_ + iVar262;
                    iVar264 = auVar528._8_4_ +
                              auVar661._8_4_ + auVar802._8_4_ + auVar704._8_4_ + iVar264;
                    iVar263 = auVar528._12_4_ +
                              auVar661._12_4_ + auVar802._12_4_ + auVar704._12_4_ + iVar263;
                    auVar662._4_4_ = auVar317._12_4_;
                    auVar662._0_4_ = auVar317._12_4_;
                    auVar662._8_4_ = auVar317._12_4_;
                    auVar662._12_4_ = auVar317._12_4_;
                    auVar528 = pmaddwd(auVar662,auVar627);
                    auVar658._0_4_ =
                         auVar528._0_4_ +
                         auVar804._0_4_ + auVar600._0_4_ + auVar686._0_4_ + auVar658._0_4_;
                    auVar658._4_4_ =
                         auVar528._4_4_ + auVar804._4_4_ + auVar600._4_4_ + auVar686._4_4_ + iVar406
                    ;
                    auVar658._8_4_ =
                         auVar528._8_4_ + auVar804._8_4_ + auVar600._8_4_ + auVar686._8_4_ + iVar410
                    ;
                    auVar658._12_4_ =
                         auVar528._12_4_ +
                         auVar804._12_4_ + auVar600._12_4_ + auVar686._12_4_ + iVar411;
                  }
                  pvVar174 = (void *)((long)pvVar174 + local_488._0_8_);
                  local_4f8 = pvVar122;
                  pvVar161 = (void *)((long)pvVar122 + 8);
                }
                local_4e8._0_8_ =
                     (long)local_4d8.data + ((int)uVar144 % local_3c8.w) * uVar151 + lVar169;
                local_558._0_8_ = (long)local_4d8.data + iVar177 * uVar151 + lVar168;
                local_448._0_8_ = (long)local_4d8.data + iVar261 * uVar151 + lVar162;
                lVar126 = (long)local_4d8.data + iVar160 * uVar151 + lVar126;
                for (; (long)((ulong)pvVar122 | 1) < lVar142;
                    pvVar122 = (void *)((long)pvVar122 + 2)) {
                  lVar169 = (long)pvVar122 * (long)local_598;
                  for (uVar127 = 0; uVar178 != uVar127; uVar127 = uVar127 + 1) {
                    lVar162 = (long)*(int *)(opt_q._0_8_ + uVar127 * 4);
                    uVar179 = (uint)*(byte *)(lVar143 + local_4e8._0_8_ + lVar169 + lVar162) << 0x18
                              | (uint)*(byte *)(local_4e8._0_8_ + lVar169 + lVar162) << 8;
                    auVar207._4_4_ = uVar179;
                    auVar207._0_4_ = uVar179;
                    auVar207._8_4_ = uVar179;
                    auVar207._12_4_ = uVar179;
                    auVar528 = psraw(auVar207,8);
                    uVar179 = (uint)*(byte *)(lVar143 + local_558._0_8_ + lVar169 + lVar162) << 0x18
                              | (uint)*(byte *)(local_558._0_8_ + lVar169 + lVar162) << 8;
                    auVar321._4_4_ = uVar179;
                    auVar321._0_4_ = uVar179;
                    auVar321._8_4_ = uVar179;
                    auVar321._12_4_ = uVar179;
                    auVar300 = psraw(auVar321,8);
                    uVar179 = (uint)*(byte *)(lVar143 + local_448._0_8_ + lVar169 + lVar162) << 0x18
                              | (uint)*(byte *)(local_448._0_8_ + lVar169 + lVar162) << 8;
                    auVar446._4_4_ = uVar179;
                    auVar446._0_4_ = uVar179;
                    auVar446._8_4_ = uVar179;
                    auVar446._12_4_ = uVar179;
                    auVar550 = psraw(auVar446,8);
                    uVar179 = (uint)*(byte *)(lVar143 + lVar169 + lVar126 + lVar162) << 0x18 |
                              (uint)*(byte *)(lVar169 + lVar126 + lVar162) << 8;
                    auVar530._4_4_ = uVar179;
                    auVar530._0_4_ = uVar179;
                    auVar530._8_4_ = uVar179;
                    auVar530._12_4_ = uVar179;
                    auVar600 = psraw(auVar530,8);
                    uVar140 = *(ulong *)((long)pvVar174 + uVar127 * 8);
                    auVar551[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar558._8_6_ = 0;
                    auVar558._0_8_ = uVar140;
                    auVar558[0xe] = (char)(uVar140 >> 0x38);
                    auVar558[0xf] = -((long)uVar140 < 0);
                    auVar557._14_2_ = auVar558._14_2_;
                    auVar557._8_5_ = 0;
                    auVar557._0_8_ = uVar140;
                    auVar557[0xd] = -(cVar408 < '\0');
                    auVar556._13_3_ = auVar557._13_3_;
                    auVar556._8_4_ = 0;
                    auVar556._0_8_ = uVar140;
                    auVar556[0xc] = cVar408;
                    auVar555._12_4_ = auVar556._12_4_;
                    auVar555._8_3_ = 0;
                    auVar555._0_8_ = uVar140;
                    auVar555[0xb] = -(cVar407 < '\0');
                    auVar554._11_5_ = auVar555._11_5_;
                    auVar554._8_2_ = 0;
                    auVar554._0_8_ = uVar140;
                    auVar554[10] = cVar407;
                    auVar553._10_6_ = auVar554._10_6_;
                    auVar553[8] = 0;
                    auVar553._0_8_ = uVar140;
                    auVar553[9] = -(cVar404 < '\0');
                    auVar552._9_7_ = auVar553._9_7_;
                    auVar552[8] = cVar404;
                    auVar552._0_8_ = uVar140;
                    auVar551._8_8_ = auVar552._8_8_;
                    auVar551[7] = -(cVar403 < '\0');
                    auVar551[6] = cVar403;
                    auVar551[5] = -(cVar402 < '\0');
                    auVar551[4] = cVar402;
                    auVar551[3] = -(cVar401 < '\0');
                    auVar551[2] = cVar401;
                    auVar551[1] = -(auVar551[0] < '\0');
                    auVar528 = pmaddwd(auVar528,auVar551);
                    auVar742._0_4_ = auVar737._0_4_ + auVar528._0_4_;
                    auVar742._4_4_ = auVar737._4_4_ + auVar528._4_4_;
                    auVar742._8_4_ = auVar737._8_4_ + auVar528._8_4_;
                    auVar742._12_4_ = auVar737._12_4_ + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar300,auVar551);
                    auVar706._0_4_ = auVar702._0_4_ + auVar528._0_4_;
                    auVar706._4_4_ = auVar702._4_4_ + auVar528._4_4_;
                    auVar706._8_4_ = auVar702._8_4_ + auVar528._8_4_;
                    auVar706._12_4_ = auVar702._12_4_ + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar550,auVar551);
                    iVar137 = iVar137 + auVar528._0_4_;
                    iVar262 = iVar262 + auVar528._4_4_;
                    iVar264 = iVar264 + auVar528._8_4_;
                    iVar263 = iVar263 + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar551,auVar600);
                    auVar663._0_4_ = auVar658._0_4_ + auVar528._0_4_;
                    auVar663._4_4_ = auVar658._4_4_ + auVar528._4_4_;
                    auVar663._8_4_ = auVar658._8_4_ + auVar528._8_4_;
                    auVar663._12_4_ = auVar658._12_4_ + auVar528._12_4_;
                    auVar658 = auVar663;
                    auVar702 = auVar706;
                    auVar737 = auVar742;
                  }
                  pvVar174 = (void *)((long)pvVar174 + (long)local_530);
                }
                for (; (long)pvVar122 < lVar142; pvVar122 = (void *)((long)pvVar122 + 1)) {
                  lVar169 = (long)pvVar122 * (long)local_598;
                  for (uVar127 = 0; uVar178 != uVar127; uVar127 = uVar127 + 1) {
                    lVar162 = (long)*(int *)(opt_q._0_8_ + uVar127 * 4);
                    auVar528 = ZEXT416((uint)(int)*(char *)(local_4e8._0_8_ + lVar169 + lVar162));
                    auVar528 = pshuflw(auVar528,auVar528,0);
                    auVar208._0_4_ = auVar528._0_4_;
                    auVar208._4_4_ = auVar208._0_4_;
                    auVar208._8_4_ = auVar208._0_4_;
                    auVar208._12_4_ = auVar208._0_4_;
                    auVar300 = ZEXT416((uint)(int)*(char *)(local_558._0_8_ + lVar169 + lVar162));
                    auVar550 = pshuflw(auVar300,auVar300,0);
                    auVar322._0_4_ = auVar550._0_4_;
                    auVar322._4_4_ = auVar322._0_4_;
                    auVar322._8_4_ = auVar322._0_4_;
                    auVar322._12_4_ = auVar322._0_4_;
                    auVar300 = ZEXT416((uint)(int)*(char *)(local_448._0_8_ + lVar169 + lVar162));
                    auVar425 = pshuflw(auVar300,auVar300,0);
                    auVar447._0_4_ = auVar425._0_4_;
                    auVar447._4_4_ = auVar447._0_4_;
                    auVar447._8_4_ = auVar447._0_4_;
                    auVar447._12_4_ = auVar447._0_4_;
                    auVar300 = ZEXT416((uint)(int)*(char *)(lVar169 + lVar126 + lVar162));
                    auVar686 = pshuflw(auVar300,auVar300,0);
                    auVar531._0_4_ = auVar686._0_4_;
                    auVar531._4_4_ = auVar531._0_4_;
                    auVar531._8_4_ = auVar531._0_4_;
                    auVar531._12_4_ = auVar531._0_4_;
                    uVar140 = *(ulong *)((long)pvVar174 + uVar127 * 4);
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar566._8_6_ = 0;
                    auVar566._0_8_ = uVar140;
                    auVar566[0xe] = (char)(uVar140 >> 0x38);
                    auVar566[0xf] = -((long)uVar140 < 0);
                    auVar565._14_2_ = auVar566._14_2_;
                    auVar565._8_5_ = 0;
                    auVar565._0_8_ = uVar140;
                    auVar565[0xd] = -(cVar408 < '\0');
                    auVar564._13_3_ = auVar565._13_3_;
                    auVar564._8_4_ = 0;
                    auVar564._0_8_ = uVar140;
                    auVar564[0xc] = cVar408;
                    auVar563._12_4_ = auVar564._12_4_;
                    auVar563._8_3_ = 0;
                    auVar563._0_8_ = uVar140;
                    auVar563[0xb] = -(cVar407 < '\0');
                    auVar562._11_5_ = auVar563._11_5_;
                    auVar562._8_2_ = 0;
                    auVar562._0_8_ = uVar140;
                    auVar562[10] = cVar407;
                    auVar561._10_6_ = auVar562._10_6_;
                    auVar561[8] = 0;
                    auVar561._0_8_ = uVar140;
                    auVar561[9] = -(cVar404 < '\0');
                    auVar560._9_7_ = auVar561._9_7_;
                    auVar560[8] = cVar404;
                    auVar560._0_8_ = uVar140;
                    Var95 = CONCAT91(CONCAT81(auVar560._8_8_,-(cVar403 < '\0')),cVar403);
                    auVar94._2_10_ = Var95;
                    auVar94[1] = -(cVar402 < '\0');
                    auVar94[0] = cVar402;
                    auVar93._2_12_ = auVar94;
                    auVar93[1] = -(cVar401 < '\0');
                    auVar93[0] = cVar401;
                    auVar559._0_2_ = CONCAT11(-((char)uVar140 < '\0'),(char)uVar140);
                    auVar559._2_14_ = auVar93;
                    sVar148 = auVar93._0_2_;
                    sVar176 = auVar94._0_2_;
                    sVar497 = (short)Var95;
                    sVar622 = auVar528._2_2_ * sVar497;
                    auVar300 = pmulhw(auVar208,auVar559);
                    iVar160 = CONCAT22(auVar300._6_2_,sVar622);
                    Var95 = CONCAT64(CONCAT42(iVar160,auVar300._4_2_),
                                     CONCAT22(auVar528._0_2_ * sVar176,sVar622));
                    auVar96._4_8_ = (long)((unkuint10)Var95 >> 0x10);
                    auVar96._2_2_ = auVar300._2_2_;
                    auVar96._0_2_ = auVar528._2_2_ * sVar148;
                    sVar622 = auVar550._2_2_ * sVar497;
                    auVar600 = pmulhw(auVar322,auVar559);
                    iVar177 = CONCAT22(auVar600._6_2_,sVar622);
                    Var113 = CONCAT64(CONCAT42(iVar177,auVar600._4_2_),
                                      CONCAT22(auVar550._0_2_ * sVar176,sVar622));
                    auVar97._4_8_ = (long)((unkuint10)Var113 >> 0x10);
                    auVar97._2_2_ = auVar600._2_2_;
                    auVar97._0_2_ = auVar550._2_2_ * sVar148;
                    sVar622 = auVar425._2_2_ * sVar497;
                    auVar661 = pmulhw(auVar447,auVar559);
                    iVar261 = CONCAT22(auVar661._6_2_,sVar622);
                    Var114 = CONCAT64(CONCAT42(iVar261,auVar661._4_2_),
                                      CONCAT22(auVar425._0_2_ * sVar176,sVar622));
                    auVar98._4_8_ = (long)((unkuint10)Var114 >> 0x10);
                    auVar98._2_2_ = auVar661._2_2_;
                    auVar98._0_2_ = auVar425._2_2_ * sVar148;
                    sVar497 = auVar686._2_2_ * sVar497;
                    auVar704 = pmulhw(auVar559,auVar531);
                    iVar406 = CONCAT22(auVar704._6_2_,sVar497);
                    Var115 = CONCAT64(CONCAT42(iVar406,auVar704._4_2_),
                                      CONCAT22(auVar686._0_2_ * sVar176,sVar497));
                    auVar99._4_8_ = (long)((unkuint10)Var115 >> 0x10);
                    auVar99._2_2_ = auVar704._2_2_;
                    auVar99._0_2_ = auVar686._2_2_ * sVar148;
                    auVar743._0_4_ =
                         auVar737._0_4_ + CONCAT22(auVar300._0_2_,auVar528._0_2_ * auVar559._0_2_);
                    auVar743._4_4_ = auVar737._4_4_ + auVar96._0_4_;
                    auVar743._8_4_ = auVar737._8_4_ + (int)((unkuint10)Var95 >> 0x10);
                    auVar743._12_4_ = auVar737._12_4_ + iVar160;
                    auVar707._0_4_ =
                         auVar702._0_4_ + CONCAT22(auVar600._0_2_,auVar550._0_2_ * auVar559._0_2_);
                    auVar707._4_4_ = auVar702._4_4_ + auVar97._0_4_;
                    auVar707._8_4_ = auVar702._8_4_ + (int)((unkuint10)Var113 >> 0x10);
                    auVar707._12_4_ = auVar702._12_4_ + iVar177;
                    iVar137 = iVar137 + CONCAT22(auVar661._0_2_,auVar425._0_2_ * auVar559._0_2_);
                    iVar262 = iVar262 + auVar98._0_4_;
                    iVar264 = iVar264 + (int)((unkuint10)Var114 >> 0x10);
                    iVar263 = iVar263 + iVar261;
                    auVar664._0_4_ =
                         auVar658._0_4_ + CONCAT22(auVar704._0_2_,auVar686._0_2_ * auVar559._0_2_);
                    auVar664._4_4_ = auVar658._4_4_ + auVar99._0_4_;
                    auVar664._8_4_ = auVar658._8_4_ + (int)((unkuint10)Var115 >> 0x10);
                    auVar664._12_4_ = auVar658._12_4_ + iVar406;
                    auVar658 = auVar664;
                    auVar702 = auVar707;
                    auVar737 = auVar743;
                  }
                  pvVar174 = (void *)((long)pvVar174 + lVar125);
                }
                if ((int)local_538 == 1) {
                  *(ulong *)*local_5e0 = CONCAT44(auVar702._0_4_,auVar737._0_4_);
                  *(ulong *)((long)*local_5e0 + 8) = CONCAT44(auVar658._0_4_,iVar137);
                  *(int *)((long)*local_5e0 + local_380 * 4) = auVar737._4_4_;
                  *(int *)((long)*local_5e0 + (long)local_318 * 4) = auVar702._4_4_;
                  *(int *)((long)*local_5e0 + local_218 * 4) = iVar262;
                  *(int *)((long)*local_5e0 + local_220 * 4) = auVar658._4_4_;
                  *(ulong *)((long)*local_5e0 + lVar141 * 4) =
                       CONCAT44(auVar702._8_4_,auVar737._8_4_);
                  piVar134 = (int *)((long)*local_5e0 + local_228 * 4);
                  *piVar134 = iVar264;
                  piVar134[1] = auVar658._8_4_;
                  *(int *)((long)*local_5e0 + lVar123 * 4) = auVar737._12_4_;
                  *(int *)((long)*local_5e0 + lVar128 * 4) = auVar702._12_4_;
                  *(int *)((long)*local_5e0 + local_230 * 4) = iVar263;
                  *(int *)((long)*local_5e0 + (long)(iVar149 * 3 + 3) * 4) = auVar658._12_4_;
                  local_5e0 = local_5e0 + 1;
                }
                else if ((int)local_538 == 4) {
                  *local_5e0 = auVar737;
                  local_5e0[1] = auVar702;
                  *(int *)local_5e0[2] = iVar137;
                  *(int *)(local_5e0[2] + 4) = iVar262;
                  *(int *)(local_5e0[2] + 8) = iVar264;
                  *(int *)(local_5e0[2] + 0xc) = iVar263;
                  local_5e0[3] = auVar658;
                  local_5e0 = local_5e0 + 4;
                }
                uVar144 = uVar144 + 4;
              }
              for (; (int)(uVar144 | 1) < iVar167; uVar144 = uVar144 + 2) {
                iVar149 = (int)uVar144 % local_3c8.w;
                uVar127 = CONCAT44((int)(uVar144 | 1) >> 0x1f,uVar144) | 1;
                pvVar161 = (void *)((this->weight_data_tm).cstep * uVar172 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                local_448._0_4_ = iVar149;
                lVar166 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                local_528._0_8_ = lVar166;
                lVar162 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                local_458._0_4_ = (uint)((long)uVar127 % (long)local_3c8.w);
                lVar168 = (int)(((int)uVar144 / local_3c8.w) * uVar150) * lVar162;
                lVar162 = (int)((int)((long)uVar127 / (long)local_3c8.w) * uVar150) * lVar162;
                lVar169 = (long)local_4d8.data + iVar149 * iVar135 + lVar168;
                local_4e8._0_8_ = lVar169;
                lVar126 = (long)local_4d8.data + (int)((uint)local_458 * iVar135) + lVar162;
                local_558._0_8_ = lVar126;
                auVar708 = (undefined1  [16])0x0;
                auVar744 = (undefined1  [16])0x0;
                iVar137 = 0;
                iVar160 = 0;
                iVar177 = 0;
                iVar261 = 0;
                iVar262 = 0;
                iVar264 = 0;
                iVar263 = 0;
                iVar406 = 0;
                for (uVar127 = 0; (int)((uint)uVar127 | 7) < local_618; uVar127 = uVar127 + 8) {
                  lVar121 = (int)((long)((ulong)(uint)((int)(uint)uVar127 >> 0x1f) << 0x20 |
                                        uVar127 & 0xffffffff) / (long)iVar164) * lVar166;
                  for (lVar139 = 0; lVar125 != lVar139; lVar139 = lVar139 + 4) {
                    puVar154 = (ulong *)(lVar169 + lVar121 + (long)*(int *)(opt_q._0_8_ + lVar139));
                    puVar153 = (ulong *)((long)*(int *)(opt_q._0_8_ + lVar139) + lVar121 + lVar126);
                    if (iVar164 == 8) {
                      auVar186._8_6_ = 0;
                      auVar186._0_8_ = *puVar154;
                      auVar266._8_6_ = 0;
                      auVar266._0_8_ = *puVar153;
                    }
                    else {
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar154 + lVar143)),8);
                      bVar131 = *(byte *)((long)puVar154 + lVar143 * 4);
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar186 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar154 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar154 + lVar129)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar154 + lVar130)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + lVar143 * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar528._0_14_ |
                                 ZEXT114((byte)*puVar154) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                      auVar528 = psllw(ZEXT116(*(byte *)((long)puVar153 + lVar143)),8);
                      bVar131 = *(byte *)((long)puVar153 + lVar143 * 4);
                      auVar266 = ~auVar270 &
                                 ZEXT114(*(byte *)((long)puVar153 + (long)local_518)) << 0x38 |
                                 (~auVar689 & ZEXT114(*(byte *)((long)puVar153 + lVar129)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar153 + lVar130)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + lVar143 * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar528._0_14_ |
                                 ZEXT114((byte)*puVar153) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                    }
                    auVar209[0] = auVar186[0];
                    auVar216[0xe] = auVar186[7];
                    auVar216._0_14_ = auVar186;
                    auVar216[0xf] = -(auVar186[7] < '\0');
                    auVar215._14_2_ = auVar216._14_2_;
                    auVar215._0_13_ = auVar186._0_13_;
                    auVar215[0xd] = -(auVar186[6] < '\0');
                    auVar214._13_3_ = auVar215._13_3_;
                    auVar214._0_12_ = auVar186._0_12_;
                    auVar214[0xc] = auVar186[6];
                    auVar213._12_4_ = auVar214._12_4_;
                    auVar213._0_11_ = auVar186._0_11_;
                    auVar213[0xb] = -(auVar186[5] < '\0');
                    auVar212._11_5_ = auVar213._11_5_;
                    auVar212._0_10_ = auVar186._0_10_;
                    auVar212[10] = auVar186[5];
                    auVar211._10_6_ = auVar212._10_6_;
                    auVar211._0_9_ = auVar186._0_9_;
                    auVar211[9] = -(auVar186[4] < '\0');
                    auVar210._9_7_ = auVar211._9_7_;
                    auVar210._0_8_ = auVar186._0_8_;
                    auVar210[8] = auVar186[4];
                    auVar100._4_8_ = auVar210._8_8_;
                    auVar100[3] = -(auVar186[3] < '\0');
                    auVar100[2] = auVar186[3];
                    auVar100[1] = -(auVar186[2] < '\0');
                    auVar100[0] = auVar186[2];
                    auVar209._4_12_ = auVar100;
                    auVar209[3] = -(auVar186[1] < '\0');
                    auVar209[2] = auVar186[1];
                    auVar209[1] = -(auVar209[0] < '\0');
                    auVar323[0] = auVar266[0];
                    auVar330[0xe] = auVar266[7];
                    auVar330._0_14_ = auVar266;
                    auVar330[0xf] = -(auVar266[7] < '\0');
                    auVar329._14_2_ = auVar330._14_2_;
                    auVar329._0_13_ = auVar266._0_13_;
                    auVar329[0xd] = -(auVar266[6] < '\0');
                    auVar328._13_3_ = auVar329._13_3_;
                    auVar328._0_12_ = auVar266._0_12_;
                    auVar328[0xc] = auVar266[6];
                    auVar327._12_4_ = auVar328._12_4_;
                    auVar327._0_11_ = auVar266._0_11_;
                    auVar327[0xb] = -(auVar266[5] < '\0');
                    auVar326._11_5_ = auVar327._11_5_;
                    auVar326._0_10_ = auVar266._0_10_;
                    auVar326[10] = auVar266[5];
                    auVar325._10_6_ = auVar326._10_6_;
                    auVar325._0_9_ = auVar266._0_9_;
                    auVar325[9] = -(auVar266[4] < '\0');
                    auVar324._9_7_ = auVar325._9_7_;
                    auVar324._0_8_ = auVar266._0_8_;
                    auVar324[8] = auVar266[4];
                    auVar101._4_8_ = auVar324._8_8_;
                    auVar101[3] = -(auVar266[3] < '\0');
                    auVar101[2] = auVar266[3];
                    auVar101[1] = -(auVar266[2] < '\0');
                    auVar101[0] = auVar266[2];
                    auVar323._4_12_ = auVar101;
                    auVar323[3] = -(auVar266[1] < '\0');
                    auVar323[2] = auVar266[1];
                    auVar323[1] = -(auVar323[0] < '\0');
                    auVar528 = *(undefined1 (*) [16])((long)pvVar161 + lVar139 * 8);
                    auVar300 = *(undefined1 (*) [16])((long)pvVar161 + lVar139 * 8 + 0x10);
                    auVar635._0_14_ = auVar528._0_14_;
                    auVar635[0xe] = auVar528[7];
                    auVar635[0xf] = -(auVar528[7] < '\0');
                    auVar634._14_2_ = auVar635._14_2_;
                    auVar634._0_13_ = auVar528._0_13_;
                    auVar634[0xd] = -(auVar528[6] < '\0');
                    auVar633._13_3_ = auVar634._13_3_;
                    auVar633._0_12_ = auVar528._0_12_;
                    auVar633[0xc] = auVar528[6];
                    auVar632._12_4_ = auVar633._12_4_;
                    auVar632._0_11_ = auVar528._0_11_;
                    auVar632[0xb] = -(auVar528[5] < '\0');
                    auVar631._11_5_ = auVar632._11_5_;
                    auVar631._0_10_ = auVar528._0_10_;
                    auVar631[10] = auVar528[5];
                    auVar630._10_6_ = auVar631._10_6_;
                    auVar630._0_9_ = auVar528._0_9_;
                    auVar630[9] = -(auVar528[4] < '\0');
                    auVar629._9_7_ = auVar630._9_7_;
                    auVar629._0_8_ = auVar528._0_8_;
                    auVar629[8] = auVar528[4];
                    auVar628._8_8_ = auVar629._8_8_;
                    auVar628[7] = -(auVar528[3] < '\0');
                    auVar628[6] = auVar528[3];
                    auVar628[5] = -(auVar528[2] < '\0');
                    auVar628[4] = auVar528[2];
                    auVar628[3] = -(auVar528[1] < '\0');
                    auVar628[2] = auVar528[1];
                    auVar628[1] = -(auVar528[0] < '\0');
                    auVar628[0] = auVar528[0];
                    auVar532[1] = -(auVar528[8] < '\0');
                    auVar532[0] = auVar528[8];
                    auVar532[2] = auVar528[9];
                    auVar532[3] = -(auVar528[9] < '\0');
                    auVar532[4] = auVar528[10];
                    auVar532[5] = -(auVar528[10] < '\0');
                    auVar532[6] = auVar528[0xb];
                    auVar532[7] = -(auVar528[0xb] < '\0');
                    auVar532[8] = auVar528[0xc];
                    auVar532[9] = -(auVar528[0xc] < '\0');
                    auVar532[10] = auVar528[0xd];
                    auVar532[0xb] = -(auVar528[0xd] < '\0');
                    auVar532[0xc] = auVar528[0xe];
                    auVar532[0xd] = -(auVar528[0xe] < '\0');
                    auVar532[0xe] = auVar528[0xf];
                    auVar532[0xf] = -(auVar528[0xf] < '\0');
                    auVar574._0_14_ = auVar300._0_14_;
                    auVar574[0xe] = auVar300[7];
                    auVar574[0xf] = -(auVar300[7] < '\0');
                    auVar573._14_2_ = auVar574._14_2_;
                    auVar573._0_13_ = auVar300._0_13_;
                    auVar573[0xd] = -(auVar300[6] < '\0');
                    auVar572._13_3_ = auVar573._13_3_;
                    auVar572._0_12_ = auVar300._0_12_;
                    auVar572[0xc] = auVar300[6];
                    auVar571._12_4_ = auVar572._12_4_;
                    auVar571._0_11_ = auVar300._0_11_;
                    auVar571[0xb] = -(auVar300[5] < '\0');
                    auVar570._11_5_ = auVar571._11_5_;
                    auVar570._0_10_ = auVar300._0_10_;
                    auVar570[10] = auVar300[5];
                    auVar569._10_6_ = auVar570._10_6_;
                    auVar569._0_9_ = auVar300._0_9_;
                    auVar569[9] = -(auVar300[4] < '\0');
                    auVar568._9_7_ = auVar569._9_7_;
                    auVar568._0_8_ = auVar300._0_8_;
                    auVar568[8] = auVar300[4];
                    auVar567._8_8_ = auVar568._8_8_;
                    auVar567[7] = -(auVar300[3] < '\0');
                    auVar567[6] = auVar300[3];
                    auVar567[5] = -(auVar300[2] < '\0');
                    auVar567[4] = auVar300[2];
                    auVar567[3] = -(auVar300[1] < '\0');
                    auVar567[2] = auVar300[1];
                    auVar567[1] = -(auVar300[0] < '\0');
                    auVar567[0] = auVar300[0];
                    auVar448[1] = -(auVar300[8] < '\0');
                    auVar448[0] = auVar300[8];
                    auVar448[2] = auVar300[9];
                    auVar448[3] = -(auVar300[9] < '\0');
                    auVar448[4] = auVar300[10];
                    auVar448[5] = -(auVar300[10] < '\0');
                    auVar448[6] = auVar300[0xb];
                    auVar448[7] = -(auVar300[0xb] < '\0');
                    auVar448[8] = auVar300[0xc];
                    auVar448[9] = -(auVar300[0xc] < '\0');
                    auVar448[10] = auVar300[0xd];
                    auVar448[0xb] = -(auVar300[0xd] < '\0');
                    auVar448[0xc] = auVar300[0xe];
                    auVar448[0xd] = -(auVar300[0xe] < '\0');
                    auVar448[0xe] = auVar300[0xf];
                    auVar448[0xf] = -(auVar300[0xf] < '\0');
                    uVar183 = auVar209._0_4_;
                    uVar259 = auVar100._0_4_;
                    uVar260 = auVar210._8_4_;
                    auVar601._4_4_ = uVar183;
                    auVar601._0_4_ = uVar183;
                    auVar601._8_4_ = uVar183;
                    auVar601._12_4_ = uVar183;
                    auVar528 = pmaddwd(auVar601,auVar628);
                    uVar183 = auVar323._0_4_;
                    uVar405 = auVar101._0_4_;
                    uVar409 = auVar324._8_4_;
                    auVar767._4_4_ = uVar183;
                    auVar767._0_4_ = uVar183;
                    auVar767._8_4_ = uVar183;
                    auVar767._12_4_ = uVar183;
                    auVar600 = pmaddwd(auVar767,auVar628);
                    auVar636._4_4_ = uVar259;
                    auVar636._0_4_ = uVar259;
                    auVar636._8_4_ = uVar259;
                    auVar636._12_4_ = uVar259;
                    auVar300 = pmaddwd(auVar636,auVar532);
                    iVar510 = auVar744._4_4_;
                    iVar511 = auVar744._8_4_;
                    iVar512 = auVar744._12_4_;
                    auVar787._4_4_ = uVar405;
                    auVar787._0_4_ = uVar405;
                    auVar787._8_4_ = uVar405;
                    auVar787._12_4_ = uVar405;
                    auVar425 = pmaddwd(auVar787,auVar532);
                    iVar410 = auVar708._4_4_;
                    iVar411 = auVar708._8_4_;
                    iVar500 = auVar708._12_4_;
                    auVar688._4_4_ = uVar260;
                    auVar688._0_4_ = uVar260;
                    auVar688._8_4_ = uVar260;
                    auVar688._12_4_ = uVar260;
                    auVar550 = pmaddwd(auVar688,auVar567);
                    iVar262 = auVar550._0_4_ + auVar528._0_4_ + iVar262;
                    iVar264 = auVar550._4_4_ + auVar528._4_4_ + iVar264;
                    iVar263 = auVar550._8_4_ + auVar528._8_4_ + iVar263;
                    iVar406 = auVar550._12_4_ + auVar528._12_4_ + iVar406;
                    auVar665._4_4_ = uVar409;
                    auVar665._0_4_ = uVar409;
                    auVar665._8_4_ = uVar409;
                    auVar665._12_4_ = uVar409;
                    auVar528 = pmaddwd(auVar665,auVar567);
                    iVar137 = auVar528._0_4_ + auVar600._0_4_ + iVar137;
                    iVar160 = auVar528._4_4_ + auVar600._4_4_ + iVar160;
                    iVar177 = auVar528._8_4_ + auVar600._8_4_ + iVar177;
                    iVar261 = auVar528._12_4_ + auVar600._12_4_ + iVar261;
                    auVar745._4_4_ = auVar213._12_4_;
                    auVar745._0_4_ = auVar213._12_4_;
                    auVar745._8_4_ = auVar213._12_4_;
                    auVar745._12_4_ = auVar213._12_4_;
                    auVar528 = pmaddwd(auVar745,auVar448);
                    auVar744._0_4_ = auVar528._0_4_ + auVar300._0_4_ + auVar744._0_4_;
                    auVar744._4_4_ = auVar528._4_4_ + auVar300._4_4_ + iVar510;
                    auVar744._8_4_ = auVar528._8_4_ + auVar300._8_4_ + iVar511;
                    auVar744._12_4_ = auVar528._12_4_ + auVar300._12_4_ + iVar512;
                    auVar709._4_4_ = auVar327._12_4_;
                    auVar709._0_4_ = auVar327._12_4_;
                    auVar709._8_4_ = auVar327._12_4_;
                    auVar709._12_4_ = auVar327._12_4_;
                    auVar528 = pmaddwd(auVar709,auVar448);
                    auVar708._0_4_ = auVar528._0_4_ + auVar425._0_4_ + auVar708._0_4_;
                    auVar708._4_4_ = auVar528._4_4_ + auVar425._4_4_ + iVar410;
                    auVar708._8_4_ = auVar528._8_4_ + auVar425._8_4_ + iVar411;
                    auVar708._12_4_ = auVar528._12_4_ + auVar425._12_4_ + iVar500;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_488._0_8_);
                }
                local_578._0_8_ = (long)local_4d8.data + iVar149 * uVar151 + lVar168;
                local_598 = (void *)((long)local_4d8.data +
                                    (int)((uint)local_458 * uVar151) + lVar162);
                for (; (long)(uVar127 | 1) < lVar142; uVar127 = uVar127 + 2) {
                  lVar126 = uVar127 * lVar166;
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar169 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    uVar179 = (uint)*(byte *)(lVar143 + local_578._0_8_ + lVar126 + lVar169) << 0x18
                              | (uint)*(byte *)(local_578._0_8_ + lVar126 + lVar169) << 8;
                    auVar217._4_4_ = uVar179;
                    auVar217._0_4_ = uVar179;
                    auVar217._8_4_ = uVar179;
                    auVar217._12_4_ = uVar179;
                    auVar528 = psraw(auVar217,8);
                    uVar179 = (uint)*(byte *)((long)local_598 + lVar143 + lVar169 + lVar126) << 0x18
                              | (uint)*(byte *)((long)local_598 + lVar169 + lVar126) << 8;
                    auVar331._4_4_ = uVar179;
                    auVar331._0_4_ = uVar179;
                    auVar331._8_4_ = uVar179;
                    auVar331._12_4_ = uVar179;
                    auVar300 = psraw(auVar331,8);
                    uVar44 = *(ulong *)((long)pvVar161 + uVar140 * 8);
                    auVar449[0] = (char)uVar44;
                    cVar401 = (char)(uVar44 >> 8);
                    cVar402 = (char)(uVar44 >> 0x10);
                    cVar403 = (char)(uVar44 >> 0x18);
                    cVar404 = (char)(uVar44 >> 0x20);
                    cVar407 = (char)(uVar44 >> 0x28);
                    cVar408 = (char)(uVar44 >> 0x30);
                    auVar456._8_6_ = 0;
                    auVar456._0_8_ = uVar44;
                    auVar456[0xe] = (char)(uVar44 >> 0x38);
                    auVar456[0xf] = -((long)uVar44 < 0);
                    auVar455._14_2_ = auVar456._14_2_;
                    auVar455._8_5_ = 0;
                    auVar455._0_8_ = uVar44;
                    auVar455[0xd] = -(cVar408 < '\0');
                    auVar454._13_3_ = auVar455._13_3_;
                    auVar454._8_4_ = 0;
                    auVar454._0_8_ = uVar44;
                    auVar454[0xc] = cVar408;
                    auVar453._12_4_ = auVar454._12_4_;
                    auVar453._8_3_ = 0;
                    auVar453._0_8_ = uVar44;
                    auVar453[0xb] = -(cVar407 < '\0');
                    auVar452._11_5_ = auVar453._11_5_;
                    auVar452._8_2_ = 0;
                    auVar452._0_8_ = uVar44;
                    auVar452[10] = cVar407;
                    auVar451._10_6_ = auVar452._10_6_;
                    auVar451[8] = 0;
                    auVar451._0_8_ = uVar44;
                    auVar451[9] = -(cVar404 < '\0');
                    auVar450._9_7_ = auVar451._9_7_;
                    auVar450[8] = cVar404;
                    auVar450._0_8_ = uVar44;
                    auVar449._8_8_ = auVar450._8_8_;
                    auVar449[7] = -(cVar403 < '\0');
                    auVar449[6] = cVar403;
                    auVar449[5] = -(cVar402 < '\0');
                    auVar449[4] = cVar402;
                    auVar449[3] = -(cVar401 < '\0');
                    auVar449[2] = cVar401;
                    auVar449[1] = -(auVar449[0] < '\0');
                    auVar528 = pmaddwd(auVar528,auVar449);
                    iVar262 = iVar262 + auVar528._0_4_;
                    iVar264 = iVar264 + auVar528._4_4_;
                    iVar263 = iVar263 + auVar528._8_4_;
                    iVar406 = iVar406 + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar449,auVar300);
                    iVar137 = iVar137 + auVar528._0_4_;
                    iVar160 = iVar160 + auVar528._4_4_;
                    iVar177 = iVar177 + auVar528._8_4_;
                    iVar261 = iVar261 + auVar528._12_4_;
                  }
                  pvVar161 = (void *)((long)pvVar161 + (long)local_530);
                }
                for (; (long)uVar127 < lVar142; uVar127 = uVar127 + 1) {
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar126 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    auVar528 = ZEXT416((uint)(int)*(char *)(local_578._0_8_ + uVar127 * lVar166 +
                                                           lVar126));
                    auVar528 = pshuflw(auVar528,auVar528,0);
                    auVar218._0_4_ = auVar528._0_4_;
                    auVar218._4_4_ = auVar218._0_4_;
                    auVar218._8_4_ = auVar218._0_4_;
                    auVar218._12_4_ = auVar218._0_4_;
                    auVar300 = ZEXT416((uint)(int)*(char *)((long)local_598 +
                                                           lVar126 + uVar127 * lVar166));
                    auVar550 = pshuflw(auVar300,auVar300,0);
                    auVar332._0_4_ = auVar550._0_4_;
                    auVar332._4_4_ = auVar332._0_4_;
                    auVar332._8_4_ = auVar332._0_4_;
                    auVar332._12_4_ = auVar332._0_4_;
                    uVar44 = *(ulong *)((long)pvVar161 + uVar140 * 4);
                    cVar401 = (char)(uVar44 >> 8);
                    cVar402 = (char)(uVar44 >> 0x10);
                    cVar403 = (char)(uVar44 >> 0x18);
                    cVar404 = (char)(uVar44 >> 0x20);
                    cVar407 = (char)(uVar44 >> 0x28);
                    cVar408 = (char)(uVar44 >> 0x30);
                    auVar464._8_6_ = 0;
                    auVar464._0_8_ = uVar44;
                    auVar464[0xe] = (char)(uVar44 >> 0x38);
                    auVar464[0xf] = -((long)uVar44 < 0);
                    auVar463._14_2_ = auVar464._14_2_;
                    auVar463._8_5_ = 0;
                    auVar463._0_8_ = uVar44;
                    auVar463[0xd] = -(cVar408 < '\0');
                    auVar462._13_3_ = auVar463._13_3_;
                    auVar462._8_4_ = 0;
                    auVar462._0_8_ = uVar44;
                    auVar462[0xc] = cVar408;
                    auVar461._12_4_ = auVar462._12_4_;
                    auVar461._8_3_ = 0;
                    auVar461._0_8_ = uVar44;
                    auVar461[0xb] = -(cVar407 < '\0');
                    auVar460._11_5_ = auVar461._11_5_;
                    auVar460._8_2_ = 0;
                    auVar460._0_8_ = uVar44;
                    auVar460[10] = cVar407;
                    auVar459._10_6_ = auVar460._10_6_;
                    auVar459[8] = 0;
                    auVar459._0_8_ = uVar44;
                    auVar459[9] = -(cVar404 < '\0');
                    auVar458._9_7_ = auVar459._9_7_;
                    auVar458[8] = cVar404;
                    auVar458._0_8_ = uVar44;
                    Var95 = CONCAT91(CONCAT81(auVar458._8_8_,-(cVar403 < '\0')),cVar403);
                    auVar103._2_10_ = Var95;
                    auVar103[1] = -(cVar402 < '\0');
                    auVar103[0] = cVar402;
                    auVar102._2_12_ = auVar103;
                    auVar102[1] = -(cVar401 < '\0');
                    auVar102[0] = cVar401;
                    auVar457._0_2_ = CONCAT11(-((char)uVar44 < '\0'),(char)uVar44);
                    auVar457._2_14_ = auVar102;
                    sVar622 = (short)Var95;
                    sVar497 = auVar528._2_2_ * sVar622;
                    auVar300 = pmulhw(auVar218,auVar457);
                    iVar149 = CONCAT22(auVar300._6_2_,sVar497);
                    Var95 = CONCAT64(CONCAT42(iVar149,auVar300._4_2_),
                                     CONCAT22(auVar528._0_2_ * auVar103._0_2_,sVar497));
                    auVar104._4_8_ = (long)((unkuint10)Var95 >> 0x10);
                    auVar104._2_2_ = auVar300._2_2_;
                    auVar104._0_2_ = auVar528._2_2_ * auVar102._0_2_;
                    sVar622 = auVar550._2_2_ * sVar622;
                    auVar600 = pmulhw(auVar457,auVar332);
                    iVar410 = CONCAT22(auVar600._6_2_,sVar622);
                    Var113 = CONCAT64(CONCAT42(iVar410,auVar600._4_2_),
                                      CONCAT22(auVar550._0_2_ * auVar103._0_2_,sVar622));
                    auVar105._4_8_ = (long)((unkuint10)Var113 >> 0x10);
                    auVar105._2_2_ = auVar600._2_2_;
                    auVar105._0_2_ = auVar550._2_2_ * auVar102._0_2_;
                    iVar262 = iVar262 + CONCAT22(auVar300._0_2_,auVar528._0_2_ * auVar457._0_2_);
                    iVar264 = iVar264 + auVar104._0_4_;
                    iVar263 = iVar263 + (int)((unkuint10)Var95 >> 0x10);
                    iVar406 = iVar406 + iVar149;
                    iVar137 = iVar137 + CONCAT22(auVar600._0_2_,auVar550._0_2_ * auVar457._0_2_);
                    iVar160 = iVar160 + auVar105._0_4_;
                    iVar177 = iVar177 + (int)((unkuint10)Var113 >> 0x10);
                    iVar261 = iVar261 + iVar410;
                  }
                  pvVar161 = (void *)((long)pvVar161 + lVar125);
                }
                iVar262 = iVar262 + auVar744._0_4_;
                iVar264 = iVar264 + auVar744._4_4_;
                iVar263 = iVar263 + auVar744._8_4_;
                iVar406 = iVar406 + auVar744._12_4_;
                auVar666._0_4_ = iVar137 + auVar708._0_4_;
                auVar666._4_4_ = iVar160 + auVar708._4_4_;
                auVar666._8_4_ = iVar177 + auVar708._8_4_;
                auVar666._12_4_ = iVar261 + auVar708._12_4_;
                if ((int)local_538 == 1) {
                  uVar184 = CONCAT44(auVar666._0_4_,iVar262);
                  *(undefined8 *)*local_5e0 = uVar184;
                  *(int *)((long)*local_5e0 + local_380 * 4) = iVar264;
                  *(int *)((long)*local_5e0 + (long)local_318 * 4) = auVar666._4_4_;
                  piVar134 = (int *)((long)*local_5e0 + lVar141 * 4);
                  *piVar134 = iVar263;
                  piVar134[1] = auVar666._8_4_;
                  *(int *)((long)*local_5e0 + lVar123 * 4) = iVar406;
                  *(int *)((long)*local_5e0 + lVar128 * 4) = auVar666._12_4_;
                  local_5e0 = (undefined1 (*) [16])((long)*local_5e0 + 8);
                }
                else if ((int)local_538 == 4) {
                  *(int *)*local_5e0 = iVar262;
                  *(int *)((long)*local_5e0 + 4) = iVar264;
                  *(int *)((long)*local_5e0 + 8) = iVar263;
                  *(int *)((long)*local_5e0 + 0xc) = iVar406;
                  local_5e0[1] = auVar666;
                  local_5e0 = local_5e0 + 2;
                }
              }
              for (; (int)uVar144 < iVar167; uVar144 = uVar144 + 1) {
                iVar149 = (int)uVar144 % local_3c8.w;
                pvVar161 = (void *)((this->weight_data_tm).cstep * uVar172 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                local_598 = (void *)CONCAT44(local_598._4_4_,iVar149);
                lVar128 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize) *
                          (long)(int)(((int)uVar144 / local_3c8.w) * uVar150);
                lVar169 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar126 = (long)local_4d8.data + iVar149 * iVar135 + lVar128;
                local_578._0_8_ = lVar126;
                auVar528 = (undefined1  [16])0x0;
                iVar137 = 0;
                iVar160 = 0;
                iVar177 = 0;
                iVar261 = 0;
                iVar262 = 0;
                iVar264 = 0;
                iVar263 = 0;
                iVar406 = 0;
                iVar410 = 0;
                iVar411 = 0;
                iVar500 = 0;
                iVar510 = 0;
                for (uVar127 = 0; (int)((uint)uVar127 | 7) < local_618; uVar127 = uVar127 + 8) {
                  for (lVar162 = 0; lVar125 != lVar162; lVar162 = lVar162 + 4) {
                    puVar154 = (ulong *)((long)*(int *)(opt_q._0_8_ + lVar162) +
                                        (int)((long)((ulong)(uint)((int)(uint)uVar127 >> 0x1f) <<
                                                     0x20 | uVar127 & 0xffffffff) / (long)iVar164) *
                                        lVar169 + lVar126);
                    if (iVar164 == 8) {
                      uVar140 = *puVar154;
                    }
                    else {
                      uVar140 = CONCAT26(CONCAT11(*(undefined1 *)((long)puVar154 + (long)local_518),
                                                  *(undefined1 *)((long)puVar154 + lVar129)),
                                         CONCAT24(CONCAT11(*(undefined1 *)((long)puVar154 + lVar130)
                                                           ,*(undefined1 *)
                                                             ((long)puVar154 + lVar143 * 4)),
                                                  CONCAT13(*(undefined1 *)((long)puVar154 + lVar180)
                                                           ,CONCAT12(*(undefined1 *)
                                                                      ((long)puVar154 + lVar143 * 2)
                                                                     ,CONCAT11(*(undefined1 *)
                                                                                ((long)puVar154 +
                                                                                lVar143),
                                                                               (char)*puVar154)))));
                    }
                    auVar340._8_6_ = 0;
                    auVar340._0_8_ = uVar140;
                    auVar333[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar340[0xe] = (char)(uVar140 >> 0x38);
                    auVar340[0xf] = -((long)uVar140 < 0);
                    auVar339._14_2_ = auVar340._14_2_;
                    auVar339._8_5_ = 0;
                    auVar339._0_8_ = uVar140;
                    auVar339[0xd] = -(cVar408 < '\0');
                    auVar338._13_3_ = auVar339._13_3_;
                    auVar338._8_4_ = 0;
                    auVar338._0_8_ = uVar140;
                    auVar338[0xc] = cVar408;
                    auVar337._12_4_ = auVar338._12_4_;
                    auVar337._8_3_ = 0;
                    auVar337._0_8_ = uVar140;
                    auVar337[0xb] = -(cVar407 < '\0');
                    auVar336._11_5_ = auVar337._11_5_;
                    auVar336._8_2_ = 0;
                    auVar336._0_8_ = uVar140;
                    auVar336[10] = cVar407;
                    auVar335._10_6_ = auVar336._10_6_;
                    auVar335[8] = 0;
                    auVar335._0_8_ = uVar140;
                    auVar335[9] = -(cVar404 < '\0');
                    auVar334._9_7_ = auVar335._9_7_;
                    auVar334[8] = cVar404;
                    auVar334._0_8_ = uVar140;
                    auVar106._4_8_ = auVar334._8_8_;
                    auVar106[3] = -(cVar403 < '\0');
                    auVar106[2] = cVar403;
                    auVar106[1] = -(cVar402 < '\0');
                    auVar106[0] = cVar402;
                    auVar333._4_12_ = auVar106;
                    auVar333[3] = -(cVar401 < '\0');
                    auVar333[2] = cVar401;
                    auVar333[1] = -(auVar333[0] < '\0');
                    auVar300 = *(undefined1 (*) [16])((long)pvVar161 + lVar162 * 8);
                    auVar550 = *(undefined1 (*) [16])((long)pvVar161 + lVar162 * 8 + 0x10);
                    auVar717._0_14_ = auVar300._0_14_;
                    auVar717[0xe] = auVar300[7];
                    auVar717[0xf] = -(auVar300[7] < '\0');
                    auVar716._14_2_ = auVar717._14_2_;
                    auVar716._0_13_ = auVar300._0_13_;
                    auVar716[0xd] = -(auVar300[6] < '\0');
                    auVar715._13_3_ = auVar716._13_3_;
                    auVar715._0_12_ = auVar300._0_12_;
                    auVar715[0xc] = auVar300[6];
                    auVar714._12_4_ = auVar715._12_4_;
                    auVar714._0_11_ = auVar300._0_11_;
                    auVar714[0xb] = -(auVar300[5] < '\0');
                    auVar713._11_5_ = auVar714._11_5_;
                    auVar713._0_10_ = auVar300._0_10_;
                    auVar713[10] = auVar300[5];
                    auVar712._10_6_ = auVar713._10_6_;
                    auVar712._0_9_ = auVar300._0_9_;
                    auVar712[9] = -(auVar300[4] < '\0');
                    auVar711._9_7_ = auVar712._9_7_;
                    auVar711._0_8_ = auVar300._0_8_;
                    auVar711[8] = auVar300[4];
                    auVar710._8_8_ = auVar711._8_8_;
                    auVar710[7] = -(auVar300[3] < '\0');
                    auVar710[6] = auVar300[3];
                    auVar710[5] = -(auVar300[2] < '\0');
                    auVar710[4] = auVar300[2];
                    auVar710[3] = -(auVar300[1] < '\0');
                    auVar710[2] = auVar300[1];
                    auVar710[1] = -(auVar300[0] < '\0');
                    auVar710[0] = auVar300[0];
                    auVar465[1] = -(auVar300[8] < '\0');
                    auVar465[0] = auVar300[8];
                    auVar465[2] = auVar300[9];
                    auVar465[3] = -(auVar300[9] < '\0');
                    auVar465[4] = auVar300[10];
                    auVar465[5] = -(auVar300[10] < '\0');
                    auVar465[6] = auVar300[0xb];
                    auVar465[7] = -(auVar300[0xb] < '\0');
                    auVar465[8] = auVar300[0xc];
                    auVar465[9] = -(auVar300[0xc] < '\0');
                    auVar465[10] = auVar300[0xd];
                    auVar465[0xb] = -(auVar300[0xd] < '\0');
                    auVar465[0xc] = auVar300[0xe];
                    auVar465[0xd] = -(auVar300[0xe] < '\0');
                    auVar465[0xe] = auVar300[0xf];
                    auVar465[0xf] = -(auVar300[0xf] < '\0');
                    auVar582._0_14_ = auVar550._0_14_;
                    auVar582[0xe] = auVar550[7];
                    auVar582[0xf] = -(auVar550[7] < '\0');
                    auVar581._14_2_ = auVar582._14_2_;
                    auVar581._0_13_ = auVar550._0_13_;
                    auVar581[0xd] = -(auVar550[6] < '\0');
                    auVar580._13_3_ = auVar581._13_3_;
                    auVar580._0_12_ = auVar550._0_12_;
                    auVar580[0xc] = auVar550[6];
                    auVar579._12_4_ = auVar580._12_4_;
                    auVar579._0_11_ = auVar550._0_11_;
                    auVar579[0xb] = -(auVar550[5] < '\0');
                    auVar578._11_5_ = auVar579._11_5_;
                    auVar578._0_10_ = auVar550._0_10_;
                    auVar578[10] = auVar550[5];
                    auVar577._10_6_ = auVar578._10_6_;
                    auVar577._0_9_ = auVar550._0_9_;
                    auVar577[9] = -(auVar550[4] < '\0');
                    auVar576._9_7_ = auVar577._9_7_;
                    auVar576._0_8_ = auVar550._0_8_;
                    auVar576[8] = auVar550[4];
                    auVar575._8_8_ = auVar576._8_8_;
                    auVar575[7] = -(auVar550[3] < '\0');
                    auVar575[6] = auVar550[3];
                    auVar575[5] = -(auVar550[2] < '\0');
                    auVar575[4] = auVar550[2];
                    auVar575[3] = -(auVar550[1] < '\0');
                    auVar575[2] = auVar550[1];
                    auVar575[1] = -(auVar550[0] < '\0');
                    auVar575[0] = auVar550[0];
                    auVar533[1] = -(auVar550[8] < '\0');
                    auVar533[0] = auVar550[8];
                    auVar533[2] = auVar550[9];
                    auVar533[3] = -(auVar550[9] < '\0');
                    auVar533[4] = auVar550[10];
                    auVar533[5] = -(auVar550[10] < '\0');
                    auVar533[6] = auVar550[0xb];
                    auVar533[7] = -(auVar550[0xb] < '\0');
                    auVar533[8] = auVar550[0xc];
                    auVar533[9] = -(auVar550[0xc] < '\0');
                    auVar533[10] = auVar550[0xd];
                    auVar533[0xb] = -(auVar550[0xd] < '\0');
                    auVar533[0xc] = auVar550[0xe];
                    auVar533[0xd] = -(auVar550[0xe] < '\0');
                    auVar533[0xe] = auVar550[0xf];
                    auVar533[0xf] = -(auVar550[0xf] < '\0');
                    uVar183 = auVar333._0_4_;
                    uVar259 = auVar106._0_4_;
                    uVar260 = auVar334._8_4_;
                    auVar602._4_4_ = uVar183;
                    auVar602._0_4_ = uVar183;
                    auVar602._8_4_ = uVar183;
                    auVar602._12_4_ = uVar183;
                    auVar300 = pmaddwd(auVar602,auVar710);
                    iVar410 = iVar410 + auVar300._0_4_;
                    iVar411 = iVar411 + auVar300._4_4_;
                    iVar500 = iVar500 + auVar300._8_4_;
                    iVar510 = iVar510 + auVar300._12_4_;
                    auVar603._4_4_ = uVar259;
                    auVar603._0_4_ = uVar259;
                    auVar603._8_4_ = uVar259;
                    auVar603._12_4_ = uVar259;
                    auVar300 = pmaddwd(auVar603,auVar465);
                    iVar262 = iVar262 + auVar300._0_4_;
                    iVar264 = iVar264 + auVar300._4_4_;
                    iVar263 = iVar263 + auVar300._8_4_;
                    iVar406 = iVar406 + auVar300._12_4_;
                    auVar466._4_4_ = uVar260;
                    auVar466._0_4_ = uVar260;
                    auVar466._8_4_ = uVar260;
                    auVar466._12_4_ = uVar260;
                    auVar300 = pmaddwd(auVar466,auVar575);
                    iVar137 = iVar137 + auVar300._0_4_;
                    iVar160 = iVar160 + auVar300._4_4_;
                    iVar177 = iVar177 + auVar300._8_4_;
                    iVar261 = iVar261 + auVar300._12_4_;
                    auVar341._4_4_ = auVar337._12_4_;
                    auVar341._0_4_ = auVar337._12_4_;
                    auVar341._8_4_ = auVar337._12_4_;
                    auVar341._12_4_ = auVar337._12_4_;
                    auVar300 = pmaddwd(auVar341,auVar533);
                    auVar219._0_4_ = auVar528._0_4_ + auVar300._0_4_;
                    auVar219._4_4_ = auVar528._4_4_ + auVar300._4_4_;
                    auVar219._8_4_ = auVar528._8_4_ + auVar300._8_4_;
                    auVar219._12_4_ = auVar528._12_4_ + auVar300._12_4_;
                    auVar528 = auVar219;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_488._0_8_);
                }
                auVar667._0_4_ = iVar262 + iVar410 + iVar137 + auVar528._0_4_;
                auVar667._4_4_ = iVar264 + iVar411 + iVar160 + auVar528._4_4_;
                auVar667._8_4_ = iVar263 + iVar500 + iVar177 + auVar528._8_4_;
                auVar667._12_4_ = iVar406 + iVar510 + iVar261 + auVar528._12_4_;
                local_528._0_8_ = (long)local_4d8.data + iVar149 * uVar151 + lVar128;
                for (; (long)(uVar127 | 1) < lVar142; uVar127 = uVar127 + 2) {
                  lVar126 = uVar127 * lVar169 + local_528._0_8_;
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar128 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    uVar179 = (uint)*(byte *)(lVar143 + lVar126 + lVar128) << 0x18 |
                              (uint)*(byte *)(lVar126 + lVar128) << 8;
                    auVar220._4_4_ = uVar179;
                    auVar220._0_4_ = uVar179;
                    auVar220._8_4_ = uVar179;
                    auVar220._12_4_ = uVar179;
                    auVar528 = psraw(auVar220,8);
                    uVar44 = *(ulong *)((long)pvVar161 + uVar140 * 8);
                    auVar342[0] = (char)uVar44;
                    cVar401 = (char)(uVar44 >> 8);
                    cVar402 = (char)(uVar44 >> 0x10);
                    cVar403 = (char)(uVar44 >> 0x18);
                    cVar404 = (char)(uVar44 >> 0x20);
                    cVar407 = (char)(uVar44 >> 0x28);
                    cVar408 = (char)(uVar44 >> 0x30);
                    auVar349._8_6_ = 0;
                    auVar349._0_8_ = uVar44;
                    auVar349[0xe] = (char)(uVar44 >> 0x38);
                    auVar349[0xf] = -((long)uVar44 < 0);
                    auVar348._14_2_ = auVar349._14_2_;
                    auVar348._8_5_ = 0;
                    auVar348._0_8_ = uVar44;
                    auVar348[0xd] = -(cVar408 < '\0');
                    auVar347._13_3_ = auVar348._13_3_;
                    auVar347._8_4_ = 0;
                    auVar347._0_8_ = uVar44;
                    auVar347[0xc] = cVar408;
                    auVar346._12_4_ = auVar347._12_4_;
                    auVar346._8_3_ = 0;
                    auVar346._0_8_ = uVar44;
                    auVar346[0xb] = -(cVar407 < '\0');
                    auVar345._11_5_ = auVar346._11_5_;
                    auVar345._8_2_ = 0;
                    auVar345._0_8_ = uVar44;
                    auVar345[10] = cVar407;
                    auVar344._10_6_ = auVar345._10_6_;
                    auVar344[8] = 0;
                    auVar344._0_8_ = uVar44;
                    auVar344[9] = -(cVar404 < '\0');
                    auVar343._9_7_ = auVar344._9_7_;
                    auVar343[8] = cVar404;
                    auVar343._0_8_ = uVar44;
                    auVar342._8_8_ = auVar343._8_8_;
                    auVar342[7] = -(cVar403 < '\0');
                    auVar342[6] = cVar403;
                    auVar342[5] = -(cVar402 < '\0');
                    auVar342[4] = cVar402;
                    auVar342[3] = -(cVar401 < '\0');
                    auVar342[2] = cVar401;
                    auVar342[1] = -(auVar342[0] < '\0');
                    auVar528 = pmaddwd(auVar342,auVar528);
                    auVar668._0_4_ = auVar667._0_4_ + auVar528._0_4_;
                    auVar668._4_4_ = auVar667._4_4_ + auVar528._4_4_;
                    auVar668._8_4_ = auVar667._8_4_ + auVar528._8_4_;
                    auVar668._12_4_ = auVar667._12_4_ + auVar528._12_4_;
                    auVar667 = auVar668;
                  }
                  pvVar161 = (void *)((long)pvVar161 + (long)local_530);
                }
                for (; (long)uVar127 < lVar142; uVar127 = uVar127 + 1) {
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    auVar528 = ZEXT416((uint)(int)*(char *)(uVar127 * lVar169 + local_528._0_8_ +
                                                           (long)*(int *)(opt_q._0_8_ + uVar140 * 4)
                                                           ));
                    auVar528 = pshuflw(auVar528,auVar528,0);
                    auVar221._0_4_ = auVar528._0_4_;
                    auVar221._4_4_ = auVar221._0_4_;
                    auVar221._8_4_ = auVar221._0_4_;
                    auVar221._12_4_ = auVar221._0_4_;
                    uVar44 = *(ulong *)((long)pvVar161 + uVar140 * 4);
                    cVar401 = (char)(uVar44 >> 8);
                    cVar402 = (char)(uVar44 >> 0x10);
                    cVar403 = (char)(uVar44 >> 0x18);
                    cVar404 = (char)(uVar44 >> 0x20);
                    cVar407 = (char)(uVar44 >> 0x28);
                    cVar408 = (char)(uVar44 >> 0x30);
                    auVar357._8_6_ = 0;
                    auVar357._0_8_ = uVar44;
                    auVar357[0xe] = (char)(uVar44 >> 0x38);
                    auVar357[0xf] = -((long)uVar44 < 0);
                    auVar356._14_2_ = auVar357._14_2_;
                    auVar356._8_5_ = 0;
                    auVar356._0_8_ = uVar44;
                    auVar356[0xd] = -(cVar408 < '\0');
                    auVar355._13_3_ = auVar356._13_3_;
                    auVar355._8_4_ = 0;
                    auVar355._0_8_ = uVar44;
                    auVar355[0xc] = cVar408;
                    auVar354._12_4_ = auVar355._12_4_;
                    auVar354._8_3_ = 0;
                    auVar354._0_8_ = uVar44;
                    auVar354[0xb] = -(cVar407 < '\0');
                    auVar353._11_5_ = auVar354._11_5_;
                    auVar353._8_2_ = 0;
                    auVar353._0_8_ = uVar44;
                    auVar353[10] = cVar407;
                    auVar352._10_6_ = auVar353._10_6_;
                    auVar352[8] = 0;
                    auVar352._0_8_ = uVar44;
                    auVar352[9] = -(cVar404 < '\0');
                    auVar351._9_7_ = auVar352._9_7_;
                    auVar351[8] = cVar404;
                    auVar351._0_8_ = uVar44;
                    Var95 = CONCAT91(CONCAT81(auVar351._8_8_,-(cVar403 < '\0')),cVar403);
                    auVar108._2_10_ = Var95;
                    auVar108[1] = -(cVar402 < '\0');
                    auVar108[0] = cVar402;
                    auVar107._2_12_ = auVar108;
                    auVar107[1] = -(cVar401 < '\0');
                    auVar107[0] = cVar401;
                    auVar350._0_2_ = CONCAT11(-((char)uVar44 < '\0'),(char)uVar44);
                    auVar350._2_14_ = auVar107;
                    sVar622 = auVar528._2_2_ * (short)Var95;
                    auVar300 = pmulhw(auVar350,auVar221);
                    iVar149 = CONCAT22(auVar300._6_2_,sVar622);
                    Var95 = CONCAT64(CONCAT42(iVar149,auVar300._4_2_),
                                     CONCAT22(auVar528._0_2_ * auVar108._0_2_,sVar622));
                    auVar109._4_8_ = (long)((unkuint10)Var95 >> 0x10);
                    auVar109._2_2_ = auVar300._2_2_;
                    auVar109._0_2_ = auVar528._2_2_ * auVar107._0_2_;
                    auVar669._0_4_ =
                         auVar667._0_4_ + CONCAT22(auVar300._0_2_,auVar528._0_2_ * auVar350._0_2_);
                    auVar669._4_4_ = auVar667._4_4_ + auVar109._0_4_;
                    auVar669._8_4_ = auVar667._8_4_ + (int)((unkuint10)Var95 >> 0x10);
                    auVar669._12_4_ = auVar667._12_4_ + iVar149;
                    auVar667 = auVar669;
                  }
                  pvVar161 = (void *)((long)pvVar161 + lVar125);
                }
                if ((int)local_538 == 1) {
                  *(int *)*local_5e0 = auVar667._0_4_;
                  *(int *)((long)*local_5e0 + local_380 * 4) = auVar667._4_4_;
                  *(int *)((long)*local_5e0 + lVar141 * 4) = auVar667._8_4_;
                  *(int *)((long)*local_5e0 + lVar123 * 4) = auVar667._12_4_;
                  local_5e0 = (undefined1 (*) [16])((long)*local_5e0 + 4);
                }
                else if ((int)local_538 == 4) {
                  *local_5e0 = auVar667;
                  local_5e0 = local_5e0 + 1;
                }
              }
              uVar127 = uVar172 + 1;
              local_540 = uVar172;
            }
            uVar144 = iVar117 * 4;
            local_250 = (ulong)uVar144;
            uVar127 = (long)((int)uVar163 + iVar117 * -4) / 2;
            local_38 = uVar127 & 0xffffffff;
            local_460 = uVar178 * 0x10;
            local_4f0 = uVar178 * 2;
            local_248 = (long)(int)uVar144;
            local_238 = 0;
            uVar138 = 0;
            if (0 < (int)uVar127) {
              local_238 = uVar127 & 0xffffffff;
            }
            while( true ) {
              uVar172 = uVar138;
              auVar300 = _DAT_00537fa0;
              auVar528 = _DAT_00537f90;
              lVar126 = CONCAT44(local_458._4_4_,(uint)local_458);
              if (uVar172 == local_238) break;
              uVar138 = local_248 + uVar172 * 2;
              uVar140 = (ulong)(uint)((int)uVar138 >> 0x1f) << 0x20 | uVar138 & 0xffffffff;
              pauVar157 = (undefined1 (*) [16])
                          ((local_248 + uVar172 * 2 + 1) * local_3c8.elemsize * local_3c8.cstep +
                          (long)local_3c8.data);
              iVar117 = local_3c8.h * local_3c8.w;
              lVar141 = (long)(((int)((long)uVar140 % 4) >> 1) + (int)((long)uVar140 / 4));
              local_5b8._0_8_ = SEXT48((int)local_4d8.cstep * iVar164);
              lVar180 = local_5b8._0_8_ * 3;
              lVar130 = local_5b8._0_8_ * 5;
              local_518 = (int *)(local_5b8._0_8_ * 6);
              lVar123 = local_5b8._0_8_ * 7;
              local_528._0_8_ = lVar123;
              uVar179 = 0;
              piVar134 = (int *)(local_3c8.elemsize * local_3c8.cstep * uVar138 +
                                (long)local_3c8.data);
              while( true ) {
                piVar124 = piVar134;
                local_458._4_4_ = (uint)((ulong)lVar126 >> 0x20);
                local_458._0_4_ = (uint)lVar126;
                if (iVar117 <= (int)(uVar179 | 3)) break;
                uVar138 = CONCAT44((int)(uVar179 | 1) >> 0x1f,uVar179) | 1;
                iVar149 = (int)((long)uVar138 / (long)local_3c8.w);
                local_578._0_4_ = iVar149;
                local_380 = CONCAT44(local_380._4_4_,uVar179);
                uVar140 = CONCAT44((int)(uVar179 | 2) >> 0x1f,uVar179) | 2;
                iVar167 = (int)((long)uVar140 / (long)local_3c8.w);
                local_598 = (void *)CONCAT44(local_598._4_4_,iVar167);
                uVar44 = CONCAT44((int)(uVar179 | 3) >> 0x1f,uVar179) | 3;
                pvVar161 = (void *)((this->weight_data_tm).cstep * lVar141 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                iVar177 = (int)((long)uVar138 % (long)local_3c8.w);
                local_218 = CONCAT44(local_218._4_4_,iVar177);
                iVar160 = (int)((long)uVar140 % (long)local_3c8.w);
                local_220 = CONCAT44(local_220._4_4_,iVar160);
                local_500 = (void *)(local_4d8.cstep *
                                    CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize
                                            ));
                lVar129 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                iVar137 = (int)((long)uVar44 % (long)local_3c8.w);
                local_228 = CONCAT44(local_228._4_4_,iVar137);
                lVar143 = (int)(((int)uVar179 / local_3c8.w) * uVar150) * lVar129;
                lVar128 = (int)(iVar149 * uVar150) * lVar129;
                lVar169 = (int)(iVar167 * uVar150) * lVar129;
                lVar129 = (int)((int)((long)uVar44 / (long)local_3c8.w) * uVar150) * lVar129;
                local_540 = (long)local_4d8.data + ((int)uVar179 % local_3c8.w) * iVar135 + lVar143;
                local_310 = (long)local_4d8.data + iVar137 * iVar135 + lVar129;
                auVar300 = (undefined1  [16])0x0;
                auVar600 = (undefined1  [16])0x0;
                auVar528 = (undefined1  [16])0x0;
                iVar411 = 0;
                iVar500 = 0;
                iVar510 = 0;
                iVar511 = 0;
                auVar550 = (undefined1  [16])0x0;
                auVar425 = (undefined1  [16])0x0;
                iVar149 = 0;
                iVar167 = 0;
                iVar261 = 0;
                iVar262 = 0;
                iVar264 = 0;
                iVar263 = 0;
                iVar406 = 0;
                iVar410 = 0;
                uVar138 = 0;
                while (uVar140 = uVar138, (int)((uint)uVar140 | 7) < local_618) {
                  lVar162 = (long)(int)((long)((ulong)(uint)((int)(uint)uVar140 >> 0x1f) << 0x20 |
                                              uVar140 & 0xffffffff) / (long)iVar164) *
                            (long)local_500;
                  lVar126 = local_540 + lVar162;
                  for (lVar168 = 0; lVar125 != lVar168; lVar168 = lVar168 + 4) {
                    lVar166 = (long)*(int *)(opt_q._0_8_ + lVar168);
                    puVar154 = (ulong *)(lVar126 + lVar166);
                    puVar153 = (ulong *)((long)local_4d8.data +
                                        lVar166 + lVar162 + iVar177 * iVar135 + lVar128);
                    puVar1 = (ulong *)((long)local_4d8.data +
                                      lVar166 + lVar162 + iVar160 * iVar135 + lVar169);
                    puVar171 = (ulong *)(lVar166 + lVar162 + local_310);
                    if (iVar164 == 8) {
                      auVar625._8_6_ = 0;
                      auVar625._0_8_ = *puVar154;
                      auVar187._8_6_ = 0;
                      auVar187._0_8_ = *puVar153;
                      auVar267._8_6_ = 0;
                      auVar267._0_8_ = *puVar1;
                      auVar806._8_6_ = 0;
                      auVar806._0_8_ = *puVar171;
                    }
                    else {
                      auVar268 = SUB1614(ZEXT416(0xffff00ff),0);
                      auVar661 = psllw(ZEXT116(*(byte *)((long)puVar154 + local_5b8._0_8_)),8);
                      auVar266 = DAT_00537f60._0_14_;
                      local_598 = (void *)CONCAT44(iVar500,iVar411);
                      auVar186 = DAT_00537f70._0_14_;
                      auVar806 = DAT_00537f80._0_14_;
                      bVar131 = *(byte *)((long)puVar154 + local_5b8._0_8_ * 4);
                      auVar188 = DAT_00537f90._0_14_;
                      auVar190 = DAT_00537fa0._0_14_;
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar625 = ~auVar270 & ZEXT114(*(byte *)((long)puVar154 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar154 + (long)local_518)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar154 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x18 |
                                 ~auVar186 &
                                 ZEXT114(*(byte *)((long)puVar154 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~auVar266 & auVar661._0_14_ | ZEXT114((byte)*puVar154) & auVar268)
                                 & auVar689) & auVar270;
                      auVar661 = psllw(ZEXT116(*(byte *)((long)puVar153 + local_5b8._0_8_)),8);
                      bVar131 = *(byte *)((long)puVar153 + local_5b8._0_8_ * 4);
                      auVar187 = ~auVar270 & ZEXT114(*(byte *)((long)puVar153 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar153 + (long)local_518)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar153 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x18 |
                                 ~auVar186 &
                                 ZEXT114(*(byte *)((long)puVar153 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~auVar266 & auVar661._0_14_ | ZEXT114((byte)*puVar153) & auVar268)
                                 & auVar689) & auVar270;
                      auVar661 = psllw(ZEXT116(*(byte *)((long)puVar1 + local_5b8._0_8_)),8);
                      bVar131 = *(byte *)((long)puVar1 + local_5b8._0_8_ * 4);
                      auVar267 = ~auVar270 & ZEXT114(*(byte *)((long)puVar1 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar1 + (long)local_518)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar1 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar1 + lVar180)) << 0x18 |
                                 ~auVar186 &
                                 ZEXT114(*(byte *)((long)puVar1 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~auVar266 & auVar661._0_14_ | ZEXT114((byte)*puVar1) & auVar268) &
                                 auVar689) & auVar270;
                      auVar661 = psllw(ZEXT116(*(byte *)((long)puVar171 + local_5b8._0_8_)),8);
                      bVar131 = *(byte *)((long)puVar171 + local_5b8._0_8_ * 4);
                      auVar806 = ~auVar270 & ZEXT114(*(byte *)((long)puVar171 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar171 + (long)local_518)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar171 + lVar130)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar171 + lVar180)) << 0x18 |
                                 ~auVar186 &
                                 ZEXT114(*(byte *)((long)puVar171 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~auVar266 & auVar661._0_14_ | ZEXT114((byte)*puVar171) & auVar268)
                                 & auVar689) & auVar270;
                      iStack_590 = iVar510;
                      iStack_58c = iVar511;
                      local_578 = auVar528;
                      local_558 = auVar600;
                      local_4e8 = auVar550;
                      local_488 = auVar300;
                      local_448 = auVar425;
                    }
                    auVar637[0] = auVar625[0];
                    auVar644[0xe] = auVar625[7];
                    auVar644._0_14_ = auVar625;
                    auVar644[0xf] = -(auVar625[7] < '\0');
                    auVar643._14_2_ = auVar644._14_2_;
                    auVar643._0_13_ = auVar625._0_13_;
                    auVar643[0xd] = -(auVar625[6] < '\0');
                    auVar642._13_3_ = auVar643._13_3_;
                    auVar642._0_12_ = auVar625._0_12_;
                    auVar642[0xc] = auVar625[6];
                    auVar641._12_4_ = auVar642._12_4_;
                    auVar641._0_11_ = auVar625._0_11_;
                    auVar641[0xb] = -(auVar625[5] < '\0');
                    auVar640._11_5_ = auVar641._11_5_;
                    auVar640._0_10_ = auVar625._0_10_;
                    auVar640[10] = auVar625[5];
                    auVar639._10_6_ = auVar640._10_6_;
                    auVar639._0_9_ = auVar625._0_9_;
                    auVar639[9] = -(auVar625[4] < '\0');
                    auVar638._9_7_ = auVar639._9_7_;
                    auVar638._0_8_ = auVar625._0_8_;
                    auVar638[8] = auVar625[4];
                    auVar637._8_8_ = auVar638._8_8_;
                    auVar637[7] = -(auVar625[3] < '\0');
                    auVar637[6] = auVar625[3];
                    auVar637[5] = -(auVar625[2] < '\0');
                    auVar637[4] = auVar625[2];
                    auVar637[3] = -(auVar625[1] < '\0');
                    auVar637[2] = auVar625[1];
                    auVar637[1] = -(auVar637[0] < '\0');
                    auVar222[0] = auVar187[0];
                    auVar229[0xe] = auVar187[7];
                    auVar229._0_14_ = auVar187;
                    auVar229[0xf] = -(auVar187[7] < '\0');
                    auVar228._14_2_ = auVar229._14_2_;
                    auVar228._0_13_ = auVar187._0_13_;
                    auVar228[0xd] = -(auVar187[6] < '\0');
                    auVar227._13_3_ = auVar228._13_3_;
                    auVar227._0_12_ = auVar187._0_12_;
                    auVar227[0xc] = auVar187[6];
                    auVar226._12_4_ = auVar227._12_4_;
                    auVar226._0_11_ = auVar187._0_11_;
                    auVar226[0xb] = -(auVar187[5] < '\0');
                    auVar225._11_5_ = auVar226._11_5_;
                    auVar225._0_10_ = auVar187._0_10_;
                    auVar225[10] = auVar187[5];
                    auVar224._10_6_ = auVar225._10_6_;
                    auVar224._0_9_ = auVar187._0_9_;
                    auVar224[9] = -(auVar187[4] < '\0');
                    auVar223._9_7_ = auVar224._9_7_;
                    auVar223._0_8_ = auVar187._0_8_;
                    auVar223[8] = auVar187[4];
                    auVar222._8_8_ = auVar223._8_8_;
                    auVar222[7] = -(auVar187[3] < '\0');
                    auVar222[6] = auVar187[3];
                    auVar222[5] = -(auVar187[2] < '\0');
                    auVar222[4] = auVar187[2];
                    auVar222[3] = -(auVar187[1] < '\0');
                    auVar222[2] = auVar187[1];
                    auVar222[1] = -(auVar222[0] < '\0');
                    auVar358[0] = auVar267[0];
                    auVar365[0xe] = auVar267[7];
                    auVar365._0_14_ = auVar267;
                    auVar365[0xf] = -(auVar267[7] < '\0');
                    auVar364._14_2_ = auVar365._14_2_;
                    auVar364._0_13_ = auVar267._0_13_;
                    auVar364[0xd] = -(auVar267[6] < '\0');
                    auVar363._13_3_ = auVar364._13_3_;
                    auVar363._0_12_ = auVar267._0_12_;
                    auVar363[0xc] = auVar267[6];
                    auVar362._12_4_ = auVar363._12_4_;
                    auVar362._0_11_ = auVar267._0_11_;
                    auVar362[0xb] = -(auVar267[5] < '\0');
                    auVar361._11_5_ = auVar362._11_5_;
                    auVar361._0_10_ = auVar267._0_10_;
                    auVar361[10] = auVar267[5];
                    auVar360._10_6_ = auVar361._10_6_;
                    auVar360._0_9_ = auVar267._0_9_;
                    auVar360[9] = -(auVar267[4] < '\0');
                    auVar359._9_7_ = auVar360._9_7_;
                    auVar359._0_8_ = auVar267._0_8_;
                    auVar359[8] = auVar267[4];
                    auVar358._8_8_ = auVar359._8_8_;
                    auVar358[7] = -(auVar267[3] < '\0');
                    auVar358[6] = auVar267[3];
                    auVar358[5] = -(auVar267[2] < '\0');
                    auVar358[4] = auVar267[2];
                    auVar358[3] = -(auVar267[1] < '\0');
                    auVar358[2] = auVar267[1];
                    auVar358[1] = -(auVar358[0] < '\0');
                    auVar809[0] = auVar806[0];
                    auVar816[0xe] = auVar806[7];
                    auVar816._0_14_ = auVar806;
                    auVar816[0xf] = -(auVar806[7] < '\0');
                    auVar815._14_2_ = auVar816._14_2_;
                    auVar815._0_13_ = auVar806._0_13_;
                    auVar815[0xd] = -(auVar806[6] < '\0');
                    auVar814._13_3_ = auVar815._13_3_;
                    auVar814._0_12_ = auVar806._0_12_;
                    auVar814[0xc] = auVar806[6];
                    auVar813._12_4_ = auVar814._12_4_;
                    auVar813._0_11_ = auVar806._0_11_;
                    auVar813[0xb] = -(auVar806[5] < '\0');
                    auVar812._11_5_ = auVar813._11_5_;
                    auVar812._0_10_ = auVar806._0_10_;
                    auVar812[10] = auVar806[5];
                    auVar811._10_6_ = auVar812._10_6_;
                    auVar811._0_9_ = auVar806._0_9_;
                    auVar811[9] = -(auVar806[4] < '\0');
                    auVar810._9_7_ = auVar811._9_7_;
                    auVar810._0_8_ = auVar806._0_8_;
                    auVar810[8] = auVar806[4];
                    auVar809._8_8_ = auVar810._8_8_;
                    auVar809[7] = -(auVar806[3] < '\0');
                    auVar809[6] = auVar806[3];
                    auVar809[5] = -(auVar806[2] < '\0');
                    auVar809[4] = auVar806[2];
                    auVar809[3] = -(auVar806[1] < '\0');
                    auVar809[2] = auVar806[1];
                    auVar809[1] = -(auVar809[0] < '\0');
                    auVar661 = *(undefined1 (*) [16])((long)pvVar161 + lVar168 * 4);
                    auVar611._0_14_ = auVar661._0_14_;
                    auVar611[0xe] = auVar661[7];
                    auVar611[0xf] = -(auVar661[7] < '\0');
                    auVar610._14_2_ = auVar611._14_2_;
                    auVar610._0_13_ = auVar661._0_13_;
                    auVar610[0xd] = -(auVar661[6] < '\0');
                    auVar609._13_3_ = auVar610._13_3_;
                    auVar609._0_12_ = auVar661._0_12_;
                    auVar609[0xc] = auVar661[6];
                    auVar608._12_4_ = auVar609._12_4_;
                    auVar608._0_11_ = auVar661._0_11_;
                    auVar608[0xb] = -(auVar661[5] < '\0');
                    auVar607._11_5_ = auVar608._11_5_;
                    auVar607._0_10_ = auVar661._0_10_;
                    auVar607[10] = auVar661[5];
                    auVar606._10_6_ = auVar607._10_6_;
                    auVar606._0_9_ = auVar661._0_9_;
                    auVar606[9] = -(auVar661[4] < '\0');
                    auVar605._9_7_ = auVar606._9_7_;
                    auVar605._0_8_ = auVar661._0_8_;
                    auVar605[8] = auVar661[4];
                    auVar604._8_8_ = auVar605._8_8_;
                    auVar604[7] = -(auVar661[3] < '\0');
                    auVar604[6] = auVar661[3];
                    auVar604[5] = -(auVar661[2] < '\0');
                    auVar604[4] = auVar661[2];
                    auVar604[3] = -(auVar661[1] < '\0');
                    auVar604[2] = auVar661[1];
                    auVar604[1] = -(auVar661[0] < '\0');
                    auVar604[0] = auVar661[0];
                    auVar534[1] = -(auVar661[8] < '\0');
                    auVar534[0] = auVar661[8];
                    auVar534[2] = auVar661[9];
                    auVar534[3] = -(auVar661[9] < '\0');
                    auVar534[4] = auVar661[10];
                    auVar534[5] = -(auVar661[10] < '\0');
                    auVar534[6] = auVar661[0xb];
                    auVar534[7] = -(auVar661[0xb] < '\0');
                    auVar534[8] = auVar661[0xc];
                    auVar534[9] = -(auVar661[0xc] < '\0');
                    auVar534[10] = auVar661[0xd];
                    auVar534[0xb] = -(auVar661[0xd] < '\0');
                    auVar534[0xc] = auVar661[0xe];
                    auVar534[0xd] = -(auVar661[0xe] < '\0');
                    auVar534[0xe] = auVar661[0xf];
                    auVar534[0xf] = -(auVar661[0xf] < '\0');
                    auVar661 = pmaddwd(auVar637,auVar604);
                    iVar264 = iVar264 + auVar661._0_4_;
                    iVar263 = iVar263 + auVar661._4_4_;
                    iVar406 = iVar406 + auVar661._8_4_;
                    iVar410 = iVar410 + auVar661._12_4_;
                    auVar661 = pmaddwd(auVar637,auVar534);
                    iVar149 = iVar149 + auVar661._0_4_;
                    iVar167 = iVar167 + auVar661._4_4_;
                    iVar261 = iVar261 + auVar661._8_4_;
                    iVar262 = iVar262 + auVar661._12_4_;
                    auVar661 = pmaddwd(auVar222,auVar604);
                    auVar805._0_4_ = auVar425._0_4_ + auVar661._0_4_;
                    auVar805._4_4_ = auVar425._4_4_ + auVar661._4_4_;
                    auVar805._8_4_ = auVar425._8_4_ + auVar661._8_4_;
                    auVar805._12_4_ = auVar425._12_4_ + auVar661._12_4_;
                    auVar425 = pmaddwd(auVar222,auVar534);
                    auVar768._0_4_ = auVar550._0_4_ + auVar425._0_4_;
                    auVar768._4_4_ = auVar550._4_4_ + auVar425._4_4_;
                    auVar768._8_4_ = auVar550._8_4_ + auVar425._8_4_;
                    auVar768._12_4_ = auVar550._12_4_ + auVar425._12_4_;
                    auVar550 = pmaddwd(auVar358,auVar604);
                    iVar411 = iVar411 + auVar550._0_4_;
                    iVar500 = iVar500 + auVar550._4_4_;
                    iVar510 = iVar510 + auVar550._8_4_;
                    iVar511 = iVar511 + auVar550._12_4_;
                    auVar550 = pmaddwd(auVar358,auVar534);
                    auVar509._0_4_ = auVar528._0_4_ + auVar550._0_4_;
                    auVar509._4_4_ = auVar528._4_4_ + auVar550._4_4_;
                    auVar509._8_4_ = auVar528._8_4_ + auVar550._8_4_;
                    auVar509._12_4_ = auVar528._12_4_ + auVar550._12_4_;
                    auVar528 = pmaddwd(auVar604,auVar809);
                    auVar788._0_4_ = auVar600._0_4_ + auVar528._0_4_;
                    auVar788._4_4_ = auVar600._4_4_ + auVar528._4_4_;
                    auVar788._8_4_ = auVar600._8_4_ + auVar528._8_4_;
                    auVar788._12_4_ = auVar600._12_4_ + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar534,auVar809);
                    auVar746._0_4_ = auVar300._0_4_ + auVar528._0_4_;
                    auVar746._4_4_ = auVar300._4_4_ + auVar528._4_4_;
                    auVar746._8_4_ = auVar300._8_4_ + auVar528._8_4_;
                    auVar746._12_4_ = auVar300._12_4_ + auVar528._12_4_;
                    auVar528 = auVar509;
                    auVar300 = auVar746;
                    auVar550 = auVar768;
                    auVar600 = auVar788;
                    auVar425 = auVar805;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_460);
                  local_538 = uVar140;
                  uVar138 = uVar140 + 8;
                }
                iVar264 = iVar410 + iVar406 + iVar263 + iVar264;
                iVar263 = auVar425._12_4_ + auVar425._8_4_ + auVar425._4_4_ + auVar425._0_4_;
                iVar406 = iVar511 + iVar510 + iVar500 + iVar411;
                iVar410 = auVar600._12_4_ + auVar600._8_4_ + auVar600._4_4_ + auVar600._0_4_;
                auVar670._0_4_ = iVar262 + iVar261 + iVar167 + iVar149;
                auVar670._4_4_ = auVar550._12_4_ + auVar550._8_4_ + auVar550._4_4_ + auVar550._0_4_;
                auVar670._8_4_ = auVar528._12_4_ + auVar528._8_4_ + auVar528._4_4_ + auVar528._0_4_;
                auVar670._12_4_ = auVar300._12_4_ + auVar300._8_4_ + auVar300._4_4_ + auVar300._0_4_
                ;
                local_580 = (undefined1 (*) [16])
                            ((long)local_4d8.data + ((int)uVar179 % local_3c8.w) * uVar151 + lVar143
                            );
                lVar128 = iVar177 * uVar151 + lVar128;
                local_5e0 = (undefined1 (*) [16])
                            ((long)local_4d8.data + iVar160 * uVar151 + lVar169);
                local_5a0 = (long)local_4d8.data + iVar137 * uVar151 + lVar129;
                for (; (long)(uVar140 | 1) < lVar142; uVar140 = uVar140 + 2) {
                  lVar143 = uVar140 * (long)local_500;
                  lVar129 = lVar143 + lVar128;
                  for (uVar138 = 0; uVar178 != uVar138; uVar138 = uVar138 + 1) {
                    lVar169 = (long)*(int *)(opt_q._0_8_ + uVar138 * 4);
                    auVar230._14_2_ =
                         (short)*(char *)(local_5b8._0_8_ + lVar143 + local_5a0 + lVar169);
                    auVar230._12_2_ = (short)*(char *)(lVar143 + local_5a0 + lVar169);
                    auVar230._10_2_ =
                         (short)*(char *)((long)*local_5e0 + local_5b8._0_8_ + lVar169 + lVar143);
                    auVar230._8_2_ = (short)*(char *)((long)*local_5e0 + lVar169 + lVar143);
                    auVar230._6_2_ =
                         (short)*(char *)((long)local_4d8.data + local_5b8._0_8_ + lVar169 + lVar129
                                         );
                    auVar230._4_2_ = (short)*(char *)((long)local_4d8.data + lVar169 + lVar129);
                    auVar230._0_2_ = (short)(char)(*local_580)[lVar169 + lVar143];
                    auVar230._2_2_ = (short)(char)(*local_580)[local_5b8._0_8_ + lVar169 + lVar143];
                    uVar159 = (uint)*(byte *)((long)pvVar161 + uVar138 * 4) << 8 |
                              (uint)*(byte *)((long)pvVar161 + uVar138 * 4 + 2) << 0x18;
                    auVar366._4_4_ = uVar159;
                    auVar366._0_4_ = uVar159;
                    auVar366._8_4_ = uVar159;
                    auVar366._12_4_ = uVar159;
                    auVar528 = psraw(auVar366,8);
                    uVar159 = (uint)*(byte *)((long)pvVar161 + uVar138 * 4 + 1) << 8 |
                              (uint)*(byte *)((long)pvVar161 + uVar138 * 4 + 3) << 0x18;
                    auVar467._4_4_ = uVar159;
                    auVar467._0_4_ = uVar159;
                    auVar467._8_4_ = uVar159;
                    auVar467._12_4_ = uVar159;
                    auVar300 = psraw(auVar467,8);
                    auVar528 = pmaddwd(auVar528,auVar230);
                    iVar264 = iVar264 + auVar528._0_4_;
                    iVar263 = iVar263 + auVar528._4_4_;
                    iVar406 = iVar406 + auVar528._8_4_;
                    iVar410 = iVar410 + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar300,auVar230);
                    auVar671._0_4_ = auVar670._0_4_ + auVar528._0_4_;
                    auVar671._4_4_ = auVar670._4_4_ + auVar528._4_4_;
                    auVar671._8_4_ = auVar670._8_4_ + auVar528._8_4_;
                    auVar671._12_4_ = auVar670._12_4_ + auVar528._12_4_;
                    auVar670 = auVar671;
                  }
                  pvVar161 = (void *)((long)pvVar161 + lVar125);
                }
                for (; (long)uVar140 < lVar142; uVar140 = uVar140 + 1) {
                  lVar129 = uVar140 * (long)local_500;
                  for (uVar138 = 0; uVar178 != uVar138; uVar138 = uVar138 + 1) {
                    lVar143 = (long)*(int *)(opt_q._0_8_ + uVar138 * 4);
                    sVar622 = (short)*(char *)(lVar129 + local_5a0 + lVar143);
                    sVar148 = (short)*(char *)((long)*local_5e0 + lVar143 + lVar129);
                    sVar497 = (short)*(char *)((long)local_4d8.data + lVar143 + lVar129 + lVar128);
                    sVar176 = (short)(char)(*local_580)[lVar143 + lVar129];
                    auVar231._4_4_ = CONCAT22(sVar622,sVar148);
                    auVar231._0_4_ = CONCAT22(sVar497,sVar176);
                    auVar231._8_4_ = CONCAT22(sVar497,sVar176);
                    auVar231._12_4_ = CONCAT22(sVar622,sVar148);
                    uVar39 = *(undefined2 *)((long)pvVar161 + uVar138 * 2);
                    uVar258 = (undefined1)((ushort)uVar39 >> 8);
                    auVar528 = ZEXT416(CONCAT22((short)(CONCAT13(uVar258,CONCAT12(uVar258,uVar39))
                                                       >> 0x10),CONCAT11((char)uVar39,(char)uVar39))
                                      );
                    auVar528 = pshuflw(auVar528,auVar528,0x50);
                    auVar300 = psraw(auVar528,8);
                    auVar367._0_4_ = auVar300._0_4_;
                    auVar367._4_4_ = auVar367._0_4_;
                    auVar367._8_4_ = auVar300._4_4_;
                    auVar367._12_4_ = auVar300._4_4_;
                    sVar498 = auVar300._2_2_ * sVar622;
                    auVar528 = pmulhw(auVar231,auVar367);
                    iVar149 = CONCAT22(auVar528._6_2_,sVar498);
                    Var95 = CONCAT64(CONCAT42(iVar149,auVar528._4_2_),
                                     CONCAT22(auVar300._0_2_ * sVar148,sVar498));
                    auVar110._4_8_ = (long)((unkuint10)Var95 >> 0x10);
                    auVar110._2_2_ = auVar528._2_2_;
                    auVar110._0_2_ = auVar300._2_2_ * sVar497;
                    iVar167 = CONCAT22(auVar528._8_2_,auVar300._4_2_ * sVar176);
                    auVar412._0_8_ =
                         CONCAT26(auVar528._10_2_,CONCAT24(auVar300._6_2_ * sVar497,iVar167));
                    auVar412._8_2_ = auVar300._4_2_ * sVar148;
                    auVar412._10_2_ = auVar528._12_2_;
                    auVar468._12_2_ = auVar300._6_2_ * sVar622;
                    auVar468._0_12_ = auVar412;
                    auVar468._14_2_ = auVar528._14_2_;
                    iVar264 = iVar264 + CONCAT22(auVar528._0_2_,auVar300._0_2_ * sVar176);
                    iVar263 = iVar263 + auVar110._0_4_;
                    iVar406 = iVar406 + (int)((unkuint10)Var95 >> 0x10);
                    iVar410 = iVar410 + iVar149;
                    auVar672._0_4_ = auVar670._0_4_ + iVar167;
                    auVar672._4_4_ = auVar670._4_4_ + (int)((ulong)auVar412._0_8_ >> 0x20);
                    auVar672._8_4_ = auVar670._8_4_ + auVar412._8_4_;
                    auVar672._12_4_ = auVar670._12_4_ + auVar468._12_4_;
                    auVar670 = auVar672;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_4f0);
                }
                *piVar124 = iVar264;
                piVar124[1] = iVar263;
                piVar124[2] = iVar406;
                piVar124[3] = iVar410;
                *pauVar157 = auVar670;
                pauVar157 = pauVar157 + 1;
                uVar179 = uVar179 + 4;
                piVar134 = piVar124 + 4;
                local_378 = piVar124;
              }
              local_4f8 = (void *)((this->weight_data_tm).cstep * lVar141 *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
              for (; piVar134 = piVar124, (int)(uVar179 | 1) < iVar117; uVar179 = uVar179 + 2) {
                local_380 = CONCAT44(local_380._4_4_,uVar179);
                iVar149 = (int)uVar179 % local_3c8.w;
                uVar138 = CONCAT44((int)(uVar179 | 1) >> 0x1f,uVar179) | 1;
                local_458._0_4_ = (uint)((long)uVar138 % (long)local_3c8.w);
                local_448._0_4_ = iVar149;
                lVar143 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar126 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar169 = (int)(((int)uVar179 / local_3c8.w) * uVar150) * lVar126;
                lVar128 = (long)local_4d8.data + iVar149 * iVar135 + lVar169;
                local_488._0_8_ = lVar128;
                lVar126 = (int)((int)((long)uVar138 / (long)local_3c8.w) * uVar150) * lVar126;
                lVar129 = (long)local_4d8.data + (int)((uint)local_458 * iVar135) + lVar126;
                local_558._0_8_ = lVar129;
                auVar528 = (undefined1  [16])0x0;
                iVar167 = 0;
                iVar137 = 0;
                iVar160 = 0;
                iVar177 = 0;
                auVar300 = (undefined1  [16])0x0;
                auVar550 = (undefined1  [16])0x0;
                pvVar161 = local_4f8;
                for (uVar138 = 0; (int)((uint)uVar138 | 7) < local_618; uVar138 = uVar138 + 8) {
                  lVar162 = (int)((long)((ulong)(uint)((int)(uint)uVar138 >> 0x1f) << 0x20 |
                                        uVar138 & 0xffffffff) / (long)iVar164) * lVar143;
                  for (lVar168 = 0; lVar125 != lVar168; lVar168 = lVar168 + 4) {
                    puVar154 = (ulong *)(lVar128 + lVar162 + (long)*(int *)(opt_q._0_8_ + lVar168));
                    puVar153 = (ulong *)((long)*(int *)(opt_q._0_8_ + lVar168) + lVar162 + lVar129);
                    if (iVar164 == 8) {
                      auVar188._8_6_ = 0;
                      auVar188._0_8_ = *puVar154;
                      auVar268._8_6_ = 0;
                      auVar268._0_8_ = *puVar153;
                    }
                    else {
                      auVar600 = psllw(ZEXT116(*(byte *)((long)puVar154 + local_5b8._0_8_)),8);
                      bVar131 = *(byte *)((long)puVar154 + local_5b8._0_8_ * 4);
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar188 = ~auVar270 & ZEXT114(*(byte *)((long)puVar154 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar154 + (long)local_518)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar154 + lVar130)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar600._0_14_ |
                                 ZEXT114((byte)*puVar154) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                      auVar600 = psllw(ZEXT116(*(byte *)((long)puVar153 + local_5b8._0_8_)),8);
                      bVar131 = *(byte *)((long)puVar153 + local_5b8._0_8_ * 4);
                      auVar268 = ~auVar270 & ZEXT114(*(byte *)((long)puVar153 + lVar123)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar153 + (long)local_518)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar153 + lVar130)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + local_5b8._0_8_ * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar600._0_14_ |
                                 ZEXT114((byte)*puVar153) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                    }
                    auVar232[0] = auVar188[0];
                    auVar239[0xe] = auVar188[7];
                    auVar239._0_14_ = auVar188;
                    auVar239[0xf] = -(auVar188[7] < '\0');
                    auVar238._14_2_ = auVar239._14_2_;
                    auVar238._0_13_ = auVar188._0_13_;
                    auVar238[0xd] = -(auVar188[6] < '\0');
                    auVar237._13_3_ = auVar238._13_3_;
                    auVar237._0_12_ = auVar188._0_12_;
                    auVar237[0xc] = auVar188[6];
                    auVar236._12_4_ = auVar237._12_4_;
                    auVar236._0_11_ = auVar188._0_11_;
                    auVar236[0xb] = -(auVar188[5] < '\0');
                    auVar235._11_5_ = auVar236._11_5_;
                    auVar235._0_10_ = auVar188._0_10_;
                    auVar235[10] = auVar188[5];
                    auVar234._10_6_ = auVar235._10_6_;
                    auVar234._0_9_ = auVar188._0_9_;
                    auVar234[9] = -(auVar188[4] < '\0');
                    auVar233._9_7_ = auVar234._9_7_;
                    auVar233._0_8_ = auVar188._0_8_;
                    auVar233[8] = auVar188[4];
                    auVar232._8_8_ = auVar233._8_8_;
                    auVar232[7] = -(auVar188[3] < '\0');
                    auVar232[6] = auVar188[3];
                    auVar232[5] = -(auVar188[2] < '\0');
                    auVar232[4] = auVar188[2];
                    auVar232[3] = -(auVar188[1] < '\0');
                    auVar232[2] = auVar188[1];
                    auVar232[1] = -(auVar232[0] < '\0');
                    auVar368[0] = auVar268[0];
                    auVar375[0xe] = auVar268[7];
                    auVar375._0_14_ = auVar268;
                    auVar375[0xf] = -(auVar268[7] < '\0');
                    auVar374._14_2_ = auVar375._14_2_;
                    auVar374._0_13_ = auVar268._0_13_;
                    auVar374[0xd] = -(auVar268[6] < '\0');
                    auVar373._13_3_ = auVar374._13_3_;
                    auVar373._0_12_ = auVar268._0_12_;
                    auVar373[0xc] = auVar268[6];
                    auVar372._12_4_ = auVar373._12_4_;
                    auVar372._0_11_ = auVar268._0_11_;
                    auVar372[0xb] = -(auVar268[5] < '\0');
                    auVar371._11_5_ = auVar372._11_5_;
                    auVar371._0_10_ = auVar268._0_10_;
                    auVar371[10] = auVar268[5];
                    auVar370._10_6_ = auVar371._10_6_;
                    auVar370._0_9_ = auVar268._0_9_;
                    auVar370[9] = -(auVar268[4] < '\0');
                    auVar369._9_7_ = auVar370._9_7_;
                    auVar369._0_8_ = auVar268._0_8_;
                    auVar369[8] = auVar268[4];
                    auVar368._8_8_ = auVar369._8_8_;
                    auVar368[7] = -(auVar268[3] < '\0');
                    auVar368[6] = auVar268[3];
                    auVar368[5] = -(auVar268[2] < '\0');
                    auVar368[4] = auVar268[2];
                    auVar368[3] = -(auVar268[1] < '\0');
                    auVar368[2] = auVar268[1];
                    auVar368[1] = -(auVar368[0] < '\0');
                    auVar600 = *(undefined1 (*) [16])((long)pvVar161 + lVar168 * 4);
                    auVar590._0_14_ = auVar600._0_14_;
                    auVar590[0xe] = auVar600[7];
                    auVar590[0xf] = -(auVar600[7] < '\0');
                    auVar589._14_2_ = auVar590._14_2_;
                    auVar589._0_13_ = auVar600._0_13_;
                    auVar589[0xd] = -(auVar600[6] < '\0');
                    auVar588._13_3_ = auVar589._13_3_;
                    auVar588._0_12_ = auVar600._0_12_;
                    auVar588[0xc] = auVar600[6];
                    auVar587._12_4_ = auVar588._12_4_;
                    auVar587._0_11_ = auVar600._0_11_;
                    auVar587[0xb] = -(auVar600[5] < '\0');
                    auVar586._11_5_ = auVar587._11_5_;
                    auVar586._0_10_ = auVar600._0_10_;
                    auVar586[10] = auVar600[5];
                    auVar585._10_6_ = auVar586._10_6_;
                    auVar585._0_9_ = auVar600._0_9_;
                    auVar585[9] = -(auVar600[4] < '\0');
                    auVar584._9_7_ = auVar585._9_7_;
                    auVar584._0_8_ = auVar600._0_8_;
                    auVar584[8] = auVar600[4];
                    auVar583._8_8_ = auVar584._8_8_;
                    auVar583[7] = -(auVar600[3] < '\0');
                    auVar583[6] = auVar600[3];
                    auVar583[5] = -(auVar600[2] < '\0');
                    auVar583[4] = auVar600[2];
                    auVar583[3] = -(auVar600[1] < '\0');
                    auVar583[2] = auVar600[1];
                    auVar583[1] = -(auVar600[0] < '\0');
                    auVar583[0] = auVar600[0];
                    auVar469[1] = -(auVar600[8] < '\0');
                    auVar469[0] = auVar600[8];
                    auVar469[2] = auVar600[9];
                    auVar469[3] = -(auVar600[9] < '\0');
                    auVar469[4] = auVar600[10];
                    auVar469[5] = -(auVar600[10] < '\0');
                    auVar469[6] = auVar600[0xb];
                    auVar469[7] = -(auVar600[0xb] < '\0');
                    auVar469[8] = auVar600[0xc];
                    auVar469[9] = -(auVar600[0xc] < '\0');
                    auVar469[10] = auVar600[0xd];
                    auVar469[0xb] = -(auVar600[0xd] < '\0');
                    auVar469[0xc] = auVar600[0xe];
                    auVar469[0xd] = -(auVar600[0xe] < '\0');
                    auVar469[0xe] = auVar600[0xf];
                    auVar469[0xf] = -(auVar600[0xf] < '\0');
                    auVar600 = pmaddwd(auVar232,auVar583);
                    auVar747._0_4_ = auVar550._0_4_ + auVar600._0_4_;
                    auVar747._4_4_ = auVar550._4_4_ + auVar600._4_4_;
                    auVar747._8_4_ = auVar550._8_4_ + auVar600._8_4_;
                    auVar747._12_4_ = auVar550._12_4_ + auVar600._12_4_;
                    auVar550 = pmaddwd(auVar232,auVar469);
                    auVar718._0_4_ = auVar300._0_4_ + auVar550._0_4_;
                    auVar718._4_4_ = auVar300._4_4_ + auVar550._4_4_;
                    auVar718._8_4_ = auVar300._8_4_ + auVar550._8_4_;
                    auVar718._12_4_ = auVar300._12_4_ + auVar550._12_4_;
                    auVar300 = pmaddwd(auVar583,auVar368);
                    iVar167 = iVar167 + auVar300._0_4_;
                    iVar137 = iVar137 + auVar300._4_4_;
                    iVar160 = iVar160 + auVar300._8_4_;
                    iVar177 = iVar177 + auVar300._12_4_;
                    auVar300 = pmaddwd(auVar469,auVar368);
                    auVar673._0_4_ = auVar528._0_4_ + auVar300._0_4_;
                    auVar673._4_4_ = auVar528._4_4_ + auVar300._4_4_;
                    auVar673._8_4_ = auVar528._8_4_ + auVar300._8_4_;
                    auVar673._12_4_ = auVar528._12_4_ + auVar300._12_4_;
                    auVar528 = auVar673;
                    auVar300 = auVar718;
                    auVar550 = auVar747;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_460);
                }
                iVar262 = auVar550._12_4_ + auVar550._4_4_ + auVar550._8_4_ + auVar550._0_4_;
                iVar261 = auVar300._12_4_ + auVar300._4_4_ + auVar300._8_4_ + auVar300._0_4_;
                iVar137 = iVar177 + iVar137 + iVar160 + iVar167;
                iVar167 = auVar528._12_4_ + auVar528._4_4_ + auVar528._8_4_ + auVar528._0_4_;
                local_578._0_8_ = (long)local_4d8.data + iVar149 * uVar151 + lVar169;
                local_598 = (void *)((long)local_4d8.data +
                                    (int)((uint)local_458 * uVar151) + lVar126);
                local_4e8._0_8_ = lVar143;
                for (; (long)(uVar138 | 1) < lVar142; uVar138 = uVar138 + 2) {
                  local_488._0_8_ = uVar138;
                  lVar126 = uVar138 * lVar143;
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar128 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    iVar160 = (int)*(char *)(local_578._0_8_ + lVar126 + lVar128);
                    iVar410 = (int)*(char *)((long)pvVar161 + uVar140 * 4);
                    iVar149 = (int)*(char *)((long)pvVar161 + uVar140 * 4 + 1);
                    iVar177 = (int)*(char *)(local_5b8._0_8_ + lVar128 + local_578._0_8_ + lVar126);
                    iVar264 = (int)*(char *)((long)local_598 + lVar128 + lVar126);
                    iVar263 = (int)*(char *)((long)pvVar161 + uVar140 * 4 + 2);
                    iVar262 = iVar263 * iVar177 + iVar410 * iVar160 + iVar262;
                    iVar406 = (int)*(char *)((long)pvVar161 + uVar140 * 4 + 3);
                    iVar261 = iVar177 * iVar406 + iVar160 * iVar149 + iVar261;
                    iVar160 = (int)*(char *)((long)local_598 + local_5b8._0_8_ + lVar128 + lVar126);
                    iVar137 = iVar263 * iVar160 + iVar410 * iVar264 + iVar137;
                    iVar167 = iVar160 * iVar406 + iVar264 * iVar149 + iVar167;
                  }
                  pvVar161 = (void *)((long)pvVar161 + lVar125);
                }
                for (; (long)uVar138 < lVar142; uVar138 = uVar138 + 1) {
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar126 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    iVar149 = (int)*(char *)(local_578._0_8_ + uVar138 * lVar143 + lVar126);
                    iVar160 = (int)*(char *)((long)pvVar161 + uVar140 * 2);
                    iVar262 = iVar262 + iVar160 * iVar149;
                    iVar177 = (int)*(char *)((long)pvVar161 + uVar140 * 2 + 1);
                    iVar261 = iVar261 + iVar149 * iVar177;
                    iVar149 = (int)*(char *)((long)local_598 + lVar126 + uVar138 * lVar143);
                    iVar137 = iVar137 + iVar160 * iVar149;
                    iVar167 = iVar167 + iVar149 * iVar177;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_4f0);
                }
                *piVar134 = iVar262;
                piVar134[1] = iVar137;
                *(int *)*pauVar157 = iVar261;
                *(int *)(*pauVar157 + 4) = iVar167;
                pauVar157 = (undefined1 (*) [16])(*pauVar157 + 8);
                piVar124 = piVar134 + 2;
                local_378 = piVar134;
              }
              local_318 = (void *)(lVar141 * (this->weight_data_tm).cstep *
                                   (this->weight_data_tm).elemsize +
                                  (long)(this->weight_data_tm).data);
              for (; piVar124 = piVar134, (int)uVar179 < iVar117; uVar179 = uVar179 + 1) {
                local_380 = CONCAT44(local_380._4_4_,uVar179);
                iVar149 = (int)uVar179 % local_3c8.w;
                local_578._0_4_ = iVar149;
                lVar141 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar126 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize) *
                          (long)(int)(((int)uVar179 / local_3c8.w) * uVar150);
                iVar261 = 0;
                iVar262 = 0;
                iVar264 = 0;
                iVar263 = 0;
                iVar167 = 0;
                iVar137 = 0;
                iVar160 = 0;
                iVar177 = 0;
                pvVar161 = local_318;
                for (uVar138 = 0; (int)((uint)uVar138 | 7) < local_618; uVar138 = uVar138 + 8) {
                  for (lVar128 = 0; lVar125 != lVar128; lVar128 = lVar128 + 4) {
                    puVar154 = (ulong *)((long)local_4d8.data +
                                        (long)*(int *)(opt_q._0_8_ + lVar128) +
                                        (int)((long)((ulong)(uint)((int)(uint)uVar138 >> 0x1f) <<
                                                     0x20 | uVar138 & 0xffffffff) / (long)iVar164) *
                                        lVar141 + iVar149 * iVar135 + lVar126);
                    if (iVar164 == 8) {
                      uVar140 = *puVar154;
                    }
                    else {
                      uVar140 = CONCAT26(CONCAT11(*(undefined1 *)((long)puVar154 + lVar123),
                                                  *(undefined1 *)((long)puVar154 + (long)local_518))
                                         ,CONCAT24(CONCAT11(*(undefined1 *)
                                                             ((long)puVar154 + lVar130),
                                                            *(undefined1 *)
                                                             ((long)puVar154 + local_5b8._0_8_ * 4))
                                                   ,CONCAT13(*(undefined1 *)
                                                              ((long)puVar154 + lVar180),
                                                             CONCAT12(*(undefined1 *)
                                                                       ((long)puVar154 +
                                                                       local_5b8._0_8_ * 2),
                                                                      CONCAT11(*(undefined1 *)
                                                                                ((long)puVar154 +
                                                                                local_5b8._0_8_),
                                                                               (char)*puVar154)))));
                    }
                    auVar477._8_6_ = 0;
                    auVar477._0_8_ = uVar140;
                    auVar470[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar477[0xe] = (char)(uVar140 >> 0x38);
                    auVar477[0xf] = -((long)uVar140 < 0);
                    auVar476._14_2_ = auVar477._14_2_;
                    auVar476._8_5_ = 0;
                    auVar476._0_8_ = uVar140;
                    auVar476[0xd] = -(cVar408 < '\0');
                    auVar475._13_3_ = auVar476._13_3_;
                    auVar475._8_4_ = 0;
                    auVar475._0_8_ = uVar140;
                    auVar475[0xc] = cVar408;
                    auVar474._12_4_ = auVar475._12_4_;
                    auVar474._8_3_ = 0;
                    auVar474._0_8_ = uVar140;
                    auVar474[0xb] = -(cVar407 < '\0');
                    auVar473._11_5_ = auVar474._11_5_;
                    auVar473._8_2_ = 0;
                    auVar473._0_8_ = uVar140;
                    auVar473[10] = cVar407;
                    auVar472._10_6_ = auVar473._10_6_;
                    auVar472[8] = 0;
                    auVar472._0_8_ = uVar140;
                    auVar472[9] = -(cVar404 < '\0');
                    auVar471._9_7_ = auVar472._9_7_;
                    auVar471[8] = cVar404;
                    auVar471._0_8_ = uVar140;
                    auVar470._8_8_ = auVar471._8_8_;
                    auVar470[7] = -(cVar403 < '\0');
                    auVar470[6] = cVar403;
                    auVar470[5] = -(cVar402 < '\0');
                    auVar470[4] = cVar402;
                    auVar470[3] = -(cVar401 < '\0');
                    auVar470[2] = cVar401;
                    auVar470[1] = -(auVar470[0] < '\0');
                    auVar528 = *(undefined1 (*) [16])((long)pvVar161 + lVar128 * 4);
                    auVar619._0_14_ = auVar528._0_14_;
                    auVar619[0xe] = auVar528[7];
                    auVar619[0xf] = -(auVar528[7] < '\0');
                    auVar618._14_2_ = auVar619._14_2_;
                    auVar618._0_13_ = auVar528._0_13_;
                    auVar618[0xd] = -(auVar528[6] < '\0');
                    auVar617._13_3_ = auVar618._13_3_;
                    auVar617._0_12_ = auVar528._0_12_;
                    auVar617[0xc] = auVar528[6];
                    auVar616._12_4_ = auVar617._12_4_;
                    auVar616._0_11_ = auVar528._0_11_;
                    auVar616[0xb] = -(auVar528[5] < '\0');
                    auVar615._11_5_ = auVar616._11_5_;
                    auVar615._0_10_ = auVar528._0_10_;
                    auVar615[10] = auVar528[5];
                    auVar614._10_6_ = auVar615._10_6_;
                    auVar614._0_9_ = auVar528._0_9_;
                    auVar614[9] = -(auVar528[4] < '\0');
                    auVar613._9_7_ = auVar614._9_7_;
                    auVar613._0_8_ = auVar528._0_8_;
                    auVar613[8] = auVar528[4];
                    auVar612._8_8_ = auVar613._8_8_;
                    auVar612[7] = -(auVar528[3] < '\0');
                    auVar612[6] = auVar528[3];
                    auVar612[5] = -(auVar528[2] < '\0');
                    auVar612[4] = auVar528[2];
                    auVar612[3] = -(auVar528[1] < '\0');
                    auVar612[2] = auVar528[1];
                    auVar612[1] = -(auVar528[0] < '\0');
                    auVar612[0] = auVar528[0];
                    auVar535[1] = -(auVar528[8] < '\0');
                    auVar535[0] = auVar528[8];
                    auVar535[2] = auVar528[9];
                    auVar535[3] = -(auVar528[9] < '\0');
                    auVar535[4] = auVar528[10];
                    auVar535[5] = -(auVar528[10] < '\0');
                    auVar535[6] = auVar528[0xb];
                    auVar535[7] = -(auVar528[0xb] < '\0');
                    auVar535[8] = auVar528[0xc];
                    auVar535[9] = -(auVar528[0xc] < '\0');
                    auVar535[10] = auVar528[0xd];
                    auVar535[0xb] = -(auVar528[0xd] < '\0');
                    auVar535[0xc] = auVar528[0xe];
                    auVar535[0xd] = -(auVar528[0xe] < '\0');
                    auVar535[0xe] = auVar528[0xf];
                    auVar535[0xf] = -(auVar528[0xf] < '\0');
                    auVar528 = pmaddwd(auVar612,auVar470);
                    iVar261 = iVar261 + auVar528._0_4_;
                    iVar262 = iVar262 + auVar528._4_4_;
                    iVar264 = iVar264 + auVar528._8_4_;
                    iVar263 = iVar263 + auVar528._12_4_;
                    auVar528 = pmaddwd(auVar535,auVar470);
                    iVar167 = iVar167 + auVar528._0_4_;
                    iVar137 = iVar137 + auVar528._4_4_;
                    iVar160 = iVar160 + auVar528._8_4_;
                    iVar177 = iVar177 + auVar528._12_4_;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_460);
                }
                iVar261 = iVar263 + iVar262 + iVar264 + iVar261;
                iVar167 = iVar177 + iVar137 + iVar160 + iVar167;
                lVar126 = iVar149 * uVar151 + lVar126;
                for (; (long)(uVar138 | 1) < lVar142; uVar138 = uVar138 + 2) {
                  lVar128 = uVar138 * lVar141 + lVar126;
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    lVar129 = (long)*(int *)(opt_q._0_8_ + uVar140 * 4);
                    iVar149 = (int)*(char *)((long)local_4d8.data + lVar129 + lVar128);
                    iVar137 = (int)*(char *)((long)local_4d8.data +
                                            local_5b8._0_8_ + lVar129 + lVar128);
                    iVar261 = *(char *)((long)pvVar161 + uVar140 * 4 + 2) * iVar137 +
                              *(char *)((long)pvVar161 + uVar140 * 4) * iVar149 + iVar261;
                    iVar167 = *(char *)((long)pvVar161 + uVar140 * 4 + 3) * iVar137 +
                              *(char *)((long)pvVar161 + uVar140 * 4 + 1) * iVar149 + iVar167;
                  }
                  pvVar161 = (void *)((long)pvVar161 + lVar125);
                }
                for (; (long)uVar138 < lVar142; uVar138 = uVar138 + 1) {
                  for (uVar140 = 0; uVar178 != uVar140; uVar140 = uVar140 + 1) {
                    iVar149 = (int)*(char *)((long)local_4d8.data +
                                            (long)*(int *)(opt_q._0_8_ + uVar140 * 4) +
                                            uVar138 * lVar141 + lVar126);
                    iVar261 = iVar261 + *(char *)((long)pvVar161 + uVar140 * 2) * iVar149;
                    iVar167 = iVar167 + *(char *)((long)pvVar161 + uVar140 * 2 + 1) * iVar149;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_4f0);
                }
                *piVar124 = iVar261;
                *(int *)*pauVar157 = iVar167;
                pauVar157 = (undefined1 (*) [16])(*pauVar157 + 4);
                piVar134 = piVar124 + 1;
                local_378 = piVar124;
              }
              uVar138 = uVar172 + 1;
              local_230 = uVar172;
            }
            iVar146 = iVar146 * local_36c;
            lVar130 = (long)(local_20c * iVar164);
            local_5d8 = lVar130 * 3;
            lVar125 = lVar130 * 5;
            local_5b8._0_8_ = lVar130 * 6;
            lVar180 = lVar130 * 7;
            for (uVar127 = (ulong)(int)(uVar144 + (int)uVar127 * 2); (long)uVar127 < (long)uVar163;
                uVar127 = uVar127 + 1) {
              local_580 = (undefined1 (*) [16])
                          (local_3c8.cstep * uVar127 * local_3c8.elemsize + (long)local_3c8.data);
              uVar144 = (int)uVar127 >> 0x1f;
              uVar138 = (ulong)uVar144 << 0x20 | uVar127 & 0xffffffff;
              lVar141 = (long)((int)((long)((ulong)uVar144 << 0x20 | uVar127 & 0xffffffff) % 2) +
                               (int)((long)uVar138 / 4) +
                              (int)(char)((char)((long)uVar138 % 4) / '\x02'));
              uVar144 = 0;
              while( true ) {
                if (iVar146 <= (int)(uVar144 | 3)) break;
                iVar160 = (int)uVar144 % local_36c;
                uVar138 = CONCAT44((int)(uVar144 | 1) >> 0x1f,uVar144) | 1;
                uVar172 = CONCAT44((int)(uVar144 | 2) >> 0x1f,uVar144) | 2;
                iVar117 = (int)((long)uVar172 / (long)local_36c);
                local_518 = (int *)CONCAT44(local_518._4_4_,iVar117);
                uVar140 = CONCAT44((int)(uVar144 | 3) >> 0x1f,uVar144) | 3;
                pvVar161 = (void *)((this->weight_data_tm).cstep * lVar141 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                local_5a0 = CONCAT44(local_5a0._4_4_,iVar160);
                iVar137 = (int)((long)uVar138 % (long)local_36c);
                local_538 = CONCAT44(local_538._4_4_,iVar137);
                iVar167 = (int)((long)uVar172 % (long)local_36c);
                local_540 = CONCAT44(local_540._4_4_,iVar167);
                lVar129 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                local_578._0_8_ = lVar129;
                lVar169 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                iVar149 = (int)((long)uVar140 % (long)local_36c);
                lVar143 = (int)(((int)uVar144 / local_36c) * uVar150) * lVar169;
                lVar128 = (int)((int)((long)uVar138 / (long)local_36c) * uVar150) * lVar169;
                lVar123 = (int)(iVar117 * uVar150) * lVar169;
                lVar169 = (int)((int)((long)uVar140 / (long)local_36c) * uVar150) * lVar169;
                lVar126 = (long)local_4d8.data + iVar160 * iVar135 + lVar143;
                local_4f8 = (void *)((long)local_4d8.data + iVar137 * iVar135 + lVar128);
                local_500 = (void *)((long)local_4d8.data + iVar167 * iVar135 + lVar123);
                local_460 = (long)local_4d8.data + iVar149 * iVar135 + lVar169;
                iVar264 = 0;
                iVar263 = 0;
                iVar406 = 0;
                iVar410 = 0;
                auVar550 = (undefined1  [16])0x0;
                iVar117 = 0;
                iVar177 = 0;
                iVar261 = 0;
                iVar262 = 0;
                auVar600 = (undefined1  [16])0x0;
                for (uVar138 = 0; (int)((uint)uVar138 | 7) < local_618; uVar138 = uVar138 + 8) {
                  local_448._0_8_ = uVar138;
                  lVar162 = (int)((long)((ulong)(uint)((int)(uint)uVar138 >> 0x1f) << 0x20 |
                                        uVar138 & 0xffffffff) / (long)iVar164) * lVar129;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar168 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    puVar154 = (ulong *)(lVar126 + lVar162 + lVar168);
                    puVar153 = (ulong *)((long)local_4f8 + lVar168 + lVar162);
                    puVar1 = (ulong *)((long)local_500 + lVar168 + lVar162);
                    puVar171 = (ulong *)(lVar168 + lVar162 + local_460);
                    if (iVar164 == 8) {
                      auVar626._8_6_ = 0;
                      auVar626._0_8_ = *puVar154;
                      auVar189._8_6_ = 0;
                      auVar189._0_8_ = *puVar153;
                      auVar269._8_6_ = 0;
                      auVar269._0_8_ = *puVar1;
                      auVar689._8_6_ = 0;
                      auVar689._0_8_ = *puVar171;
                    }
                    else {
                      auVar268 = SUB1614(ZEXT416(0xffff00ff),0);
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar154 + lVar130)),8);
                      local_518 = (int *)CONCAT44(iVar177,iVar117);
                      auVar266 = DAT_00537f60._0_14_;
                      auVar186 = DAT_00537f70._0_14_;
                      auVar806 = DAT_00537f80._0_14_;
                      bVar131 = *(byte *)((long)puVar154 + lVar130 * 4);
                      auVar188 = auVar528._0_14_;
                      auVar190 = auVar300._0_14_;
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar626 = ~auVar270 & ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar154 + local_5b8._0_8_)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar154 + lVar125)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar154 + local_5d8)) << 0x18
                                 | ~auVar186 &
                                   ZEXT114(*(byte *)((long)puVar154 + lVar130 * 2)) << 0x10 |
                                 ~auVar266 & auVar425._0_14_ | ZEXT114((byte)*puVar154) & auVar268)
                                 & auVar689) & auVar270;
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar153 + lVar130)),8);
                      bVar131 = *(byte *)((long)puVar153 + lVar130 * 4);
                      auVar189 = ~auVar270 & ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar153 + local_5b8._0_8_)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar153 + lVar125)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar153 + local_5d8)) << 0x18
                                 | ~auVar186 &
                                   ZEXT114(*(byte *)((long)puVar153 + lVar130 * 2)) << 0x10 |
                                 ~auVar266 & auVar425._0_14_ | ZEXT114((byte)*puVar153) & auVar268)
                                 & auVar689) & auVar270;
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar1 + lVar130)),8);
                      bVar131 = *(byte *)((long)puVar1 + lVar130 * 4);
                      auVar269 = ~auVar270 & ZEXT114(*(byte *)((long)puVar1 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar1 + local_5b8._0_8_)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar1 + lVar125)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar1 + local_5d8)) << 0x18 |
                                 ~auVar186 & ZEXT114(*(byte *)((long)puVar1 + lVar130 * 2)) << 0x10
                                 | ~auVar266 & auVar425._0_14_ | ZEXT114((byte)*puVar1) & auVar268)
                                 & auVar689) & auVar270;
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar171 + lVar130)),8);
                      bVar131 = *(byte *)((long)puVar171 + lVar130 * 4);
                      auVar689 = ~auVar270 & ZEXT114(*(byte *)((long)puVar171 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar171 + local_5b8._0_8_)) << 0x30 |
                                 (~auVar190 & ZEXT114(*(byte *)((long)puVar171 + lVar125)) << 0x28 |
                                  ~auVar188 & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~auVar806 & ZEXT114(*(byte *)((long)puVar171 + local_5d8)) << 0x18
                                 | ~auVar186 &
                                   ZEXT114(*(byte *)((long)puVar171 + lVar130 * 2)) << 0x10 |
                                 ~auVar266 & auVar425._0_14_ | ZEXT114((byte)*puVar171) & auVar268)
                                 & auVar689) & auVar270;
                      local_528 = auVar550;
                      iStack_510 = iVar261;
                      iStack_50c = iVar262;
                    }
                    auVar645[0] = auVar626[0];
                    auVar652[0xe] = auVar626[7];
                    auVar652._0_14_ = auVar626;
                    auVar652[0xf] = -(auVar626[7] < '\0');
                    auVar651._14_2_ = auVar652._14_2_;
                    auVar651._0_13_ = auVar626._0_13_;
                    auVar651[0xd] = -(auVar626[6] < '\0');
                    auVar650._13_3_ = auVar651._13_3_;
                    auVar650._0_12_ = auVar626._0_12_;
                    auVar650[0xc] = auVar626[6];
                    auVar649._12_4_ = auVar650._12_4_;
                    auVar649._0_11_ = auVar626._0_11_;
                    auVar649[0xb] = -(auVar626[5] < '\0');
                    auVar648._11_5_ = auVar649._11_5_;
                    auVar648._0_10_ = auVar626._0_10_;
                    auVar648[10] = auVar626[5];
                    auVar647._10_6_ = auVar648._10_6_;
                    auVar647._0_9_ = auVar626._0_9_;
                    auVar647[9] = -(auVar626[4] < '\0');
                    auVar646._9_7_ = auVar647._9_7_;
                    auVar646._0_8_ = auVar626._0_8_;
                    auVar646[8] = auVar626[4];
                    auVar645._8_8_ = auVar646._8_8_;
                    auVar645[7] = -(auVar626[3] < '\0');
                    auVar645[6] = auVar626[3];
                    auVar645[5] = -(auVar626[2] < '\0');
                    auVar645[4] = auVar626[2];
                    auVar645[3] = -(auVar626[1] < '\0');
                    auVar645[2] = auVar626[1];
                    auVar645[1] = -(auVar645[0] < '\0');
                    auVar240[0] = auVar189[0];
                    auVar247[0xe] = auVar189[7];
                    auVar247._0_14_ = auVar189;
                    auVar247[0xf] = -(auVar189[7] < '\0');
                    auVar246._14_2_ = auVar247._14_2_;
                    auVar246._0_13_ = auVar189._0_13_;
                    auVar246[0xd] = -(auVar189[6] < '\0');
                    auVar245._13_3_ = auVar246._13_3_;
                    auVar245._0_12_ = auVar189._0_12_;
                    auVar245[0xc] = auVar189[6];
                    auVar244._12_4_ = auVar245._12_4_;
                    auVar244._0_11_ = auVar189._0_11_;
                    auVar244[0xb] = -(auVar189[5] < '\0');
                    auVar243._11_5_ = auVar244._11_5_;
                    auVar243._0_10_ = auVar189._0_10_;
                    auVar243[10] = auVar189[5];
                    auVar242._10_6_ = auVar243._10_6_;
                    auVar242._0_9_ = auVar189._0_9_;
                    auVar242[9] = -(auVar189[4] < '\0');
                    auVar241._9_7_ = auVar242._9_7_;
                    auVar241._0_8_ = auVar189._0_8_;
                    auVar241[8] = auVar189[4];
                    auVar240._8_8_ = auVar241._8_8_;
                    auVar240[7] = -(auVar189[3] < '\0');
                    auVar240[6] = auVar189[3];
                    auVar240[5] = -(auVar189[2] < '\0');
                    auVar240[4] = auVar189[2];
                    auVar240[3] = -(auVar189[1] < '\0');
                    auVar240[2] = auVar189[1];
                    auVar240[1] = -(auVar240[0] < '\0');
                    auVar376[0] = auVar269[0];
                    auVar383[0xe] = auVar269[7];
                    auVar383._0_14_ = auVar269;
                    auVar383[0xf] = -(auVar269[7] < '\0');
                    auVar382._14_2_ = auVar383._14_2_;
                    auVar382._0_13_ = auVar269._0_13_;
                    auVar382[0xd] = -(auVar269[6] < '\0');
                    auVar381._13_3_ = auVar382._13_3_;
                    auVar381._0_12_ = auVar269._0_12_;
                    auVar381[0xc] = auVar269[6];
                    auVar380._12_4_ = auVar381._12_4_;
                    auVar380._0_11_ = auVar269._0_11_;
                    auVar380[0xb] = -(auVar269[5] < '\0');
                    auVar379._11_5_ = auVar380._11_5_;
                    auVar379._0_10_ = auVar269._0_10_;
                    auVar379[10] = auVar269[5];
                    auVar378._10_6_ = auVar379._10_6_;
                    auVar378._0_9_ = auVar269._0_9_;
                    auVar378[9] = -(auVar269[4] < '\0');
                    auVar377._9_7_ = auVar378._9_7_;
                    auVar377._0_8_ = auVar269._0_8_;
                    auVar377[8] = auVar269[4];
                    auVar376._8_8_ = auVar377._8_8_;
                    auVar376[7] = -(auVar269[3] < '\0');
                    auVar376[6] = auVar269[3];
                    auVar376[5] = -(auVar269[2] < '\0');
                    auVar376[4] = auVar269[2];
                    auVar376[3] = -(auVar269[1] < '\0');
                    auVar376[2] = auVar269[1];
                    auVar376[1] = -(auVar376[0] < '\0');
                    auVar719[0] = auVar689[0];
                    auVar726[0xe] = auVar689[7];
                    auVar726._0_14_ = auVar689;
                    auVar726[0xf] = -(auVar689[7] < '\0');
                    auVar725._14_2_ = auVar726._14_2_;
                    auVar725._0_13_ = auVar689._0_13_;
                    auVar725[0xd] = -(auVar689[6] < '\0');
                    auVar724._13_3_ = auVar725._13_3_;
                    auVar724._0_12_ = auVar689._0_12_;
                    auVar724[0xc] = auVar689[6];
                    auVar723._12_4_ = auVar724._12_4_;
                    auVar723._0_11_ = auVar689._0_11_;
                    auVar723[0xb] = -(auVar689[5] < '\0');
                    auVar722._11_5_ = auVar723._11_5_;
                    auVar722._0_10_ = auVar689._0_10_;
                    auVar722[10] = auVar689[5];
                    auVar721._10_6_ = auVar722._10_6_;
                    auVar721._0_9_ = auVar689._0_9_;
                    auVar721[9] = -(auVar689[4] < '\0');
                    auVar720._9_7_ = auVar721._9_7_;
                    auVar720._0_8_ = auVar689._0_8_;
                    auVar720[8] = auVar689[4];
                    auVar719._8_8_ = auVar720._8_8_;
                    auVar719[7] = -(auVar689[3] < '\0');
                    auVar719[6] = auVar689[3];
                    auVar719[5] = -(auVar689[2] < '\0');
                    auVar719[4] = auVar689[2];
                    auVar719[3] = -(auVar689[1] < '\0');
                    auVar719[2] = auVar689[1];
                    auVar719[1] = -(auVar719[0] < '\0');
                    uVar140 = *(ulong *)((long)pvVar161 + uVar172 * 8);
                    auVar536[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar543._8_6_ = 0;
                    auVar543._0_8_ = uVar140;
                    auVar543[0xe] = (char)(uVar140 >> 0x38);
                    auVar543[0xf] = -((long)uVar140 < 0);
                    auVar542._14_2_ = auVar543._14_2_;
                    auVar542._8_5_ = 0;
                    auVar542._0_8_ = uVar140;
                    auVar542[0xd] = -(cVar408 < '\0');
                    auVar541._13_3_ = auVar542._13_3_;
                    auVar541._8_4_ = 0;
                    auVar541._0_8_ = uVar140;
                    auVar541[0xc] = cVar408;
                    auVar540._12_4_ = auVar541._12_4_;
                    auVar540._8_3_ = 0;
                    auVar540._0_8_ = uVar140;
                    auVar540[0xb] = -(cVar407 < '\0');
                    auVar539._11_5_ = auVar540._11_5_;
                    auVar539._8_2_ = 0;
                    auVar539._0_8_ = uVar140;
                    auVar539[10] = cVar407;
                    auVar538._10_6_ = auVar539._10_6_;
                    auVar538[8] = 0;
                    auVar538._0_8_ = uVar140;
                    auVar538[9] = -(cVar404 < '\0');
                    auVar537._9_7_ = auVar538._9_7_;
                    auVar537[8] = cVar404;
                    auVar537._0_8_ = uVar140;
                    auVar536._8_8_ = auVar537._8_8_;
                    auVar536[7] = -(cVar403 < '\0');
                    auVar536[6] = cVar403;
                    auVar536[5] = -(cVar402 < '\0');
                    auVar536[4] = cVar402;
                    auVar536[3] = -(cVar401 < '\0');
                    auVar536[2] = cVar401;
                    auVar536[1] = -(auVar536[0] < '\0');
                    auVar425 = pmaddwd(auVar645,auVar536);
                    iVar264 = iVar264 + auVar425._0_4_;
                    iVar263 = iVar263 + auVar425._4_4_;
                    iVar406 = iVar406 + auVar425._8_4_;
                    iVar410 = iVar410 + auVar425._12_4_;
                    auVar425 = pmaddwd(auVar240,auVar536);
                    auVar620._0_4_ = auVar550._0_4_ + auVar425._0_4_;
                    auVar620._4_4_ = auVar550._4_4_ + auVar425._4_4_;
                    auVar620._8_4_ = auVar550._8_4_ + auVar425._8_4_;
                    auVar620._12_4_ = auVar550._12_4_ + auVar425._12_4_;
                    auVar550 = pmaddwd(auVar376,auVar536);
                    iVar117 = iVar117 + auVar550._0_4_;
                    iVar177 = iVar177 + auVar550._4_4_;
                    iVar261 = iVar261 + auVar550._8_4_;
                    iVar262 = iVar262 + auVar550._12_4_;
                    auVar550 = pmaddwd(auVar536,auVar719);
                    auVar748._0_4_ = auVar600._0_4_ + auVar550._0_4_;
                    auVar748._4_4_ = auVar600._4_4_ + auVar550._4_4_;
                    auVar748._8_4_ = auVar600._8_4_ + auVar550._8_4_;
                    auVar748._12_4_ = auVar600._12_4_ + auVar550._12_4_;
                    auVar550 = auVar620;
                    auVar600 = auVar748;
                  }
                  pvVar161 = (void *)((long)pvVar161 + (long)local_530);
                }
                auVar674._0_4_ = iVar410 + iVar406 + iVar263 + iVar264;
                auVar674._4_4_ = auVar550._12_4_ + auVar550._8_4_ + auVar550._4_4_ + auVar550._0_4_;
                auVar674._8_4_ = iVar262 + iVar261 + iVar177 + iVar117;
                auVar674._12_4_ = auVar600._12_4_ + auVar600._8_4_ + auVar600._4_4_ + auVar600._0_4_
                ;
                local_598 = (void *)((long)local_4d8.data + iVar160 * uVar151 + lVar143);
                local_488._0_8_ = (long)local_4d8.data + iVar137 * uVar151 + lVar128;
                local_4e8._0_8_ = (long)local_4d8.data + iVar167 * uVar151 + lVar123;
                local_558._0_8_ = (long)local_4d8.data + iVar149 * uVar151 + lVar169;
                for (; (long)(uVar138 | 1) < lVar142; uVar138 = uVar138 + 2) {
                  lVar123 = uVar138 * lVar129;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar128 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    auVar478._14_2_ =
                         (short)*(char *)(lVar130 + lVar123 + local_558._0_8_ + lVar128);
                    auVar478._12_2_ = (short)*(char *)(lVar123 + local_558._0_8_ + lVar128);
                    auVar478._10_2_ =
                         (short)*(char *)(lVar130 + local_4e8._0_8_ + lVar123 + lVar128);
                    auVar478._8_2_ = (short)*(char *)(local_4e8._0_8_ + lVar123 + lVar128);
                    auVar478._6_2_ = (short)*(char *)(lVar130 + local_488._0_8_ + lVar123 + lVar128)
                    ;
                    auVar478._4_2_ = (short)*(char *)(local_488._0_8_ + lVar123 + lVar128);
                    auVar478._0_2_ = (short)*(char *)((long)local_598 + lVar128 + lVar123);
                    auVar478._2_2_ = (short)*(char *)((long)local_598 + lVar130 + lVar128 + lVar123)
                    ;
                    uVar39 = *(undefined2 *)((long)pvVar161 + uVar172 * 2);
                    uVar258 = (undefined1)((ushort)uVar39 >> 8);
                    uVar183 = CONCAT22((short)(CONCAT13(uVar258,CONCAT12(uVar258,uVar39)) >> 0x10),
                                       CONCAT11((char)uVar39,(char)uVar39));
                    auVar248._4_4_ = uVar183;
                    auVar248._0_4_ = uVar183;
                    auVar248._8_4_ = uVar183;
                    auVar248._12_4_ = uVar183;
                    auVar550 = psraw(auVar248,8);
                    auVar550 = pmaddwd(auVar550,auVar478);
                    auVar675._0_4_ = auVar674._0_4_ + auVar550._0_4_;
                    auVar675._4_4_ = auVar674._4_4_ + auVar550._4_4_;
                    auVar675._8_4_ = auVar674._8_4_ + auVar550._8_4_;
                    auVar675._12_4_ = auVar674._12_4_ + auVar550._12_4_;
                    auVar674 = auVar675;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_4f0);
                }
                for (; (long)uVar138 < lVar142; uVar138 = uVar138 + 1) {
                  lVar123 = uVar138 * lVar129;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar128 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    auVar550 = pshuflw(ZEXT416((uint)(int)*(char *)((long)pvVar161 + uVar172)),
                                       ZEXT416((uint)(int)*(char *)((long)pvVar161 + uVar172)),0);
                    auVar249._0_4_ = auVar550._0_4_;
                    auVar249._4_4_ = auVar249._0_4_;
                    auVar249._8_4_ = auVar249._0_4_;
                    auVar249._12_4_ = auVar249._0_4_;
                    sVar497 = (short)*(char *)((long)local_598 + lVar128 + lVar123);
                    sVar176 = (short)*(char *)(local_488._0_8_ + lVar123 + lVar128);
                    sVar148 = (short)*(char *)(local_4e8._0_8_ + lVar123 + lVar128);
                    auVar384._2_2_ = sVar176;
                    auVar384._0_2_ = sVar497;
                    auVar384._4_2_ = sVar148;
                    sVar622 = (short)*(char *)(lVar123 + local_558._0_8_ + lVar128);
                    auVar384._6_2_ = sVar622;
                    auVar384._8_8_ = 0;
                    uVar499 = sVar622 * auVar550._2_2_;
                    auVar479._0_10_ = (unkuint10)uVar499 << 0x30;
                    auVar480._0_12_ = ZEXT212(uVar499) << 0x30;
                    auVar600 = pmulhw(auVar384,auVar249);
                    auVar480._12_2_ = uVar499;
                    auVar480._14_2_ = auVar600._6_2_;
                    auVar479._12_4_ = auVar480._12_4_;
                    auVar479._10_2_ = auVar600._4_2_;
                    Var95 = CONCAT64(auVar479._10_6_,CONCAT22(sVar148 * auVar550._0_2_,uVar499));
                    auVar111._4_8_ = (long)((unkuint10)Var95 >> 0x10);
                    auVar111._2_2_ = auVar600._2_2_;
                    auVar111._0_2_ = sVar176 * auVar550._2_2_;
                    auVar676._0_4_ =
                         auVar674._0_4_ + CONCAT22(auVar600._0_2_,sVar497 * auVar550._0_2_);
                    auVar676._4_4_ = auVar674._4_4_ + auVar111._0_4_;
                    auVar676._8_4_ = auVar674._8_4_ + (int)((unkuint10)Var95 >> 0x10);
                    auVar676._12_4_ = auVar674._12_4_ + auVar479._12_4_;
                    auVar674 = auVar676;
                  }
                  pvVar161 = (void *)((long)pvVar161 + uVar178);
                }
                *local_580 = auVar674;
                local_580 = local_580 + 1;
                uVar144 = uVar144 + 4;
              }
              local_488._0_8_ =
                   (this->weight_data_tm).cstep * lVar141 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data;
              for (; (int)(uVar144 | 1) < iVar146; uVar144 = uVar144 + 2) {
                iVar149 = (int)uVar144 % local_36c;
                uVar138 = CONCAT44((int)(uVar144 | 1) >> 0x1f,uVar144) | 1;
                local_598 = (void *)CONCAT44(local_598._4_4_,iVar149);
                iVar117 = (int)((long)uVar138 % (long)local_36c);
                local_578._0_4_ = iVar117;
                lVar128 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar123 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar129 = (int)(((int)uVar144 / local_36c) * uVar150) * lVar123;
                lVar123 = (int)((int)((long)uVar138 / (long)local_36c) * uVar150) * lVar123;
                auVar600 = (undefined1  [16])0x0;
                auVar550 = (undefined1  [16])0x0;
                pvVar161 = (void *)local_488._0_8_;
                for (uVar138 = 0; (int)((uint)uVar138 | 7) < local_618; uVar138 = uVar138 + 8) {
                  lVar143 = (int)((long)((ulong)(uint)((int)(uint)uVar138 >> 0x1f) << 0x20 |
                                        uVar138 & 0xffffffff) / (long)iVar164) * lVar128;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar169 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    puVar154 = (ulong *)((long)local_4d8.data +
                                        lVar169 + lVar143 + iVar149 * iVar135 + lVar129);
                    puVar153 = (ulong *)((long)local_4d8.data +
                                        lVar169 + lVar143 + iVar117 * iVar135 + lVar123);
                    if (iVar164 == 8) {
                      auVar190._8_6_ = 0;
                      auVar190._0_8_ = *puVar154;
                      auVar270._8_6_ = 0;
                      auVar270._0_8_ = *puVar153;
                    }
                    else {
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar154 + lVar130)),8);
                      bVar131 = *(byte *)((long)puVar154 + lVar130 * 4);
                      auVar689 = DAT_00537fb0._0_14_;
                      auVar270 = DAT_00537fc0._0_14_;
                      auVar190 = ~auVar270 & ZEXT114(*(byte *)((long)puVar154 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar154 + local_5b8._0_8_)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar154 + lVar125)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + local_5d8)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar154 + lVar130 * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar425._0_14_ |
                                 ZEXT114((byte)*puVar154) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                      auVar425 = psllw(ZEXT116(*(byte *)((long)puVar153 + lVar130)),8);
                      bVar131 = *(byte *)((long)puVar153 + lVar130 * 4);
                      auVar270 = ~auVar270 & ZEXT114(*(byte *)((long)puVar153 + lVar180)) << 0x38 |
                                 (~auVar689 &
                                  ZEXT114(*(byte *)((long)puVar153 + local_5b8._0_8_)) << 0x30 |
                                 (~DAT_00537fa0._0_14_ &
                                  ZEXT114(*(byte *)((long)puVar153 + lVar125)) << 0x28 |
                                  ~DAT_00537f90._0_14_ & ZEXT514(CONCAT14(bVar131,(uint)bVar131)) |
                                 ~DAT_00537f80._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + local_5d8)) << 0x18 |
                                 ~DAT_00537f70._0_14_ &
                                 ZEXT114(*(byte *)((long)puVar153 + lVar130 * 2)) << 0x10 |
                                 ~DAT_00537f60._0_14_ & auVar425._0_14_ |
                                 ZEXT114((byte)*puVar153) & SUB1614(ZEXT416(0xffff00ff),0)) &
                                 auVar689) & auVar270;
                    }
                    auVar250[0] = auVar190[0];
                    auVar257[0xe] = auVar190[7];
                    auVar257._0_14_ = auVar190;
                    auVar257[0xf] = -(auVar190[7] < '\0');
                    auVar256._14_2_ = auVar257._14_2_;
                    auVar256._0_13_ = auVar190._0_13_;
                    auVar256[0xd] = -(auVar190[6] < '\0');
                    auVar255._13_3_ = auVar256._13_3_;
                    auVar255._0_12_ = auVar190._0_12_;
                    auVar255[0xc] = auVar190[6];
                    auVar254._12_4_ = auVar255._12_4_;
                    auVar254._0_11_ = auVar190._0_11_;
                    auVar254[0xb] = -(auVar190[5] < '\0');
                    auVar253._11_5_ = auVar254._11_5_;
                    auVar253._0_10_ = auVar190._0_10_;
                    auVar253[10] = auVar190[5];
                    auVar252._10_6_ = auVar253._10_6_;
                    auVar252._0_9_ = auVar190._0_9_;
                    auVar252[9] = -(auVar190[4] < '\0');
                    auVar251._9_7_ = auVar252._9_7_;
                    auVar251._0_8_ = auVar190._0_8_;
                    auVar251[8] = auVar190[4];
                    auVar250._8_8_ = auVar251._8_8_;
                    auVar250[7] = -(auVar190[3] < '\0');
                    auVar250[6] = auVar190[3];
                    auVar250[5] = -(auVar190[2] < '\0');
                    auVar250[4] = auVar190[2];
                    auVar250[3] = -(auVar190[1] < '\0');
                    auVar250[2] = auVar190[1];
                    auVar250[1] = -(auVar250[0] < '\0');
                    auVar385[0] = auVar270[0];
                    auVar392[0xe] = auVar270[7];
                    auVar392._0_14_ = auVar270;
                    auVar392[0xf] = -(auVar270[7] < '\0');
                    auVar391._14_2_ = auVar392._14_2_;
                    auVar391._0_13_ = auVar270._0_13_;
                    auVar391[0xd] = -(auVar270[6] < '\0');
                    auVar390._13_3_ = auVar391._13_3_;
                    auVar390._0_12_ = auVar270._0_12_;
                    auVar390[0xc] = auVar270[6];
                    auVar389._12_4_ = auVar390._12_4_;
                    auVar389._0_11_ = auVar270._0_11_;
                    auVar389[0xb] = -(auVar270[5] < '\0');
                    auVar388._11_5_ = auVar389._11_5_;
                    auVar388._0_10_ = auVar270._0_10_;
                    auVar388[10] = auVar270[5];
                    auVar387._10_6_ = auVar388._10_6_;
                    auVar387._0_9_ = auVar270._0_9_;
                    auVar387[9] = -(auVar270[4] < '\0');
                    auVar386._9_7_ = auVar387._9_7_;
                    auVar386._0_8_ = auVar270._0_8_;
                    auVar386[8] = auVar270[4];
                    auVar385._8_8_ = auVar386._8_8_;
                    auVar385[7] = -(auVar270[3] < '\0');
                    auVar385[6] = auVar270[3];
                    auVar385[5] = -(auVar270[2] < '\0');
                    auVar385[4] = auVar270[2];
                    auVar385[3] = -(auVar270[1] < '\0');
                    auVar385[2] = auVar270[1];
                    auVar385[1] = -(auVar385[0] < '\0');
                    uVar140 = *(ulong *)((long)pvVar161 + uVar172 * 8);
                    auVar481[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar488._8_6_ = 0;
                    auVar488._0_8_ = uVar140;
                    auVar488[0xe] = (char)(uVar140 >> 0x38);
                    auVar488[0xf] = -((long)uVar140 < 0);
                    auVar487._14_2_ = auVar488._14_2_;
                    auVar487._8_5_ = 0;
                    auVar487._0_8_ = uVar140;
                    auVar487[0xd] = -(cVar408 < '\0');
                    auVar486._13_3_ = auVar487._13_3_;
                    auVar486._8_4_ = 0;
                    auVar486._0_8_ = uVar140;
                    auVar486[0xc] = cVar408;
                    auVar485._12_4_ = auVar486._12_4_;
                    auVar485._8_3_ = 0;
                    auVar485._0_8_ = uVar140;
                    auVar485[0xb] = -(cVar407 < '\0');
                    auVar484._11_5_ = auVar485._11_5_;
                    auVar484._8_2_ = 0;
                    auVar484._0_8_ = uVar140;
                    auVar484[10] = cVar407;
                    auVar483._10_6_ = auVar484._10_6_;
                    auVar483[8] = 0;
                    auVar483._0_8_ = uVar140;
                    auVar483[9] = -(cVar404 < '\0');
                    auVar482._9_7_ = auVar483._9_7_;
                    auVar482[8] = cVar404;
                    auVar482._0_8_ = uVar140;
                    auVar481._8_8_ = auVar482._8_8_;
                    auVar481[7] = -(cVar403 < '\0');
                    auVar481[6] = cVar403;
                    auVar481[5] = -(cVar402 < '\0');
                    auVar481[4] = cVar402;
                    auVar481[3] = -(cVar401 < '\0');
                    auVar481[2] = cVar401;
                    auVar481[1] = -(auVar481[0] < '\0');
                    auVar425 = pmaddwd(auVar250,auVar481);
                    auVar677._0_4_ = auVar600._0_4_ + auVar425._0_4_;
                    auVar677._4_4_ = auVar600._4_4_ + auVar425._4_4_;
                    auVar677._8_4_ = auVar600._8_4_ + auVar425._8_4_;
                    auVar677._12_4_ = auVar600._12_4_ + auVar425._12_4_;
                    auVar600 = pmaddwd(auVar481,auVar385);
                    auVar653._0_4_ = auVar550._0_4_ + auVar600._0_4_;
                    auVar653._4_4_ = auVar550._4_4_ + auVar600._4_4_;
                    auVar653._8_4_ = auVar550._8_4_ + auVar600._8_4_;
                    auVar653._12_4_ = auVar550._12_4_ + auVar600._12_4_;
                    auVar550 = auVar653;
                    auVar600 = auVar677;
                  }
                  pvVar161 = (void *)((long)pvVar161 + (long)local_530);
                }
                iVar167 = auVar600._12_4_ + auVar600._4_4_ + auVar600._8_4_ + auVar600._0_4_;
                iVar137 = auVar550._12_4_ + auVar550._4_4_ + auVar550._8_4_ + auVar550._0_4_;
                local_518 = (int *)((long)local_4d8.data + iVar149 * uVar151 + lVar129);
                local_528._0_8_ = (long)local_4d8.data + iVar117 * uVar151 + lVar123;
                for (; (long)(uVar138 | 1) < lVar142; uVar138 = uVar138 + 2) {
                  lVar123 = uVar138 * lVar128;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar129 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    iVar117 = (int)*(char *)((long)pvVar161 + uVar172 * 2);
                    iVar149 = (int)*(char *)((long)pvVar161 + uVar172 * 2 + 1);
                    iVar167 = *(char *)((long)local_518 + lVar130 + lVar129 + lVar123) * iVar149 +
                              *(char *)((long)local_518 + lVar129 + lVar123) * iVar117 + iVar167;
                    iVar137 = *(char *)(lVar130 + lVar123 + local_528._0_8_ + lVar129) * iVar149 +
                              *(char *)(lVar123 + local_528._0_8_ + lVar129) * iVar117 + iVar137;
                  }
                  pvVar161 = (void *)((long)pvVar161 + local_4f0);
                }
                for (; (long)uVar138 < lVar142; uVar138 = uVar138 + 1) {
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar123 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    iVar167 = iVar167 + (int)*(char *)((long)local_518 + lVar123 + uVar138 * lVar128
                                                      ) * (int)*(char *)((long)pvVar161 + uVar172);
                    iVar137 = iVar137 + (int)*(char *)(uVar138 * lVar128 + local_528._0_8_ + lVar123
                                                      ) * (int)*(char *)((long)pvVar161 + uVar172);
                  }
                  pvVar161 = (void *)((long)pvVar161 + uVar178);
                }
                *(int *)*local_580 = iVar167;
                *(int *)(*local_580 + 4) = iVar137;
                local_580 = (undefined1 (*) [16])(*local_580 + 8);
              }
              local_5e0 = (undefined1 (*) [16])
                          (lVar141 * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize
                          + (long)(this->weight_data_tm).data);
              for (; (int)uVar144 < iVar146; uVar144 = uVar144 + 1) {
                iVar117 = (int)uVar144 % local_36c;
                local_528._0_4_ = iVar117;
                lVar123 = local_4d8.cstep *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize);
                lVar141 = (long)local_4d8.w *
                          CONCAT44(local_4d8.elemsize._4_4_,(undefined4)local_4d8.elemsize) *
                          (long)(int)(((int)uVar144 / local_36c) * uVar150);
                local_518 = (int *)((long)local_4d8.data + iVar117 * iVar135 + lVar141);
                iVar149 = 0;
                iVar167 = 0;
                iVar137 = 0;
                iVar160 = 0;
                pauVar157 = local_5e0;
                for (uVar138 = 0; (int)((uint)uVar138 | 7) < local_618; uVar138 = uVar138 + 8) {
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    puVar154 = (ulong *)((long)local_518 +
                                        (long)*(int *)(opt_q._0_8_ + uVar172 * 4) +
                                        (int)((long)((ulong)(uint)((int)(uint)uVar138 >> 0x1f) <<
                                                     0x20 | uVar138 & 0xffffffff) / (long)iVar164) *
                                        lVar123);
                    if (iVar164 == 8) {
                      uVar140 = *puVar154;
                    }
                    else {
                      uVar140 = CONCAT26(CONCAT11(*(undefined1 *)((long)puVar154 + lVar180),
                                                  *(undefined1 *)((long)puVar154 + local_5b8._0_8_))
                                         ,CONCAT24(CONCAT11(*(undefined1 *)
                                                             ((long)puVar154 + lVar125),
                                                            *(undefined1 *)
                                                             ((long)puVar154 + lVar130 * 4)),
                                                   CONCAT13(*(undefined1 *)
                                                             ((long)puVar154 + local_5d8),
                                                            CONCAT12(*(undefined1 *)
                                                                      ((long)puVar154 + lVar130 * 2)
                                                                     ,CONCAT11(*(undefined1 *)
                                                                                ((long)puVar154 +
                                                                                lVar130),
                                                                               (char)*puVar154)))));
                    }
                    auVar400._8_6_ = 0;
                    auVar400._0_8_ = uVar140;
                    auVar393[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar400[0xe] = (char)(uVar140 >> 0x38);
                    auVar400[0xf] = -((long)uVar140 < 0);
                    auVar399._14_2_ = auVar400._14_2_;
                    auVar399._8_5_ = 0;
                    auVar399._0_8_ = uVar140;
                    auVar399[0xd] = -(cVar408 < '\0');
                    auVar398._13_3_ = auVar399._13_3_;
                    auVar398._8_4_ = 0;
                    auVar398._0_8_ = uVar140;
                    auVar398[0xc] = cVar408;
                    auVar397._12_4_ = auVar398._12_4_;
                    auVar397._8_3_ = 0;
                    auVar397._0_8_ = uVar140;
                    auVar397[0xb] = -(cVar407 < '\0');
                    auVar396._11_5_ = auVar397._11_5_;
                    auVar396._8_2_ = 0;
                    auVar396._0_8_ = uVar140;
                    auVar396[10] = cVar407;
                    auVar395._10_6_ = auVar396._10_6_;
                    auVar395[8] = 0;
                    auVar395._0_8_ = uVar140;
                    auVar395[9] = -(cVar404 < '\0');
                    auVar394._9_7_ = auVar395._9_7_;
                    auVar394[8] = cVar404;
                    auVar394._0_8_ = uVar140;
                    auVar393._8_8_ = auVar394._8_8_;
                    auVar393[7] = -(cVar403 < '\0');
                    auVar393[6] = cVar403;
                    auVar393[5] = -(cVar402 < '\0');
                    auVar393[4] = cVar402;
                    auVar393[3] = -(cVar401 < '\0');
                    auVar393[2] = cVar401;
                    auVar393[1] = -(auVar393[0] < '\0');
                    uVar140 = *(ulong *)((long)*pauVar157 + uVar172 * 8);
                    auVar489[0] = (char)uVar140;
                    cVar401 = (char)(uVar140 >> 8);
                    cVar402 = (char)(uVar140 >> 0x10);
                    cVar403 = (char)(uVar140 >> 0x18);
                    cVar404 = (char)(uVar140 >> 0x20);
                    cVar407 = (char)(uVar140 >> 0x28);
                    cVar408 = (char)(uVar140 >> 0x30);
                    auVar496._8_6_ = 0;
                    auVar496._0_8_ = uVar140;
                    auVar496[0xe] = (char)(uVar140 >> 0x38);
                    auVar496[0xf] = -((long)uVar140 < 0);
                    auVar495._14_2_ = auVar496._14_2_;
                    auVar495._8_5_ = 0;
                    auVar495._0_8_ = uVar140;
                    auVar495[0xd] = -(cVar408 < '\0');
                    auVar494._13_3_ = auVar495._13_3_;
                    auVar494._8_4_ = 0;
                    auVar494._0_8_ = uVar140;
                    auVar494[0xc] = cVar408;
                    auVar493._12_4_ = auVar494._12_4_;
                    auVar493._8_3_ = 0;
                    auVar493._0_8_ = uVar140;
                    auVar493[0xb] = -(cVar407 < '\0');
                    auVar492._11_5_ = auVar493._11_5_;
                    auVar492._8_2_ = 0;
                    auVar492._0_8_ = uVar140;
                    auVar492[10] = cVar407;
                    auVar491._10_6_ = auVar492._10_6_;
                    auVar491[8] = 0;
                    auVar491._0_8_ = uVar140;
                    auVar491[9] = -(cVar404 < '\0');
                    auVar490._9_7_ = auVar491._9_7_;
                    auVar490[8] = cVar404;
                    auVar490._0_8_ = uVar140;
                    auVar489._8_8_ = auVar490._8_8_;
                    auVar489[7] = -(cVar403 < '\0');
                    auVar489[6] = cVar403;
                    auVar489[5] = -(cVar402 < '\0');
                    auVar489[4] = cVar402;
                    auVar489[3] = -(cVar401 < '\0');
                    auVar489[2] = cVar401;
                    auVar489[1] = -(auVar489[0] < '\0');
                    auVar550 = pmaddwd(auVar489,auVar393);
                    iVar149 = iVar149 + auVar550._0_4_;
                    iVar167 = iVar167 + auVar550._4_4_;
                    iVar137 = iVar137 + auVar550._8_4_;
                    iVar160 = iVar160 + auVar550._12_4_;
                  }
                  pauVar157 = (undefined1 (*) [16])((long)*pauVar157 + (long)local_530);
                }
                iVar149 = iVar160 + iVar167 + iVar137 + iVar149;
                lVar141 = iVar117 * uVar151 + lVar141;
                for (; (long)(uVar138 | 1) < lVar142; uVar138 = uVar138 + 2) {
                  lVar128 = uVar138 * lVar123 + lVar141;
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    lVar129 = (long)*(int *)(opt_q._0_8_ + uVar172 * 4);
                    iVar149 = (int)*(char *)((long)*pauVar157 + uVar172 * 2 + 1) *
                              (int)*(char *)((long)local_4d8.data + lVar130 + lVar129 + lVar128) +
                              (int)*(char *)((long)*pauVar157 + uVar172 * 2) *
                              (int)*(char *)((long)local_4d8.data + lVar129 + lVar128) + iVar149;
                  }
                  pauVar157 = (undefined1 (*) [16])((long)*pauVar157 + local_4f0);
                }
                for (; (long)uVar138 < lVar142; uVar138 = uVar138 + 1) {
                  for (uVar172 = 0; uVar178 != uVar172; uVar172 = uVar172 + 1) {
                    iVar149 = iVar149 + (int)*(char *)((long)*pauVar157 + uVar172) *
                                        (int)*(char *)((long)local_4d8.data +
                                                      (long)*(int *)(opt_q._0_8_ + uVar172 * 4) +
                                                      uVar138 * lVar123 + lVar141);
                  }
                  pauVar157 = (undefined1 (*) [16])((long)*pauVar157 + uVar178);
                }
                *(int *)*local_580 = iVar149;
                local_580 = (undefined1 (*) [16])(*local_580 + 4);
              }
            }
            local_458 = lVar126;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
          else {
            convolution_packed_int8_xop
                      (&local_4d8,&local_3c8,&this->weight_data_tm,iVar135,iVar117,auVar550._0_4_,
                       (int)local_5d8,local_5b8._0_4_,(uint)local_458,local_5c0);
          }
        }
        dst = local_240;
        if ((100 < iVar40 & local_5c0->use_packing_layout) == 1) {
          if (local_3c8.elempack == 4) {
            if ((local_3c8.c & 0x80000001U) == 1) {
              local_1c8 = 0;
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.vulkan_device_index = 0;
              opt_q.use_reserved_1 = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_2 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_fp16_uniform = false;
              convert_packing(&local_3c8,(Mat *)&opt_q,1,local_5c0);
              piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + 1;
                UNLOCK();
              }
              piVar134 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  if (local_3c8.allocator == (Allocator *)0x0) {
                    free(local_3c8.data);
                  }
                  else {
                    (*(local_3c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              local_3c8.data = (void *)opt_q._0_8_;
              local_3c8.refcount._0_4_ = opt_q.blob_allocator._0_4_;
              local_3c8.refcount._4_4_ = opt_q.blob_allocator._4_4_;
              local_3c8.elemsize =
                   CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
              local_3c8.elempack = opt_q.openmp_blocktime;
              local_3c8.allocator = (Allocator *)opt_q._32_8_;
              local_3c8.dims = opt_q.vulkan_device_index;
              local_3c8.w._0_1_ = opt_q.use_reserved_1;
              local_3c8.w._1_1_ = opt_q.use_image_storage;
              local_3c8.w._2_1_ = opt_q.use_tensor_storage;
              local_3c8.w._3_1_ = opt_q.use_reserved_2;
              local_3c8.h = opt_q.flush_denormals;
              local_3c8.d._0_1_ = opt_q.use_local_pool_allocator;
              local_3c8.d._1_1_ = opt_q.use_shader_local_memory;
              local_3c8.d._2_1_ = opt_q.use_cooperative_matrix;
              local_3c8.d._3_1_ = opt_q.use_winograd23_convolution;
              local_3c8.c._0_1_ = opt_q.use_winograd43_convolution;
              local_3c8.c._1_1_ = opt_q.use_winograd63_convolution;
              local_3c8.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
              local_3c8.c._3_1_ = opt_q.use_fp16_uniform;
              local_3c8.cstep = local_1c8;
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  if (opt_q._32_8_ == 0) {
                    free((void *)opt_q._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
              if (local_3c8.elempack != 4) goto LAB_00164833;
            }
            if ((local_3c8.c & 1U) == 0) {
              local_1c8 = 0;
              opt_q.lightmode = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_ops = false;
              opt_q.use_reserved_0 = false;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.vulkan_device_index = 0;
              opt_q.use_reserved_1 = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_2 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_fp16_uniform = false;
              convert_packing(&local_3c8,(Mat *)&opt_q,8,local_5c0);
              piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + 1;
                UNLOCK();
              }
              piVar134 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  if (local_3c8.allocator == (Allocator *)0x0) {
                    free(local_3c8.data);
                  }
                  else {
                    (*(local_3c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              piVar134 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              local_3c8.data = (void *)opt_q._0_8_;
              local_3c8.refcount._0_4_ = opt_q.blob_allocator._0_4_;
              local_3c8.refcount._4_4_ = opt_q.blob_allocator._4_4_;
              local_3c8.elemsize =
                   CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
              local_3c8.elempack = opt_q.openmp_blocktime;
              local_3c8.allocator = (Allocator *)opt_q._32_8_;
              local_3c8.dims = opt_q.vulkan_device_index;
              local_3c8.w._0_1_ = opt_q.use_reserved_1;
              local_3c8.w._1_1_ = opt_q.use_image_storage;
              local_3c8.w._2_1_ = opt_q.use_tensor_storage;
              local_3c8.w._3_1_ = opt_q.use_reserved_2;
              local_3c8.h = opt_q.flush_denormals;
              local_3c8.d._0_1_ = opt_q.use_local_pool_allocator;
              local_3c8.d._1_1_ = opt_q.use_shader_local_memory;
              local_3c8.d._2_1_ = opt_q.use_cooperative_matrix;
              local_3c8.d._3_1_ = opt_q.use_winograd23_convolution;
              local_3c8.c._0_1_ = opt_q.use_winograd43_convolution;
              local_3c8.c._1_1_ = opt_q.use_winograd63_convolution;
              local_3c8.c._2_1_ = opt_q.use_a53_a55_optimized_kernel;
              local_3c8.c._3_1_ = opt_q.use_fp16_uniform;
              local_3c8.cstep = local_1c8;
              if (piVar134 != (int *)0x0) {
                LOCK();
                *piVar134 = *piVar134 + -1;
                UNLOCK();
                if (*piVar134 == 0) {
                  if (opt_q._32_8_ == 0) {
                    free((void *)opt_q._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
            }
          }
        }
        else if (iVar40 < 0x65) {
          dequantize_from_int32
                    (&local_3c8,local_240,&this->scale_in_data,&(this->super_Convolution).bias_data,
                     local_5c0);
          pLVar42 = this->activation;
          iVar164 = 0;
          if (pLVar42 != (Layer *)0x0) {
            (*pLVar42->_vptr_Layer[9])(pLVar42,local_240,local_5c0);
            iVar164 = 0;
          }
          goto LAB_00164879;
        }
LAB_00164833:
        requantize_from_int32_to_int8
                  (&local_3c8,dst,&this->scale_in_data,
                   &(this->super_Convolution).top_blob_int8_scales,
                   &(this->super_Convolution).bias_data,(this->super_Convolution).activation_type,
                   &(this->super_Convolution).activation_params,local_5c0);
        iVar164 = 0;
      }
LAB_00164879:
      piVar134 = (int *)CONCAT44(local_3c8.refcount._4_4_,local_3c8.refcount._0_4_);
      if (piVar134 != (int *)0x0) {
        LOCK();
        *piVar134 = *piVar134 + -1;
        UNLOCK();
        if (*piVar134 == 0) {
          if (local_3c8.allocator == (Allocator *)0x0) {
            free(local_3c8.data);
          }
          else {
            (*(local_3c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  piVar134 = (int *)CONCAT44(local_4d8.refcount._4_4_,local_4d8.refcount._0_4_);
  if (piVar134 != (int *)0x0) {
    LOCK();
    *piVar134 = *piVar134 + -1;
    UNLOCK();
    if (*piVar134 == 0) {
      if (local_4d8.allocator == (Allocator *)0x0) {
        free(local_4d8.data);
      }
      else {
        (*(local_4d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001648f9:
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount == 0) {
      if (local_80.allocator == (Allocator *)0x0) {
        free(local_80.data);
      }
      else {
        (*(local_80.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar164;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}